

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Primitive PVar20;
  Geometry *pGVar21;
  __int_type_conflict _Var22;
  long lVar23;
  long lVar24;
  long lVar25;
  RTCFilterFunctionN p_Var26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar86;
  ulong uVar87;
  uint uVar88;
  byte bVar90;
  long lVar91;
  long lVar92;
  uint uVar93;
  bool bVar94;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar95;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar142 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar143 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar204;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float t1;
  float fVar219;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar220;
  float fVar246;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar244;
  float fVar245;
  float fVar247;
  float fVar248;
  undefined1 auVar240 [32];
  float fVar249;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar250;
  float fVar271;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar269;
  float fVar270;
  float fVar272;
  float fVar273;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar274;
  float fVar282;
  float fVar283;
  undefined1 auVar275 [16];
  float fVar284;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar285;
  float fVar287;
  float fVar288;
  undefined1 auVar280 [32];
  undefined1 auVar286 [16];
  vfloat4 b0;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [64];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar310 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [64];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [64];
  undefined1 auVar330 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar331 [16];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [64];
  float fVar342;
  float fVar343;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar357;
  float fVar359;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  float fVar358;
  float fVar360;
  float fVar361;
  float fVar362;
  undefined1 auVar356 [64];
  float fVar363;
  float fVar374;
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  float fVar372;
  float fVar373;
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [64];
  float fVar375;
  float fVar376;
  float fVar385;
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  float fVar383;
  float fVar384;
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [64];
  vfloat4 a0;
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  float fVar395;
  undefined1 auVar393 [32];
  float fVar396;
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  float fVar402;
  float fVar403;
  undefined1 auVar400 [64];
  float fVar404;
  undefined1 auVar401 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  int local_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 auStack_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  ulong local_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 auStack_308 [16];
  ulong local_2f8;
  Primitive *local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  uint auStack_2b8 [4];
  undefined8 local_2a8;
  undefined4 local_2a0;
  undefined8 local_29c;
  undefined4 local_294;
  undefined4 local_290;
  uint local_28c;
  uint local_288;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float afStack_1d8 [8];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar89;
  undefined1 auVar281 [32];
  undefined1 auVar394 [32];
  
  PVar20 = prim[1];
  uVar87 = (ulong)(byte)PVar20;
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 6)));
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 10)));
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 5 + 6)));
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 5 + 10)));
  auVar145 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 6)));
  lVar92 = uVar87 * 0x25;
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 10)));
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xf + 6)));
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xf + 10)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar20 * 0x10 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar20 * 0x10 + 10)));
  auVar366 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x11 + 6)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x11 + 10)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1a + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1a + 10)));
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1b + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1b + 10)));
  auVar369._16_16_ = auVar211;
  auVar369._0_16_ = auVar113;
  auVar199._16_16_ = auVar157;
  auVar199._0_16_ = auVar197;
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1c + 6)));
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1c + 10)));
  auVar240._16_16_ = auVar183;
  auVar240._0_16_ = auVar145;
  fVar220 = *(float *)(prim + lVar92 + 0x12);
  auVar265._16_16_ = auVar286;
  auVar265._0_16_ = auVar146;
  auVar197 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar92 + 6));
  local_4e8._4_4_ = fVar220 * auVar197._4_4_;
  local_4e8._0_4_ = fVar220 * auVar197._0_4_;
  fStack_4e0 = fVar220 * auVar197._8_4_;
  fStack_4dc = fVar220 * auVar197._12_4_;
  auVar275._0_4_ = fVar220 * (ray->dir).field_0.m128[0];
  auVar275._4_4_ = fVar220 * (ray->dir).field_0.m128[1];
  auVar275._8_4_ = fVar220 * (ray->dir).field_0.m128[2];
  auVar275._12_4_ = fVar220 * (ray->dir).field_0.m128[3];
  auVar125 = vcvtdq2ps_avx(auVar199);
  auVar27 = vcvtdq2ps_avx(auVar240);
  auVar314._16_16_ = auVar36;
  auVar314._0_16_ = auVar35;
  auVar28 = vcvtdq2ps_avx(auVar314);
  auVar296._16_16_ = auVar37;
  auVar296._0_16_ = auVar366;
  auVar29 = vcvtdq2ps_avx(auVar296);
  auVar347._16_16_ = auVar39;
  auVar347._0_16_ = auVar38;
  auVar379._16_16_ = auVar40;
  auVar379._0_16_ = auVar177;
  auVar315._16_16_ = auVar211;
  auVar315._0_16_ = auVar113;
  auVar113 = vshufps_avx(auVar275,auVar275,0x55);
  auVar211 = vshufps_avx(auVar275,auVar275,0xaa);
  fVar95 = auVar211._0_4_;
  fVar246 = auVar211._4_4_;
  fVar271 = auVar211._8_4_;
  fVar219 = auVar211._12_4_;
  fVar269 = auVar113._0_4_;
  fVar376 = auVar113._4_4_;
  fVar245 = auVar113._8_4_;
  fVar270 = auVar113._12_4_;
  auVar30 = vcvtdq2ps_avx(auVar369);
  auVar31 = vcvtdq2ps_avx(auVar265);
  auVar32 = vcvtdq2ps_avx(auVar347);
  auVar33 = vcvtdq2ps_avx(auVar379);
  auVar34 = vcvtdq2ps_avx(auVar315);
  auVar113 = vshufps_avx(auVar275,auVar275,0);
  fVar395 = auVar40._12_4_ + auVar39._12_4_;
  fVar220 = auVar113._0_4_;
  fVar250 = auVar113._4_4_;
  fVar204 = auVar113._8_4_;
  fVar244 = auVar113._12_4_;
  auVar380._0_4_ = auVar30._0_4_ * fVar220 + fVar269 * auVar125._0_4_ + fVar95 * auVar27._0_4_;
  auVar380._4_4_ = auVar30._4_4_ * fVar250 + fVar376 * auVar125._4_4_ + fVar246 * auVar27._4_4_;
  auVar380._8_4_ = auVar30._8_4_ * fVar204 + fVar245 * auVar125._8_4_ + fVar271 * auVar27._8_4_;
  auVar380._12_4_ = auVar30._12_4_ * fVar244 + fVar270 * auVar125._12_4_ + fVar219 * auVar27._12_4_;
  auVar380._16_4_ = auVar30._16_4_ * fVar220 + fVar269 * auVar125._16_4_ + fVar95 * auVar27._16_4_;
  auVar380._20_4_ = auVar30._20_4_ * fVar250 + fVar376 * auVar125._20_4_ + fVar246 * auVar27._20_4_;
  auVar380._24_4_ = auVar30._24_4_ * fVar204 + fVar245 * auVar125._24_4_ + fVar271 * auVar27._24_4_;
  auVar380._28_4_ = auVar39._12_4_ + 0.0;
  auVar348._0_4_ = auVar31._0_4_ * fVar220 + fVar95 * auVar29._0_4_ + fVar269 * auVar28._0_4_;
  auVar348._4_4_ = auVar31._4_4_ * fVar250 + fVar246 * auVar29._4_4_ + fVar376 * auVar28._4_4_;
  auVar348._8_4_ = auVar31._8_4_ * fVar204 + fVar271 * auVar29._8_4_ + fVar245 * auVar28._8_4_;
  auVar348._12_4_ = auVar31._12_4_ * fVar244 + fVar219 * auVar29._12_4_ + fVar270 * auVar28._12_4_;
  auVar348._16_4_ = auVar31._16_4_ * fVar220 + fVar95 * auVar29._16_4_ + fVar269 * auVar28._16_4_;
  auVar348._20_4_ = auVar31._20_4_ * fVar250 + fVar246 * auVar29._20_4_ + fVar376 * auVar28._20_4_;
  auVar348._24_4_ = auVar31._24_4_ * fVar204 + fVar271 * auVar29._24_4_ + fVar245 * auVar28._24_4_;
  auVar348._28_4_ = 0;
  auVar280._0_4_ = fVar269 * auVar33._0_4_ + fVar95 * auVar34._0_4_ + fVar220 * auVar32._0_4_;
  auVar280._4_4_ = fVar376 * auVar33._4_4_ + fVar246 * auVar34._4_4_ + fVar250 * auVar32._4_4_;
  auVar280._8_4_ = fVar245 * auVar33._8_4_ + fVar271 * auVar34._8_4_ + fVar204 * auVar32._8_4_;
  auVar280._12_4_ = fVar270 * auVar33._12_4_ + fVar219 * auVar34._12_4_ + fVar244 * auVar32._12_4_;
  auVar280._16_4_ = fVar269 * auVar33._16_4_ + fVar95 * auVar34._16_4_ + fVar220 * auVar32._16_4_;
  auVar280._20_4_ = fVar376 * auVar33._20_4_ + fVar246 * auVar34._20_4_ + fVar250 * auVar32._20_4_;
  auVar280._24_4_ = fVar245 * auVar33._24_4_ + fVar271 * auVar34._24_4_ + fVar204 * auVar32._24_4_;
  auVar280._28_4_ = fVar395 + 0.0;
  auVar113 = vshufps_avx(_local_4e8,_local_4e8,0x55);
  auVar211 = vshufps_avx(_local_4e8,_local_4e8,0xaa);
  fVar95 = auVar211._0_4_;
  fVar246 = auVar211._4_4_;
  fVar271 = auVar211._8_4_;
  fVar219 = auVar211._12_4_;
  fVar269 = auVar113._0_4_;
  fVar376 = auVar113._4_4_;
  fVar245 = auVar113._8_4_;
  fVar270 = auVar113._12_4_;
  fVar249 = auVar29._28_4_ + auVar27._28_4_;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar87 * 7 + 6);
  auVar113 = vpmovsxwd_avx(auVar113);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *(ulong *)(prim + uVar87 * 7 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar211);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 6);
  auVar197 = vpmovsxwd_avx(auVar197);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 0xe);
  auVar157 = vpmovsxwd_avx(auVar157);
  auVar145 = vshufps_avx(_local_4e8,_local_4e8,0);
  fVar220 = auVar145._0_4_;
  fVar250 = auVar145._4_4_;
  fVar204 = auVar145._8_4_;
  fVar244 = auVar145._12_4_;
  auVar162._0_4_ = auVar30._0_4_ * fVar220 + fVar269 * auVar125._0_4_ + fVar95 * auVar27._0_4_;
  auVar162._4_4_ = auVar30._4_4_ * fVar250 + fVar376 * auVar125._4_4_ + fVar246 * auVar27._4_4_;
  auVar162._8_4_ = auVar30._8_4_ * fVar204 + fVar245 * auVar125._8_4_ + fVar271 * auVar27._8_4_;
  auVar162._12_4_ = auVar30._12_4_ * fVar244 + fVar270 * auVar125._12_4_ + fVar219 * auVar27._12_4_;
  auVar162._16_4_ = auVar30._16_4_ * fVar220 + fVar269 * auVar125._16_4_ + fVar95 * auVar27._16_4_;
  auVar162._20_4_ = auVar30._20_4_ * fVar250 + fVar376 * auVar125._20_4_ + fVar246 * auVar27._20_4_;
  auVar162._24_4_ = auVar30._24_4_ * fVar204 + fVar245 * auVar125._24_4_ + fVar271 * auVar27._24_4_;
  auVar162._28_4_ = fVar270 + fVar249;
  local_508._4_4_ = fVar376 * auVar28._4_4_ + fVar246 * auVar29._4_4_ + auVar31._4_4_ * fVar250;
  local_508._0_4_ = fVar269 * auVar28._0_4_ + fVar95 * auVar29._0_4_ + auVar31._0_4_ * fVar220;
  fStack_500 = fVar245 * auVar28._8_4_ + fVar271 * auVar29._8_4_ + auVar31._8_4_ * fVar204;
  fStack_4fc = fVar270 * auVar28._12_4_ + fVar219 * auVar29._12_4_ + auVar31._12_4_ * fVar244;
  fStack_4f8 = fVar269 * auVar28._16_4_ + fVar95 * auVar29._16_4_ + auVar31._16_4_ * fVar220;
  fStack_4f4 = fVar376 * auVar28._20_4_ + fVar246 * auVar29._20_4_ + auVar31._20_4_ * fVar250;
  fStack_4f0 = fVar245 * auVar28._24_4_ + fVar271 * auVar29._24_4_ + auVar31._24_4_ * fVar204;
  fStack_4ec = auVar34._28_4_ + fVar395 + fVar249;
  auVar241._8_4_ = 0x7fffffff;
  auVar241._0_8_ = 0x7fffffff7fffffff;
  auVar241._12_4_ = 0x7fffffff;
  auVar241._16_4_ = 0x7fffffff;
  auVar241._20_4_ = 0x7fffffff;
  auVar241._24_4_ = 0x7fffffff;
  auVar241._28_4_ = 0x7fffffff;
  auVar266._8_4_ = 0x219392ef;
  auVar266._0_8_ = 0x219392ef219392ef;
  auVar266._12_4_ = 0x219392ef;
  auVar266._16_4_ = 0x219392ef;
  auVar266._20_4_ = 0x219392ef;
  auVar266._24_4_ = 0x219392ef;
  auVar266._28_4_ = 0x219392ef;
  auVar125 = vandps_avx(auVar380,auVar241);
  auVar125 = vcmpps_avx(auVar125,auVar266,1);
  auVar27 = vblendvps_avx(auVar380,auVar266,auVar125);
  auVar125 = vandps_avx(auVar348,auVar241);
  auVar125 = vcmpps_avx(auVar125,auVar266,1);
  auVar28 = vblendvps_avx(auVar348,auVar266,auVar125);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + uVar87 * 9 + 6);
  auVar145 = vpmovsxwd_avx(auVar145);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar87 * 9 + 0xe);
  auVar183 = vpmovsxwd_avx(auVar183);
  auVar125 = vandps_avx(auVar280,auVar241);
  auVar29 = vcmpps_avx(auVar125,auVar266,1);
  auVar125 = vblendvps_avx(auVar280,auVar266,auVar29);
  auVar200._0_4_ = fVar220 * auVar32._0_4_ + auVar33._0_4_ * fVar269 + auVar34._0_4_ * fVar95;
  auVar200._4_4_ = fVar250 * auVar32._4_4_ + auVar33._4_4_ * fVar376 + auVar34._4_4_ * fVar246;
  auVar200._8_4_ = fVar204 * auVar32._8_4_ + auVar33._8_4_ * fVar245 + auVar34._8_4_ * fVar271;
  auVar200._12_4_ = fVar244 * auVar32._12_4_ + auVar33._12_4_ * fVar270 + auVar34._12_4_ * fVar219;
  auVar200._16_4_ = fVar220 * auVar32._16_4_ + auVar33._16_4_ * fVar269 + auVar34._16_4_ * fVar95;
  auVar200._20_4_ = fVar250 * auVar32._20_4_ + auVar33._20_4_ * fVar376 + auVar34._20_4_ * fVar246;
  auVar200._24_4_ = fVar204 * auVar32._24_4_ + auVar33._24_4_ * fVar245 + auVar34._24_4_ * fVar271;
  auVar200._28_4_ = fVar244 + fVar270 + fVar219;
  auVar30 = vrcpps_avx(auVar27);
  fVar220 = auVar30._0_4_;
  fVar244 = auVar30._4_4_;
  auVar31._4_4_ = auVar27._4_4_ * fVar244;
  auVar31._0_4_ = auVar27._0_4_ * fVar220;
  fVar245 = auVar30._8_4_;
  auVar31._8_4_ = auVar27._8_4_ * fVar245;
  fVar246 = auVar30._12_4_;
  auVar31._12_4_ = auVar27._12_4_ * fVar246;
  fVar249 = auVar30._16_4_;
  auVar31._16_4_ = auVar27._16_4_ * fVar249;
  fVar247 = auVar30._20_4_;
  auVar31._20_4_ = auVar27._20_4_ * fVar247;
  fVar248 = auVar30._24_4_;
  auVar31._24_4_ = auVar27._24_4_ * fVar248;
  auVar31._28_4_ = auVar29._28_4_;
  auVar316._8_4_ = 0x3f800000;
  auVar316._0_8_ = 0x3f8000003f800000;
  auVar316._12_4_ = 0x3f800000;
  auVar316._16_4_ = 0x3f800000;
  auVar316._20_4_ = 0x3f800000;
  auVar316._24_4_ = 0x3f800000;
  auVar316._28_4_ = 0x3f800000;
  auVar31 = vsubps_avx(auVar316,auVar31);
  auVar29 = vrcpps_avx(auVar28);
  fVar220 = fVar220 + fVar220 * auVar31._0_4_;
  fVar244 = fVar244 + fVar244 * auVar31._4_4_;
  fVar245 = fVar245 + fVar245 * auVar31._8_4_;
  fVar246 = fVar246 + fVar246 * auVar31._12_4_;
  fVar249 = fVar249 + fVar249 * auVar31._16_4_;
  fVar247 = fVar247 + fVar247 * auVar31._20_4_;
  fVar248 = fVar248 + fVar248 * auVar31._24_4_;
  fVar250 = auVar29._0_4_;
  fVar269 = auVar29._4_4_;
  auVar27._4_4_ = auVar28._4_4_ * fVar269;
  auVar27._0_4_ = auVar28._0_4_ * fVar250;
  fVar270 = auVar29._8_4_;
  auVar27._8_4_ = auVar28._8_4_ * fVar270;
  fVar271 = auVar29._12_4_;
  auVar27._12_4_ = auVar28._12_4_ * fVar271;
  fVar395 = auVar29._16_4_;
  auVar27._16_4_ = auVar28._16_4_ * fVar395;
  fVar272 = auVar29._20_4_;
  auVar27._20_4_ = auVar28._20_4_ * fVar272;
  fVar273 = auVar29._24_4_;
  auVar27._24_4_ = auVar28._24_4_ * fVar273;
  auVar27._28_4_ = auVar30._28_4_;
  auVar28 = vsubps_avx(auVar316,auVar27);
  fVar250 = fVar250 + fVar250 * auVar28._0_4_;
  fVar269 = fVar269 + fVar269 * auVar28._4_4_;
  fVar270 = fVar270 + fVar270 * auVar28._8_4_;
  fVar271 = fVar271 + fVar271 * auVar28._12_4_;
  fVar395 = fVar395 + fVar395 * auVar28._16_4_;
  fVar272 = fVar272 + fVar272 * auVar28._20_4_;
  fVar273 = fVar273 + fVar273 * auVar28._24_4_;
  auVar27 = vrcpps_avx(auVar125);
  fVar274 = auVar27._0_4_;
  fVar282 = auVar27._4_4_;
  auVar32._4_4_ = fVar282 * auVar125._4_4_;
  auVar32._0_4_ = fVar274 * auVar125._0_4_;
  fVar283 = auVar27._8_4_;
  auVar32._8_4_ = fVar283 * auVar125._8_4_;
  fVar284 = auVar27._12_4_;
  auVar32._12_4_ = fVar284 * auVar125._12_4_;
  fVar285 = auVar27._16_4_;
  auVar32._16_4_ = fVar285 * auVar125._16_4_;
  fVar287 = auVar27._20_4_;
  auVar32._20_4_ = fVar287 * auVar125._20_4_;
  fVar288 = auVar27._24_4_;
  auVar32._24_4_ = fVar288 * auVar125._24_4_;
  auVar32._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar316,auVar32);
  fVar274 = fVar274 + fVar274 * auVar125._0_4_;
  fVar282 = fVar282 + fVar282 * auVar125._4_4_;
  fVar283 = fVar283 + fVar283 * auVar125._8_4_;
  fVar284 = fVar284 + fVar284 * auVar125._12_4_;
  fVar285 = fVar285 + fVar285 * auVar125._16_4_;
  fVar287 = fVar287 + fVar287 * auVar125._20_4_;
  fVar288 = fVar288 + fVar288 * auVar125._24_4_;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar87 * 0xd + 6);
  auVar146 = vpmovsxwd_avx(auVar146);
  auVar286._8_8_ = 0;
  auVar286._0_8_ = *(ulong *)(prim + uVar87 * 0xd + 0xe);
  auVar286 = vpmovsxwd_avx(auVar286);
  auVar297._16_16_ = auVar211;
  auVar297._0_16_ = auVar113;
  auVar349._16_16_ = auVar157;
  auVar349._0_16_ = auVar197;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar87 * 0x12 + 6);
  auVar113 = vpmovsxwd_avx(auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar87 * 0x12 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar36);
  auVar197 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar92 + 0x16)) *
                           *(float *)(prim + lVar92 + 0x1a)));
  auVar197 = vshufps_avx(auVar197,auVar197,0);
  auVar125 = vcvtdq2ps_avx(auVar297);
  auVar27 = vcvtdq2ps_avx(auVar349);
  auVar27 = vsubps_avx(auVar27,auVar125);
  fVar204 = auVar197._0_4_;
  fVar376 = auVar197._4_4_;
  fVar95 = auVar197._8_4_;
  fVar219 = auVar197._12_4_;
  auVar298._0_4_ = auVar27._0_4_ * fVar204 + auVar125._0_4_;
  auVar298._4_4_ = auVar27._4_4_ * fVar376 + auVar125._4_4_;
  auVar298._8_4_ = auVar27._8_4_ * fVar95 + auVar125._8_4_;
  auVar298._12_4_ = auVar27._12_4_ * fVar219 + auVar125._12_4_;
  auVar298._16_4_ = auVar27._16_4_ * fVar204 + auVar125._16_4_;
  auVar298._20_4_ = auVar27._20_4_ * fVar376 + auVar125._20_4_;
  auVar298._24_4_ = auVar27._24_4_ * fVar95 + auVar125._24_4_;
  auVar298._28_4_ = auVar27._28_4_ + auVar125._28_4_;
  auVar324._16_16_ = auVar183;
  auVar324._0_16_ = auVar145;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = *(ulong *)(prim + uVar87 * 0x16 + 6);
  auVar197 = vpmovsxwd_avx(auVar366);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar87 * 0x16 + 0xe);
  auVar157 = vpmovsxwd_avx(auVar37);
  auVar125 = vcvtdq2ps_avx(auVar324);
  auVar124._16_16_ = auVar286;
  auVar124._0_16_ = auVar146;
  auVar27 = vcvtdq2ps_avx(auVar124);
  auVar27 = vsubps_avx(auVar27,auVar125);
  auVar317._0_4_ = auVar125._0_4_ + fVar204 * auVar27._0_4_;
  auVar317._4_4_ = auVar125._4_4_ + fVar376 * auVar27._4_4_;
  auVar317._8_4_ = auVar125._8_4_ + fVar95 * auVar27._8_4_;
  auVar317._12_4_ = auVar125._12_4_ + fVar219 * auVar27._12_4_;
  auVar317._16_4_ = auVar125._16_4_ + fVar204 * auVar27._16_4_;
  auVar317._20_4_ = auVar125._20_4_ + fVar376 * auVar27._20_4_;
  auVar317._24_4_ = auVar125._24_4_ + fVar95 * auVar27._24_4_;
  auVar317._28_4_ = auVar125._28_4_ + auVar27._28_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar87 * 0x14 + 6);
  auVar145 = vpmovsxwd_avx(auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar87 * 0x14 + 0xe);
  auVar183 = vpmovsxwd_avx(auVar39);
  auVar325._16_16_ = auVar211;
  auVar325._0_16_ = auVar113;
  auVar336._16_16_ = auVar157;
  auVar336._0_16_ = auVar197;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + uVar87 * 0x18 + 6);
  auVar113 = vpmovsxwd_avx(auVar177);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar87 * 0x18 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar40);
  auVar125 = vcvtdq2ps_avx(auVar325);
  auVar27 = vcvtdq2ps_avx(auVar336);
  auVar27 = vsubps_avx(auVar27,auVar125);
  auVar326._0_4_ = auVar125._0_4_ + auVar27._0_4_ * fVar204;
  auVar326._4_4_ = auVar125._4_4_ + auVar27._4_4_ * fVar376;
  auVar326._8_4_ = auVar125._8_4_ + auVar27._8_4_ * fVar95;
  auVar326._12_4_ = auVar125._12_4_ + auVar27._12_4_ * fVar219;
  auVar326._16_4_ = auVar125._16_4_ + auVar27._16_4_ * fVar204;
  auVar326._20_4_ = auVar125._20_4_ + auVar27._20_4_ * fVar376;
  auVar326._24_4_ = auVar125._24_4_ + auVar27._24_4_ * fVar95;
  auVar326._28_4_ = auVar125._28_4_ + auVar27._28_4_;
  auVar125._16_16_ = auVar183;
  auVar125._0_16_ = auVar145;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar87 * 0x1d + 6);
  auVar197 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar87 * 0x1d + 0xe);
  auVar157 = vpmovsxwd_avx(auVar13);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar350._16_16_ = auVar211;
  auVar350._0_16_ = auVar113;
  auVar27 = vcvtdq2ps_avx(auVar350);
  auVar27 = vsubps_avx(auVar27,auVar125);
  auVar126._0_4_ = auVar27._0_4_ * fVar204 + auVar125._0_4_;
  auVar126._4_4_ = auVar27._4_4_ * fVar376 + auVar125._4_4_;
  auVar126._8_4_ = auVar27._8_4_ * fVar95 + auVar125._8_4_;
  auVar126._12_4_ = auVar27._12_4_ * fVar219 + auVar125._12_4_;
  auVar126._16_4_ = auVar27._16_4_ * fVar204 + auVar125._16_4_;
  auVar126._20_4_ = auVar27._20_4_ * fVar376 + auVar125._20_4_;
  auVar126._24_4_ = auVar27._24_4_ * fVar95 + auVar125._24_4_;
  auVar126._28_4_ = auVar27._28_4_ + auVar125._28_4_;
  auVar337._16_16_ = auVar157;
  auVar337._0_16_ = auVar197;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar87 * 0x21 + 6);
  auVar113 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar87 * 0x21 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar15);
  auVar125 = vcvtdq2ps_avx(auVar337);
  auVar351._16_16_ = auVar211;
  auVar351._0_16_ = auVar113;
  auVar27 = vcvtdq2ps_avx(auVar351);
  auVar27 = vsubps_avx(auVar27,auVar125);
  auVar338._0_4_ = auVar125._0_4_ + auVar27._0_4_ * fVar204;
  auVar338._4_4_ = auVar125._4_4_ + auVar27._4_4_ * fVar376;
  auVar338._8_4_ = auVar125._8_4_ + auVar27._8_4_ * fVar95;
  auVar338._12_4_ = auVar125._12_4_ + auVar27._12_4_ * fVar219;
  auVar338._16_4_ = auVar125._16_4_ + auVar27._16_4_ * fVar204;
  auVar338._20_4_ = auVar125._20_4_ + auVar27._20_4_ * fVar376;
  auVar338._24_4_ = auVar125._24_4_ + auVar27._24_4_ * fVar95;
  auVar338._28_4_ = auVar125._28_4_ + auVar27._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar87 * 0x1f + 6);
  auVar113 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar87 * 0x1f + 0xe);
  auVar211 = vpmovsxwd_avx(auVar17);
  auVar352._16_16_ = auVar211;
  auVar352._0_16_ = auVar113;
  auVar125 = vcvtdq2ps_avx(auVar352);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar87 * 0x23 + 6);
  auVar113 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar87 * 0x23 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar19);
  auVar370._16_16_ = auVar211;
  auVar370._0_16_ = auVar113;
  auVar27 = vcvtdq2ps_avx(auVar370);
  auVar27 = vsubps_avx(auVar27,auVar125);
  auVar353._0_4_ = auVar125._0_4_ + auVar27._0_4_ * fVar204;
  auVar353._4_4_ = auVar125._4_4_ + auVar27._4_4_ * fVar376;
  auVar353._8_4_ = auVar125._8_4_ + auVar27._8_4_ * fVar95;
  auVar353._12_4_ = auVar125._12_4_ + auVar27._12_4_ * fVar219;
  auVar353._16_4_ = auVar125._16_4_ + auVar27._16_4_ * fVar204;
  auVar353._20_4_ = auVar125._20_4_ + auVar27._20_4_ * fVar376;
  auVar353._24_4_ = auVar125._24_4_ + auVar27._24_4_ * fVar95;
  auVar353._28_4_ = auVar125._28_4_ + fVar219;
  auVar125 = vsubps_avx(auVar298,auVar162);
  auVar205._0_4_ = fVar220 * auVar125._0_4_;
  auVar205._4_4_ = fVar244 * auVar125._4_4_;
  auVar205._8_4_ = fVar245 * auVar125._8_4_;
  auVar205._12_4_ = fVar246 * auVar125._12_4_;
  auVar33._16_4_ = fVar249 * auVar125._16_4_;
  auVar33._0_16_ = auVar205;
  auVar33._20_4_ = fVar247 * auVar125._20_4_;
  auVar33._24_4_ = fVar248 * auVar125._24_4_;
  auVar33._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar317,auVar162);
  auVar221._0_4_ = fVar220 * auVar125._0_4_;
  auVar221._4_4_ = fVar244 * auVar125._4_4_;
  auVar221._8_4_ = fVar245 * auVar125._8_4_;
  auVar221._12_4_ = fVar246 * auVar125._12_4_;
  auVar34._16_4_ = fVar249 * auVar125._16_4_;
  auVar34._0_16_ = auVar221;
  auVar34._20_4_ = fVar247 * auVar125._20_4_;
  auVar34._24_4_ = fVar248 * auVar125._24_4_;
  auVar34._28_4_ = auVar30._28_4_ + auVar31._28_4_;
  auVar125 = vsubps_avx(auVar326,_local_508);
  auVar134._0_4_ = fVar250 * auVar125._0_4_;
  auVar134._4_4_ = fVar269 * auVar125._4_4_;
  auVar134._8_4_ = fVar270 * auVar125._8_4_;
  auVar134._12_4_ = fVar271 * auVar125._12_4_;
  auVar30._16_4_ = fVar395 * auVar125._16_4_;
  auVar30._0_16_ = auVar134;
  auVar30._20_4_ = fVar272 * auVar125._20_4_;
  auVar30._24_4_ = fVar273 * auVar125._24_4_;
  auVar30._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar126,_local_508);
  auVar251._0_4_ = fVar250 * auVar125._0_4_;
  auVar251._4_4_ = fVar269 * auVar125._4_4_;
  auVar251._8_4_ = fVar270 * auVar125._8_4_;
  auVar251._12_4_ = fVar271 * auVar125._12_4_;
  auVar41._16_4_ = fVar395 * auVar125._16_4_;
  auVar41._0_16_ = auVar251;
  auVar41._20_4_ = fVar272 * auVar125._20_4_;
  auVar41._24_4_ = fVar273 * auVar125._24_4_;
  auVar41._28_4_ = auVar29._28_4_ + auVar28._28_4_;
  auVar125 = vsubps_avx(auVar338,auVar200);
  auVar96._0_4_ = fVar274 * auVar125._0_4_;
  auVar96._4_4_ = fVar282 * auVar125._4_4_;
  auVar96._8_4_ = fVar283 * auVar125._8_4_;
  auVar96._12_4_ = fVar284 * auVar125._12_4_;
  auVar28._16_4_ = fVar285 * auVar125._16_4_;
  auVar28._0_16_ = auVar96;
  auVar28._20_4_ = fVar287 * auVar125._20_4_;
  auVar28._24_4_ = fVar288 * auVar125._24_4_;
  auVar28._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar353,auVar200);
  auVar170._0_4_ = fVar274 * auVar125._0_4_;
  auVar170._4_4_ = fVar282 * auVar125._4_4_;
  auVar170._8_4_ = fVar283 * auVar125._8_4_;
  auVar170._12_4_ = fVar284 * auVar125._12_4_;
  auVar29._16_4_ = fVar285 * auVar125._16_4_;
  auVar29._0_16_ = auVar170;
  auVar29._20_4_ = fVar287 * auVar125._20_4_;
  auVar29._24_4_ = fVar288 * auVar125._24_4_;
  auVar29._28_4_ = auVar125._28_4_;
  auVar113 = vpminsd_avx(auVar33._16_16_,auVar34._16_16_);
  auVar211 = vpminsd_avx(auVar205,auVar221);
  auVar339._16_16_ = auVar113;
  auVar339._0_16_ = auVar211;
  auVar113 = vpminsd_avx(auVar30._16_16_,auVar41._16_16_);
  auVar211 = vpminsd_avx(auVar134,auVar251);
  auVar354._16_16_ = auVar113;
  auVar354._0_16_ = auVar211;
  auVar125 = vmaxps_avx(auVar339,auVar354);
  auVar113 = vpminsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar211 = vpminsd_avx(auVar96,auVar170);
  auVar381._16_16_ = auVar113;
  auVar381._0_16_ = auVar211;
  uVar8 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar393._4_4_ = uVar8;
  auVar393._0_4_ = uVar8;
  auVar393._8_4_ = uVar8;
  auVar393._12_4_ = uVar8;
  auVar393._16_4_ = uVar8;
  auVar393._20_4_ = uVar8;
  auVar393._24_4_ = uVar8;
  auVar393._28_4_ = uVar8;
  auVar27 = vmaxps_avx(auVar381,auVar393);
  auVar125 = vmaxps_avx(auVar125,auVar27);
  local_1b8._4_4_ = auVar125._4_4_ * 0.99999964;
  local_1b8._0_4_ = auVar125._0_4_ * 0.99999964;
  local_1b8._8_4_ = auVar125._8_4_ * 0.99999964;
  local_1b8._12_4_ = auVar125._12_4_ * 0.99999964;
  local_1b8._16_4_ = auVar125._16_4_ * 0.99999964;
  local_1b8._20_4_ = auVar125._20_4_ * 0.99999964;
  local_1b8._24_4_ = auVar125._24_4_ * 0.99999964;
  local_1b8._28_4_ = auVar125._28_4_;
  auVar113 = vpmaxsd_avx(auVar33._16_16_,auVar34._16_16_);
  auVar211 = vpmaxsd_avx(auVar205,auVar221);
  auVar217._16_16_ = auVar113;
  auVar217._0_16_ = auVar211;
  auVar113 = vpmaxsd_avx(auVar30._16_16_,auVar41._16_16_);
  auVar211 = vpmaxsd_avx(auVar134,auVar251);
  auVar163._16_16_ = auVar113;
  auVar163._0_16_ = auVar211;
  auVar125 = vminps_avx(auVar217,auVar163);
  auVar113 = vpmaxsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar211 = vpmaxsd_avx(auVar96,auVar170);
  fVar220 = ray->tfar;
  auVar201._4_4_ = fVar220;
  auVar201._0_4_ = fVar220;
  auVar201._8_4_ = fVar220;
  auVar201._12_4_ = fVar220;
  auVar201._16_4_ = fVar220;
  auVar201._20_4_ = fVar220;
  auVar201._24_4_ = fVar220;
  auVar201._28_4_ = fVar220;
  auVar127._16_16_ = auVar113;
  auVar127._0_16_ = auVar211;
  auVar27 = vminps_avx(auVar127,auVar201);
  auVar125 = vminps_avx(auVar125,auVar27);
  auVar42._4_4_ = auVar125._4_4_ * 1.0000004;
  auVar42._0_4_ = auVar125._0_4_ * 1.0000004;
  auVar42._8_4_ = auVar125._8_4_ * 1.0000004;
  auVar42._12_4_ = auVar125._12_4_ * 1.0000004;
  auVar42._16_4_ = auVar125._16_4_ * 1.0000004;
  auVar42._20_4_ = auVar125._20_4_ * 1.0000004;
  auVar42._24_4_ = auVar125._24_4_ * 1.0000004;
  auVar42._28_4_ = auVar125._28_4_;
  auVar125 = vcmpps_avx(local_1b8,auVar42,2);
  auVar113 = vpshufd_avx(ZEXT116((byte)PVar20),0);
  auVar164._16_16_ = auVar113;
  auVar164._0_16_ = auVar113;
  auVar27 = vcvtdq2ps_avx(auVar164);
  auVar27 = vcmpps_avx(_DAT_01f7b060,auVar27,1);
  auVar125 = vandps_avx(auVar125,auVar27);
  auVar165._16_16_ = mm_lookupmask_ps._240_16_;
  auVar165._0_16_ = mm_lookupmask_ps._240_16_;
  uVar93 = vmovmskps_avx(auVar125);
  local_198 = vblendps_avx(auVar165,ZEXT832(0) << 0x20,0x80);
  auVar113 = (undefined1  [16])0x0;
  local_2f0 = prim;
LAB_00abb9f8:
  if (uVar93 == 0) {
LAB_00abdb3b:
    return uVar93 != 0;
  }
  lVar92 = 0;
  if (uVar93 != 0) {
    for (; (uVar93 >> lVar92 & 1) == 0; lVar92 = lVar92 + 1) {
    }
  }
  local_420 = (ulong)*(uint *)(local_2f0 + 2);
  local_2f8 = (ulong)*(uint *)(local_2f0 + lVar92 * 4 + 6);
  pGVar21 = (context->scene->geometries).items[local_420].ptr;
  fVar220 = (pGVar21->time_range).lower;
  fVar220 = pGVar21->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar220) / ((pGVar21->time_range).upper - fVar220));
  auVar211 = vroundss_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),9);
  auVar211 = vminss_avx(auVar211,ZEXT416((uint)(pGVar21->fnumTimeSegments + -1.0)));
  auVar113 = vmaxss_avx(auVar113,auVar211);
  uVar87 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                           local_2f8 *
                           pGVar21[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var22 = pGVar21[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar91 = (long)(int)auVar113._0_4_ * 0x38;
  lVar23 = *(long *)(_Var22 + lVar91);
  lVar24 = *(long *)(_Var22 + 0x10 + lVar91);
  pfVar3 = (float *)(lVar23 + lVar24 * uVar87);
  fVar250 = *pfVar3;
  fVar204 = pfVar3[1];
  fVar244 = pfVar3[2];
  fVar269 = pfVar3[3];
  lVar92 = uVar87 + 1;
  pfVar3 = (float *)(lVar23 + lVar24 * lVar92);
  lVar1 = uVar87 + 2;
  pfVar4 = (float *)(lVar23 + lVar24 * lVar1);
  lVar2 = uVar87 + 3;
  pfVar5 = (float *)(lVar23 + lVar24 * lVar2);
  fVar376 = *pfVar5;
  fVar245 = pfVar5[1];
  fVar270 = pfVar5[2];
  fVar95 = pfVar5[3];
  lVar23 = *(long *)&pGVar21[4].fnumTimeSegments;
  lVar24 = *(long *)(lVar23 + lVar91);
  lVar25 = *(long *)(lVar23 + 0x10 + lVar91);
  pfVar5 = (float *)(lVar24 + lVar25 * uVar87);
  fVar246 = *pfVar5;
  fVar271 = pfVar5[1];
  fVar219 = pfVar5[2];
  fVar249 = pfVar5[3];
  pfVar5 = (float *)(lVar24 + lVar25 * lVar92);
  pfVar6 = (float *)(lVar24 + lVar25 * lVar1);
  fVar220 = fVar220 - auVar113._0_4_;
  pfVar7 = (float *)(lVar24 + lVar25 * lVar2);
  fVar395 = *pfVar7;
  fVar247 = pfVar7[1];
  fVar272 = pfVar7[2];
  fVar248 = pfVar7[3];
  fVar284 = *pfVar4 * 0.0;
  fVar285 = pfVar4[1] * 0.0;
  fVar287 = pfVar4[2] * 0.0;
  fVar288 = pfVar4[3] * 0.0;
  fVar273 = fVar284 + fVar376 * 0.0;
  fVar274 = fVar285 + fVar245 * 0.0;
  fVar282 = fVar287 + fVar270 * 0.0;
  fVar283 = fVar288 + fVar95 * 0.0;
  fVar342 = *pfVar3 * 0.0;
  fVar357 = pfVar3[1] * 0.0;
  fVar359 = pfVar3[2] * 0.0;
  fVar361 = pfVar3[3] * 0.0;
  local_4e8._0_4_ = fVar250 + fVar342 + fVar273;
  local_4e8._4_4_ = fVar204 + fVar357 + fVar274;
  fStack_4e0 = fVar244 + fVar359 + fVar282;
  fStack_4dc = fVar269 + fVar361 + fVar283;
  auVar97._0_4_ = *pfVar3 * 3.0 + fVar273;
  auVar97._4_4_ = pfVar3[1] * 3.0 + fVar274;
  auVar97._8_4_ = pfVar3[2] * 3.0 + fVar282;
  auVar97._12_4_ = pfVar3[3] * 3.0 + fVar283;
  auVar171._0_4_ = fVar250 * 3.0;
  auVar171._4_4_ = fVar204 * 3.0;
  auVar171._8_4_ = fVar244 * 3.0;
  auVar171._12_4_ = fVar269 * 3.0;
  auVar286 = vsubps_avx(auVar97,auVar171);
  fVar363 = *pfVar6 * 0.0;
  fVar372 = pfVar6[1] * 0.0;
  fVar373 = pfVar6[2] * 0.0;
  fVar374 = pfVar6[3] * 0.0;
  fVar273 = fVar363 + fVar395 * 0.0;
  fVar274 = fVar372 + fVar247 * 0.0;
  fVar282 = fVar373 + fVar272 * 0.0;
  fVar283 = fVar374 + fVar248 * 0.0;
  fVar375 = *pfVar5 * 0.0;
  fVar383 = pfVar5[1] * 0.0;
  fVar384 = pfVar5[2] * 0.0;
  fVar385 = pfVar5[3] * 0.0;
  auVar400 = ZEXT1664((undefined1  [16])0x0);
  auVar386._0_4_ = fVar375 + fVar273 + fVar246;
  auVar386._4_4_ = fVar383 + fVar274 + fVar271;
  auVar386._8_4_ = fVar384 + fVar282 + fVar219;
  auVar386._12_4_ = fVar385 + fVar283 + fVar249;
  auVar98._0_4_ = *pfVar5 * 3.0 + fVar273;
  auVar98._4_4_ = pfVar5[1] * 3.0 + fVar274;
  auVar98._8_4_ = pfVar5[2] * 3.0 + fVar282;
  auVar98._12_4_ = pfVar5[3] * 3.0 + fVar283;
  auVar276._0_4_ = fVar246 * 3.0;
  auVar276._4_4_ = fVar271 * 3.0;
  auVar276._8_4_ = fVar219 * 3.0;
  auVar276._12_4_ = fVar249 * 3.0;
  auVar157 = vsubps_avx(auVar98,auVar276);
  auVar206._0_4_ = fVar250 * 0.0;
  auVar206._4_4_ = fVar204 * 0.0;
  auVar206._8_4_ = auVar400._8_4_ * fVar244;
  auVar206._12_4_ = auVar400._12_4_ * fVar269;
  auVar277._0_4_ = auVar206._0_4_ + fVar342 + fVar284 + fVar376;
  auVar277._4_4_ = auVar206._4_4_ + fVar357 + fVar285 + fVar245;
  auVar277._8_4_ = auVar206._8_4_ + fVar359 + fVar287 + fVar270;
  auVar277._12_4_ = auVar206._12_4_ + fVar361 + fVar288 + fVar95;
  auVar289._0_4_ = fVar376 * 3.0;
  auVar289._4_4_ = fVar245 * 3.0;
  auVar289._8_4_ = fVar270 * 3.0;
  auVar289._12_4_ = fVar95 * 3.0;
  auVar222._0_4_ = *pfVar4 * 3.0;
  auVar222._4_4_ = pfVar4[1] * 3.0;
  auVar222._8_4_ = pfVar4[2] * 3.0;
  auVar222._12_4_ = pfVar4[3] * 3.0;
  auVar113 = vsubps_avx(auVar289,auVar222);
  auVar223._0_4_ = fVar342 + auVar113._0_4_;
  auVar223._4_4_ = fVar357 + auVar113._4_4_;
  auVar223._8_4_ = fVar359 + auVar113._8_4_;
  auVar223._12_4_ = fVar361 + auVar113._12_4_;
  auVar35 = vsubps_avx(auVar223,auVar206);
  auVar224._0_4_ = fVar246 * 0.0;
  auVar224._4_4_ = fVar271 * 0.0;
  auVar224._8_4_ = auVar400._8_4_ * fVar219;
  auVar224._12_4_ = auVar400._12_4_ * fVar249;
  auVar207._0_4_ = auVar224._0_4_ + fVar375 + fVar363 + fVar395;
  auVar207._4_4_ = auVar224._4_4_ + fVar383 + fVar372 + fVar247;
  auVar207._8_4_ = auVar224._8_4_ + fVar384 + fVar373 + fVar272;
  auVar207._12_4_ = auVar224._12_4_ + fVar385 + fVar374 + fVar248;
  auVar252._0_4_ = fVar395 * 3.0;
  auVar252._4_4_ = fVar247 * 3.0;
  auVar252._8_4_ = fVar272 * 3.0;
  auVar252._12_4_ = fVar248 * 3.0;
  auVar290._0_4_ = *pfVar6 * 3.0;
  auVar290._4_4_ = pfVar6[1] * 3.0;
  auVar290._8_4_ = pfVar6[2] * 3.0;
  auVar290._12_4_ = pfVar6[3] * 3.0;
  auVar113 = vsubps_avx(auVar252,auVar290);
  auVar253._0_4_ = fVar375 + auVar113._0_4_;
  auVar253._4_4_ = fVar383 + auVar113._4_4_;
  auVar253._8_4_ = fVar384 + auVar113._8_4_;
  auVar253._12_4_ = fVar385 + auVar113._12_4_;
  auVar183 = vsubps_avx(auVar253,auVar224);
  auVar113 = vshufps_avx(auVar286,auVar286,0xc9);
  auVar211 = vshufps_avx(auVar386,auVar386,0xc9);
  fVar273 = auVar286._0_4_;
  auVar254._0_4_ = fVar273 * auVar211._0_4_;
  fVar274 = auVar286._4_4_;
  auVar254._4_4_ = fVar274 * auVar211._4_4_;
  fVar282 = auVar286._8_4_;
  auVar254._8_4_ = fVar282 * auVar211._8_4_;
  fVar283 = auVar286._12_4_;
  auVar254._12_4_ = fVar283 * auVar211._12_4_;
  auVar301._0_4_ = auVar386._0_4_ * auVar113._0_4_;
  auVar301._4_4_ = auVar386._4_4_ * auVar113._4_4_;
  auVar301._8_4_ = auVar386._8_4_ * auVar113._8_4_;
  auVar301._12_4_ = auVar386._12_4_ * auVar113._12_4_;
  auVar211 = vsubps_avx(auVar301,auVar254);
  auVar197 = vshufps_avx(auVar211,auVar211,0xc9);
  auVar211 = vshufps_avx(auVar157,auVar157,0xc9);
  auVar302._0_4_ = auVar211._0_4_ * fVar273;
  auVar302._4_4_ = auVar211._4_4_ * fVar274;
  auVar302._8_4_ = auVar211._8_4_ * fVar282;
  auVar302._12_4_ = auVar211._12_4_ * fVar283;
  auVar99._0_4_ = auVar113._0_4_ * auVar157._0_4_;
  auVar99._4_4_ = auVar113._4_4_ * auVar157._4_4_;
  auVar99._8_4_ = auVar113._8_4_ * auVar157._8_4_;
  auVar99._12_4_ = auVar113._12_4_ * auVar157._12_4_;
  auVar113 = vsubps_avx(auVar99,auVar302);
  auVar157 = vshufps_avx(auVar113,auVar113,0xc9);
  auVar113 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar211 = vshufps_avx(auVar207,auVar207,0xc9);
  fVar375 = auVar35._0_4_;
  auVar303._0_4_ = fVar375 * auVar211._0_4_;
  fVar383 = auVar35._4_4_;
  auVar303._4_4_ = fVar383 * auVar211._4_4_;
  fVar384 = auVar35._8_4_;
  auVar303._8_4_ = fVar384 * auVar211._8_4_;
  fVar385 = auVar35._12_4_;
  auVar303._12_4_ = fVar385 * auVar211._12_4_;
  auVar208._0_4_ = auVar113._0_4_ * auVar207._0_4_;
  auVar208._4_4_ = auVar113._4_4_ * auVar207._4_4_;
  auVar208._8_4_ = auVar113._8_4_ * auVar207._8_4_;
  auVar208._12_4_ = auVar113._12_4_ * auVar207._12_4_;
  auVar211 = vsubps_avx(auVar208,auVar303);
  auVar145 = vshufps_avx(auVar211,auVar211,0xc9);
  auVar211 = vshufps_avx(auVar183,auVar183,0xc9);
  auVar304._0_4_ = fVar375 * auVar211._0_4_;
  auVar304._4_4_ = fVar383 * auVar211._4_4_;
  auVar304._8_4_ = fVar384 * auVar211._8_4_;
  auVar304._12_4_ = fVar385 * auVar211._12_4_;
  auVar225._0_4_ = auVar113._0_4_ * auVar183._0_4_;
  auVar225._4_4_ = auVar113._4_4_ * auVar183._4_4_;
  auVar225._8_4_ = auVar113._8_4_ * auVar183._8_4_;
  auVar225._12_4_ = auVar113._12_4_ * auVar183._12_4_;
  auVar113 = vdpps_avx(auVar197,auVar197,0x7f);
  auVar211 = vsubps_avx(auVar225,auVar304);
  auVar183 = vshufps_avx(auVar211,auVar211,0xc9);
  fVar204 = auVar113._0_4_;
  auVar305._4_12_ = auVar400._4_12_;
  auVar305._0_4_ = fVar204;
  auVar211 = vrsqrtss_avx(auVar305,auVar305);
  fVar250 = auVar211._0_4_;
  auVar211 = ZEXT416((uint)(fVar250 * 1.5 - fVar204 * 0.5 * fVar250 * fVar250 * fVar250));
  auVar146 = vshufps_avx(auVar211,auVar211,0);
  fVar395 = auVar146._0_4_ * auVar197._0_4_;
  fVar247 = auVar146._4_4_ * auVar197._4_4_;
  fVar272 = auVar146._8_4_ * auVar197._8_4_;
  fVar248 = auVar146._12_4_ * auVar197._12_4_;
  auVar211 = vdpps_avx(auVar197,auVar157,0x7f);
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar100._0_4_ = auVar113._0_4_ * auVar157._0_4_;
  auVar100._4_4_ = auVar113._4_4_ * auVar157._4_4_;
  auVar100._8_4_ = auVar113._8_4_ * auVar157._8_4_;
  auVar100._12_4_ = auVar113._12_4_ * auVar157._12_4_;
  auVar113 = vshufps_avx(auVar211,auVar211,0);
  auVar255._0_4_ = auVar113._0_4_ * auVar197._0_4_;
  auVar255._4_4_ = auVar113._4_4_ * auVar197._4_4_;
  auVar255._8_4_ = auVar113._8_4_ * auVar197._8_4_;
  auVar255._12_4_ = auVar113._12_4_ * auVar197._12_4_;
  auVar36 = vsubps_avx(auVar100,auVar255);
  auVar113 = vrcpss_avx(auVar305,auVar305);
  auVar113 = ZEXT416((uint)(auVar113._0_4_ * (2.0 - fVar204 * auVar113._0_4_)));
  auVar197 = vshufps_avx(auVar113,auVar113,0);
  auVar113 = vdpps_avx(auVar145,auVar145,0x7f);
  fVar284 = auVar113._0_4_;
  auVar306._4_12_ = auVar400._4_12_;
  auVar306._0_4_ = fVar284;
  auVar211 = vrsqrtss_avx(auVar306,auVar306);
  fVar246 = auVar211._0_4_;
  auVar211 = vdpps_avx(auVar145,auVar183,0x7f);
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar397._0_4_ = auVar183._0_4_ * auVar113._0_4_;
  auVar397._4_4_ = auVar183._4_4_ * auVar113._4_4_;
  auVar397._8_4_ = auVar183._8_4_ * auVar113._8_4_;
  auVar397._12_4_ = auVar183._12_4_ * auVar113._12_4_;
  lVar24 = *(long *)(_Var22 + 0x38 + lVar91);
  lVar25 = *(long *)(_Var22 + 0x48 + lVar91);
  pfVar3 = (float *)(lVar24 + lVar25 * uVar87);
  fVar250 = *pfVar3;
  fVar204 = pfVar3[1];
  fVar244 = pfVar3[2];
  fVar269 = pfVar3[3];
  pfVar3 = (float *)(lVar24 + lVar25 * lVar92);
  pfVar4 = (float *)(lVar24 + lVar25 * lVar1);
  auVar113 = vshufps_avx(auVar211,auVar211,0);
  auVar101._0_4_ = auVar145._0_4_ * auVar113._0_4_;
  auVar101._4_4_ = auVar145._4_4_ * auVar113._4_4_;
  auVar101._8_4_ = auVar145._8_4_ * auVar113._8_4_;
  auVar101._12_4_ = auVar145._12_4_ * auVar113._12_4_;
  auVar183 = vsubps_avx(auVar397,auVar101);
  pfVar5 = (float *)(lVar24 + lVar25 * lVar2);
  fVar376 = *pfVar5;
  fVar245 = pfVar5[1];
  fVar270 = pfVar5[2];
  fVar95 = pfVar5[3];
  auVar113 = ZEXT416((uint)(fVar246 * 1.5 - fVar284 * 0.5 * fVar246 * fVar246 * fVar246));
  auVar211 = vshufps_avx(auVar113,auVar113,0);
  fVar246 = auVar211._0_4_ * auVar145._0_4_;
  fVar271 = auVar211._4_4_ * auVar145._4_4_;
  fVar219 = auVar211._8_4_ * auVar145._8_4_;
  fVar249 = auVar211._12_4_ * auVar145._12_4_;
  auVar113 = vrcpss_avx(auVar306,auVar306);
  auVar113 = ZEXT416((uint)(auVar113._0_4_ * (2.0 - auVar113._0_4_ * fVar284)));
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar157 = vshufps_avx(_local_4e8,_local_4e8,0xff);
  auVar387._0_4_ = auVar157._0_4_ * fVar395;
  auVar387._4_4_ = auVar157._4_4_ * fVar247;
  auVar387._8_4_ = auVar157._8_4_ * fVar272;
  auVar387._12_4_ = auVar157._12_4_ * fVar248;
  auVar145 = vshufps_avx(auVar286,auVar286,0xff);
  auVar366 = vsubps_avx(_local_4e8,auVar387);
  auVar291._0_4_ =
       auVar145._0_4_ * fVar395 + auVar157._0_4_ * auVar146._0_4_ * auVar36._0_4_ * auVar197._0_4_;
  auVar291._4_4_ =
       auVar145._4_4_ * fVar247 + auVar157._4_4_ * auVar146._4_4_ * auVar36._4_4_ * auVar197._4_4_;
  auVar291._8_4_ =
       auVar145._8_4_ * fVar272 + auVar157._8_4_ * auVar146._8_4_ * auVar36._8_4_ * auVar197._8_4_;
  auVar291._12_4_ =
       auVar145._12_4_ * fVar248 +
       auVar157._12_4_ * auVar146._12_4_ * auVar36._12_4_ * auVar197._12_4_;
  auVar146 = vsubps_avx(auVar286,auVar291);
  local_4e8._0_4_ = (float)local_4e8._0_4_ + auVar387._0_4_;
  local_4e8._4_4_ = (float)local_4e8._4_4_ + auVar387._4_4_;
  fStack_4e0 = fStack_4e0 + auVar387._8_4_;
  fStack_4dc = fStack_4dc + auVar387._12_4_;
  auVar197 = vshufps_avx(auVar277,auVar277,0xff);
  auVar172._0_4_ = auVar197._0_4_ * fVar246;
  auVar172._4_4_ = auVar197._4_4_ * fVar271;
  auVar172._8_4_ = auVar197._8_4_ * fVar219;
  auVar172._12_4_ = auVar197._12_4_ * fVar249;
  auVar157 = vshufps_avx(auVar35,auVar35,0xff);
  auVar286 = vsubps_avx(auVar277,auVar172);
  auVar102._0_4_ =
       auVar157._0_4_ * fVar246 + auVar197._0_4_ * auVar211._0_4_ * auVar183._0_4_ * auVar113._0_4_;
  auVar102._4_4_ =
       auVar157._4_4_ * fVar271 + auVar197._4_4_ * auVar211._4_4_ * auVar183._4_4_ * auVar113._4_4_;
  auVar102._8_4_ =
       auVar157._8_4_ * fVar219 + auVar197._8_4_ * auVar211._8_4_ * auVar183._8_4_ * auVar113._8_4_;
  auVar102._12_4_ =
       auVar157._12_4_ * fVar249 +
       auVar197._12_4_ * auVar211._12_4_ * auVar183._12_4_ * auVar113._12_4_;
  auVar35 = vsubps_avx(auVar35,auVar102);
  local_458._4_4_ = auVar277._4_4_ + auVar172._4_4_;
  local_458._0_4_ = auVar277._0_4_ + auVar172._0_4_;
  fStack_450 = auVar277._8_4_ + auVar172._8_4_;
  fStack_44c = auVar277._12_4_ + auVar172._12_4_;
  fVar342 = *pfVar4 * 0.0;
  fVar357 = pfVar4[1] * 0.0;
  fVar359 = pfVar4[2] * 0.0;
  fVar361 = pfVar4[3] * 0.0;
  fVar396 = fVar342 + fVar376 * 0.0;
  fVar402 = fVar357 + fVar245 * 0.0;
  fVar403 = fVar359 + fVar270 * 0.0;
  fVar404 = fVar361 + fVar95 * 0.0;
  auVar103._0_4_ = fVar396 + *pfVar3 * 3.0;
  auVar103._4_4_ = fVar402 + pfVar3[1] * 3.0;
  auVar103._8_4_ = fVar403 + pfVar3[2] * 3.0;
  auVar103._12_4_ = fVar404 + pfVar3[3] * 3.0;
  auVar173._0_4_ = fVar250 * 3.0;
  auVar173._4_4_ = fVar204 * 3.0;
  auVar173._8_4_ = fVar244 * 3.0;
  auVar173._12_4_ = fVar269 * 3.0;
  auVar36 = vsubps_avx(auVar103,auVar173);
  lVar24 = *(long *)(lVar23 + 0x38 + lVar91);
  lVar23 = *(long *)(lVar23 + 0x48 + lVar91);
  auVar113 = *(undefined1 (*) [16])(lVar24 + lVar1 * lVar23);
  pfVar5 = (float *)(lVar24 + lVar23 * lVar2);
  fVar246 = *pfVar5;
  fVar271 = pfVar5[1];
  fVar219 = pfVar5[2];
  fVar249 = pfVar5[3];
  fVar284 = auVar113._0_4_ * 0.0;
  fVar285 = auVar113._4_4_ * 0.0;
  fVar287 = auVar113._8_4_ * 0.0;
  fVar288 = auVar113._12_4_ * 0.0;
  fVar363 = fVar284 + fVar246 * 0.0;
  fVar372 = fVar285 + fVar271 * 0.0;
  fVar373 = fVar287 + fVar219 * 0.0;
  fVar374 = fVar288 + fVar249 * 0.0;
  pfVar5 = (float *)(lVar24 + lVar92 * lVar23);
  auVar388._0_4_ = *pfVar5 * 3.0 + fVar363;
  auVar388._4_4_ = pfVar5[1] * 3.0 + fVar372;
  auVar388._8_4_ = pfVar5[2] * 3.0 + fVar373;
  auVar388._12_4_ = pfVar5[3] * 3.0 + fVar374;
  pfVar6 = (float *)(lVar24 + uVar87 * lVar23);
  fVar395 = *pfVar6;
  fVar247 = pfVar6[1];
  fVar272 = pfVar6[2];
  fVar248 = pfVar6[3];
  auVar307._0_4_ = fVar395 * 3.0;
  auVar307._4_4_ = fVar247 * 3.0;
  auVar307._8_4_ = fVar272 * 3.0;
  auVar307._12_4_ = fVar248 * 3.0;
  auVar211 = vsubps_avx(auVar388,auVar307);
  auVar308._0_4_ = fVar376 * 3.0;
  auVar308._4_4_ = fVar245 * 3.0;
  auVar308._8_4_ = fVar270 * 3.0;
  auVar308._12_4_ = fVar95 * 3.0;
  auVar364._0_4_ = *pfVar4 * 3.0;
  auVar364._4_4_ = pfVar4[1] * 3.0;
  auVar364._8_4_ = pfVar4[2] * 3.0;
  auVar364._12_4_ = pfVar4[3] * 3.0;
  auVar197 = vsubps_avx(auVar308,auVar364);
  fVar343 = *pfVar3 * 0.0;
  fVar358 = pfVar3[1] * 0.0;
  fVar360 = pfVar3[2] * 0.0;
  fVar362 = pfVar3[3] * 0.0;
  auVar309._0_4_ = fVar343 + auVar197._0_4_;
  auVar309._4_4_ = fVar358 + auVar197._4_4_;
  auVar309._8_4_ = fVar360 + auVar197._8_4_;
  auVar309._12_4_ = fVar362 + auVar197._12_4_;
  auVar365._0_4_ = fVar250 + fVar343 + fVar396;
  auVar365._4_4_ = fVar204 + fVar358 + fVar402;
  auVar365._8_4_ = fVar244 + fVar360 + fVar403;
  auVar365._12_4_ = fVar269 + fVar362 + fVar404;
  auVar330._0_4_ = fVar250 * 0.0;
  auVar330._4_4_ = fVar204 * 0.0;
  auVar330._8_4_ = fVar244 * 0.0;
  auVar330._12_4_ = fVar269 * 0.0;
  local_4c8._0_4_ = auVar330._0_4_ + fVar343 + fVar376 + fVar342;
  local_4c8._4_4_ = auVar330._4_4_ + fVar358 + fVar245 + fVar357;
  fStack_4c0 = auVar330._8_4_ + fVar360 + fVar270 + fVar359;
  fStack_4bc = auVar330._12_4_ + fVar362 + fVar95 + fVar361;
  auVar37 = vsubps_avx(auVar309,auVar330);
  auVar135._0_4_ = fVar246 * 3.0;
  auVar135._4_4_ = fVar271 * 3.0;
  auVar135._8_4_ = fVar219 * 3.0;
  auVar135._12_4_ = fVar249 * 3.0;
  auVar226._0_4_ = auVar113._0_4_ * 3.0;
  auVar226._4_4_ = auVar113._4_4_ * 3.0;
  auVar226._8_4_ = auVar113._8_4_ * 3.0;
  auVar226._12_4_ = auVar113._12_4_ * 3.0;
  auVar113 = vsubps_avx(auVar135,auVar226);
  fVar250 = *pfVar5 * 0.0;
  fVar204 = pfVar5[1] * 0.0;
  fVar244 = pfVar5[2] * 0.0;
  fVar269 = pfVar5[3] * 0.0;
  auVar136._0_4_ = fVar250 + auVar113._0_4_;
  auVar136._4_4_ = fVar204 + auVar113._4_4_;
  auVar136._8_4_ = fVar244 + auVar113._8_4_;
  auVar136._12_4_ = fVar269 + auVar113._12_4_;
  auVar174._0_4_ = fVar395 + fVar250 + fVar363;
  auVar174._4_4_ = fVar247 + fVar204 + fVar372;
  auVar174._8_4_ = fVar272 + fVar244 + fVar373;
  auVar174._12_4_ = fVar248 + fVar269 + fVar374;
  auVar104._0_4_ = fVar395 * 0.0;
  auVar104._4_4_ = fVar247 * 0.0;
  auVar104._8_4_ = fVar272 * 0.0;
  auVar104._12_4_ = fVar248 * 0.0;
  auVar209._0_4_ = auVar104._0_4_ + fVar250 + fVar284 + fVar246;
  auVar209._4_4_ = auVar104._4_4_ + fVar204 + fVar285 + fVar271;
  auVar209._8_4_ = auVar104._8_4_ + fVar244 + fVar287 + fVar219;
  auVar209._12_4_ = auVar104._12_4_ + fVar269 + fVar288 + fVar249;
  auVar157 = vsubps_avx(auVar136,auVar104);
  auVar113 = vshufps_avx(auVar174,auVar174,0xc9);
  fVar95 = auVar36._0_4_;
  auVar137._0_4_ = fVar95 * auVar113._0_4_;
  fVar246 = auVar36._4_4_;
  auVar137._4_4_ = fVar246 * auVar113._4_4_;
  fVar271 = auVar36._8_4_;
  auVar137._8_4_ = fVar271 * auVar113._8_4_;
  fVar219 = auVar36._12_4_;
  auVar137._12_4_ = fVar219 * auVar113._12_4_;
  auVar113 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar175._0_4_ = auVar113._0_4_ * auVar174._0_4_;
  auVar175._4_4_ = auVar113._4_4_ * auVar174._4_4_;
  auVar175._8_4_ = auVar113._8_4_ * auVar174._8_4_;
  auVar175._12_4_ = auVar113._12_4_ * auVar174._12_4_;
  auVar197 = vsubps_avx(auVar175,auVar137);
  auVar176._0_4_ = auVar211._0_4_ * auVar113._0_4_;
  auVar176._4_4_ = auVar211._4_4_ * auVar113._4_4_;
  auVar176._8_4_ = auVar211._8_4_ * auVar113._8_4_;
  auVar176._12_4_ = auVar211._12_4_ * auVar113._12_4_;
  auVar113 = vshufps_avx(auVar211,auVar211,0xc9);
  auVar227._0_4_ = fVar95 * auVar113._0_4_;
  auVar227._4_4_ = fVar246 * auVar113._4_4_;
  auVar227._8_4_ = fVar271 * auVar113._8_4_;
  auVar227._12_4_ = fVar219 * auVar113._12_4_;
  auVar145 = vsubps_avx(auVar176,auVar227);
  auVar113 = vshufps_avx(auVar209,auVar209,0xc9);
  fVar249 = auVar37._0_4_;
  auVar228._0_4_ = fVar249 * auVar113._0_4_;
  fVar395 = auVar37._4_4_;
  auVar228._4_4_ = fVar395 * auVar113._4_4_;
  fVar247 = auVar37._8_4_;
  auVar228._8_4_ = fVar247 * auVar113._8_4_;
  fVar272 = auVar37._12_4_;
  auVar228._12_4_ = fVar272 * auVar113._12_4_;
  auVar113 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar210._0_4_ = auVar113._0_4_ * auVar209._0_4_;
  auVar210._4_4_ = auVar113._4_4_ * auVar209._4_4_;
  auVar210._8_4_ = auVar113._8_4_ * auVar209._8_4_;
  auVar210._12_4_ = auVar113._12_4_ * auVar209._12_4_;
  auVar183 = vsubps_avx(auVar210,auVar228);
  auVar197 = vshufps_avx(auVar197,auVar197,0xc9);
  auVar138._0_4_ = auVar113._0_4_ * auVar157._0_4_;
  auVar138._4_4_ = auVar113._4_4_ * auVar157._4_4_;
  auVar138._8_4_ = auVar113._8_4_ * auVar157._8_4_;
  auVar138._12_4_ = auVar113._12_4_ * auVar157._12_4_;
  auVar211 = vshufps_avx(auVar157,auVar157,0xc9);
  auVar113 = vdpps_avx(auVar197,auVar197,0x7f);
  auVar105._0_4_ = fVar249 * auVar211._0_4_;
  auVar105._4_4_ = fVar395 * auVar211._4_4_;
  auVar105._8_4_ = fVar247 * auVar211._8_4_;
  auVar105._12_4_ = fVar272 * auVar211._12_4_;
  auVar38 = vsubps_avx(auVar138,auVar105);
  auVar157 = vshufps_avx(auVar145,auVar145,0xc9);
  fVar250 = auVar113._0_4_;
  auVar145 = ZEXT416((uint)fVar250);
  auVar211 = vrsqrtss_avx(auVar145,auVar145);
  fVar204 = auVar211._0_4_;
  auVar211 = vdpps_avx(auVar197,auVar157,0x7f);
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar106._0_4_ = auVar113._0_4_ * auVar157._0_4_;
  auVar106._4_4_ = auVar113._4_4_ * auVar157._4_4_;
  auVar106._8_4_ = auVar113._8_4_ * auVar157._8_4_;
  auVar106._12_4_ = auVar113._12_4_ * auVar157._12_4_;
  auVar113 = vshufps_avx(auVar211,auVar211,0);
  auVar256._0_4_ = auVar197._0_4_ * auVar113._0_4_;
  auVar256._4_4_ = auVar197._4_4_ * auVar113._4_4_;
  auVar256._8_4_ = auVar197._8_4_ * auVar113._8_4_;
  auVar256._12_4_ = auVar197._12_4_ * auVar113._12_4_;
  auVar39 = vsubps_avx(auVar106,auVar256);
  auVar113 = vrcpss_avx(auVar145,auVar145);
  auVar113 = ZEXT416((uint)(auVar113._0_4_ * (2.0 - fVar250 * auVar113._0_4_)));
  auVar157 = vshufps_avx(auVar113,auVar113,0);
  auVar145 = vshufps_avx(auVar183,auVar183,0xc9);
  auVar113 = ZEXT416((uint)(fVar204 * 1.5 - fVar250 * 0.5 * fVar204 * fVar204 * fVar204));
  auVar183 = vshufps_avx(auVar113,auVar113,0);
  auVar113 = vdpps_avx(auVar145,auVar145,0x7f);
  fVar376 = auVar197._0_4_ * auVar183._0_4_;
  fVar245 = auVar197._4_4_ * auVar183._4_4_;
  fVar270 = auVar197._8_4_ * auVar183._8_4_;
  fVar248 = auVar197._12_4_ * auVar183._12_4_;
  auVar197 = vshufps_avx(auVar38,auVar38,0xc9);
  fVar204 = auVar113._0_4_;
  auVar177 = ZEXT416((uint)fVar204);
  auVar211 = vrsqrtss_avx(auVar177,auVar177);
  fVar250 = auVar211._0_4_;
  auVar211 = vdpps_avx(auVar145,auVar197,0x7f);
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar139._0_4_ = auVar113._0_4_ * auVar197._0_4_;
  auVar139._4_4_ = auVar113._4_4_ * auVar197._4_4_;
  auVar139._8_4_ = auVar113._8_4_ * auVar197._8_4_;
  auVar139._12_4_ = auVar113._12_4_ * auVar197._12_4_;
  auVar113 = vshufps_avx(auVar211,auVar211,0);
  auVar257._0_4_ = auVar145._0_4_ * auVar113._0_4_;
  auVar257._4_4_ = auVar145._4_4_ * auVar113._4_4_;
  auVar257._8_4_ = auVar145._8_4_ * auVar113._8_4_;
  auVar257._12_4_ = auVar145._12_4_ * auVar113._12_4_;
  auVar38 = vsubps_avx(auVar139,auVar257);
  auVar113 = vrcpss_avx(auVar177,auVar177);
  auVar113 = ZEXT416((uint)(auVar113._0_4_ * (2.0 - fVar204 * auVar113._0_4_)));
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar211 = ZEXT416((uint)(fVar250 * 1.5 - fVar204 * 0.5 * fVar250 * fVar250 * fVar250));
  auVar211 = vshufps_avx(auVar211,auVar211,0);
  fVar250 = auVar145._0_4_ * auVar211._0_4_;
  fVar204 = auVar145._4_4_ * auVar211._4_4_;
  fVar244 = auVar145._8_4_ * auVar211._8_4_;
  fVar269 = auVar145._12_4_ * auVar211._12_4_;
  auVar197 = vshufps_avx(auVar36,auVar36,0xff);
  auVar145 = vshufps_avx(auVar365,auVar365,0xff);
  auVar229._0_4_ = fVar376 * auVar145._0_4_;
  auVar229._4_4_ = fVar245 * auVar145._4_4_;
  auVar229._8_4_ = fVar270 * auVar145._8_4_;
  auVar229._12_4_ = fVar248 * auVar145._12_4_;
  auVar178._0_4_ =
       fVar376 * auVar197._0_4_ + auVar183._0_4_ * auVar39._0_4_ * auVar157._0_4_ * auVar145._0_4_;
  auVar178._4_4_ =
       fVar245 * auVar197._4_4_ + auVar183._4_4_ * auVar39._4_4_ * auVar157._4_4_ * auVar145._4_4_;
  auVar178._8_4_ =
       fVar270 * auVar197._8_4_ + auVar183._8_4_ * auVar39._8_4_ * auVar157._8_4_ * auVar145._8_4_;
  auVar178._12_4_ =
       fVar248 * auVar197._12_4_ +
       auVar183._12_4_ * auVar39._12_4_ * auVar157._12_4_ * auVar145._12_4_;
  auVar145 = vsubps_avx(auVar365,auVar229);
  auVar183 = vsubps_avx(auVar36,auVar178);
  auVar197 = vshufps_avx(auVar37,auVar37,0xff);
  auVar157 = vshufps_avx(_local_4c8,_local_4c8,0xff);
  auVar107._0_4_ = auVar157._0_4_ * fVar250;
  auVar107._4_4_ = auVar157._4_4_ * fVar204;
  auVar107._8_4_ = auVar157._8_4_ * fVar244;
  auVar107._12_4_ = auVar157._12_4_ * fVar269;
  auVar140._0_4_ =
       auVar197._0_4_ * fVar250 + auVar157._0_4_ * auVar211._0_4_ * auVar38._0_4_ * auVar113._0_4_;
  auVar140._4_4_ =
       auVar197._4_4_ * fVar204 + auVar157._4_4_ * auVar211._4_4_ * auVar38._4_4_ * auVar113._4_4_;
  auVar140._8_4_ =
       auVar197._8_4_ * fVar244 + auVar157._8_4_ * auVar211._8_4_ * auVar38._8_4_ * auVar113._8_4_;
  auVar140._12_4_ =
       auVar197._12_4_ * fVar269 +
       auVar157._12_4_ * auVar211._12_4_ * auVar38._12_4_ * auVar113._12_4_;
  auVar197 = vsubps_avx(_local_4c8,auVar107);
  local_4c8._0_4_ = (float)local_4c8._0_4_ + auVar107._0_4_;
  local_4c8._4_4_ = (float)local_4c8._4_4_ + auVar107._4_4_;
  fStack_4c0 = fStack_4c0 + auVar107._8_4_;
  fStack_4bc = fStack_4bc + auVar107._12_4_;
  auVar157 = vsubps_avx(auVar37,auVar140);
  local_408._0_4_ = auVar146._0_4_;
  local_408._4_4_ = auVar146._4_4_;
  fStack_400 = auVar146._8_4_;
  fStack_3fc = auVar146._12_4_;
  local_318._0_4_ = auVar366._0_4_;
  local_318._4_4_ = auVar366._4_4_;
  fStack_310 = auVar366._8_4_;
  fStack_30c = auVar366._12_4_;
  auVar113 = vshufps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),0);
  auVar211 = vshufps_avx(ZEXT416((uint)(1.0 - fVar220)),ZEXT416((uint)(1.0 - fVar220)),0);
  fVar269 = auVar113._0_4_;
  fVar376 = auVar113._4_4_;
  fVar245 = auVar113._8_4_;
  fVar270 = auVar113._12_4_;
  fVar220 = auVar211._0_4_;
  fVar250 = auVar211._4_4_;
  fVar204 = auVar211._8_4_;
  fVar244 = auVar211._12_4_;
  local_388._0_4_ = fVar220 * (float)local_318._0_4_ + fVar269 * auVar145._0_4_;
  local_388._4_4_ = fVar250 * (float)local_318._4_4_ + fVar376 * auVar145._4_4_;
  fStack_380 = fVar204 * fStack_310 + fVar245 * auVar145._8_4_;
  fStack_37c = fVar244 * fStack_30c + fVar270 * auVar145._12_4_;
  local_398._0_4_ =
       fVar220 * ((float)local_318._0_4_ + (float)local_408._0_4_ * 0.33333334) +
       fVar269 * (auVar145._0_4_ + auVar183._0_4_ * 0.33333334);
  local_398._4_4_ =
       fVar250 * ((float)local_318._4_4_ + (float)local_408._4_4_ * 0.33333334) +
       fVar376 * (auVar145._4_4_ + auVar183._4_4_ * 0.33333334);
  fStack_390 = fVar204 * (fStack_310 + fStack_400 * 0.33333334) +
               fVar245 * (auVar145._8_4_ + auVar183._8_4_ * 0.33333334);
  fStack_38c = fVar244 * (fStack_30c + fStack_3fc * 0.33333334) +
               fVar270 * (auVar145._12_4_ + auVar183._12_4_ * 0.33333334);
  local_4a8._0_4_ = auVar35._0_4_;
  local_4a8._4_4_ = auVar35._4_4_;
  fStack_4a0 = auVar35._8_4_;
  fStack_49c = auVar35._12_4_;
  auVar212._0_4_ = (float)local_4a8._0_4_ * 0.33333334;
  auVar212._4_4_ = (float)local_4a8._4_4_ * 0.33333334;
  auVar212._8_4_ = fStack_4a0 * 0.33333334;
  auVar212._12_4_ = fStack_49c * 0.33333334;
  auVar113 = vsubps_avx(auVar286,auVar212);
  auVar258._0_4_ = (fVar375 + auVar102._0_4_) * 0.33333334;
  auVar258._4_4_ = (fVar383 + auVar102._4_4_) * 0.33333334;
  auVar258._8_4_ = (fVar384 + auVar102._8_4_) * 0.33333334;
  auVar258._12_4_ = (fVar385 + auVar102._12_4_) * 0.33333334;
  auVar211 = vsubps_avx(_local_458,auVar258);
  auVar179._0_4_ = auVar157._0_4_ * 0.33333334;
  auVar179._4_4_ = auVar157._4_4_ * 0.33333334;
  auVar179._8_4_ = auVar157._8_4_ * 0.33333334;
  auVar179._12_4_ = auVar157._12_4_ * 0.33333334;
  auVar157 = vsubps_avx(auVar197,auVar179);
  auVar141._0_4_ = (fVar249 + auVar140._0_4_) * 0.33333334;
  auVar141._4_4_ = (fVar395 + auVar140._4_4_) * 0.33333334;
  auVar141._8_4_ = (fVar247 + auVar140._8_4_) * 0.33333334;
  auVar141._12_4_ = (fVar272 + auVar140._12_4_) * 0.33333334;
  auVar145 = vsubps_avx(_local_4c8,auVar141);
  local_3a8._0_4_ = fVar220 * auVar113._0_4_ + fVar269 * auVar157._0_4_;
  local_3a8._4_4_ = fVar250 * auVar113._4_4_ + fVar376 * auVar157._4_4_;
  fStack_3a0 = fVar204 * auVar113._8_4_ + fVar245 * auVar157._8_4_;
  fStack_39c = fVar244 * auVar113._12_4_ + fVar270 * auVar157._12_4_;
  local_3b8._0_4_ = fVar269 * auVar197._0_4_ + auVar286._0_4_ * fVar220;
  local_3b8._4_4_ = fVar376 * auVar197._4_4_ + auVar286._4_4_ * fVar250;
  fStack_3b0 = fVar245 * auVar197._8_4_ + auVar286._8_4_ * fVar204;
  fStack_3ac = fVar270 * auVar197._12_4_ + auVar286._12_4_ * fVar244;
  local_3c8._0_4_ = fVar220 * (float)local_4e8._0_4_ + fVar269 * (auVar365._0_4_ + auVar229._0_4_);
  local_3c8._4_4_ = fVar250 * (float)local_4e8._4_4_ + fVar376 * (auVar365._4_4_ + auVar229._4_4_);
  fStack_3c0 = fVar204 * fStack_4e0 + fVar245 * (auVar365._8_4_ + auVar229._8_4_);
  fStack_3bc = fVar244 * fStack_4dc + fVar270 * (auVar365._12_4_ + auVar229._12_4_);
  local_3d8._0_4_ =
       fVar220 * ((float)local_4e8._0_4_ + (fVar273 + auVar291._0_4_) * 0.33333334) +
       fVar269 * (auVar365._0_4_ + auVar229._0_4_ + (fVar95 + auVar178._0_4_) * 0.33333334);
  local_3d8._4_4_ =
       fVar250 * ((float)local_4e8._4_4_ + (fVar274 + auVar291._4_4_) * 0.33333334) +
       fVar376 * (auVar365._4_4_ + auVar229._4_4_ + (fVar246 + auVar178._4_4_) * 0.33333334);
  fStack_3d0 = fVar204 * (fStack_4e0 + (fVar282 + auVar291._8_4_) * 0.33333334) +
               fVar245 * (auVar365._8_4_ + auVar229._8_4_ + (fVar271 + auVar178._8_4_) * 0.33333334)
  ;
  fStack_3cc = fVar244 * (fStack_4dc + (fVar283 + auVar291._12_4_) * 0.33333334) +
               fVar270 * (auVar365._12_4_ + auVar229._12_4_ +
                         (fVar219 + auVar178._12_4_) * 0.33333334);
  local_3e8 = fVar220 * auVar211._0_4_ + fVar269 * auVar145._0_4_;
  fStack_3e4 = fVar250 * auVar211._4_4_ + fVar376 * auVar145._4_4_;
  fStack_3e0 = fVar204 * auVar211._8_4_ + fVar245 * auVar145._8_4_;
  fStack_3dc = fVar244 * auVar211._12_4_ + fVar270 * auVar145._12_4_;
  local_418 = (auVar277._0_4_ + auVar172._0_4_) * fVar220 + fVar269 * (float)local_4c8._0_4_;
  fStack_414 = (auVar277._4_4_ + auVar172._4_4_) * fVar250 + fVar376 * (float)local_4c8._4_4_;
  fStack_410 = (auVar277._8_4_ + auVar172._8_4_) * fVar204 + fVar245 * fStack_4c0;
  fStack_40c = (auVar277._12_4_ + auVar172._12_4_) * fVar244 + fVar270 * fStack_4bc;
  aVar11 = (ray->org).field_0;
  auVar197 = vsubps_avx(_local_388,(undefined1  [16])aVar11);
  auVar211 = vmovsldup_avx(auVar197);
  auVar113 = vmovshdup_avx(auVar197);
  auVar197 = vshufps_avx(auVar197,auVar197,0xaa);
  fVar220 = (pre->ray_space).vx.field_0.m128[0];
  fVar250 = (pre->ray_space).vx.field_0.m128[1];
  fVar204 = (pre->ray_space).vx.field_0.m128[2];
  fVar244 = (pre->ray_space).vx.field_0.m128[3];
  fVar269 = (pre->ray_space).vy.field_0.m128[0];
  fVar376 = (pre->ray_space).vy.field_0.m128[1];
  fVar245 = (pre->ray_space).vy.field_0.m128[2];
  fVar270 = (pre->ray_space).vy.field_0.m128[3];
  fVar95 = (pre->ray_space).vz.field_0.m128[0];
  fVar246 = (pre->ray_space).vz.field_0.m128[1];
  fVar271 = (pre->ray_space).vz.field_0.m128[2];
  fVar219 = (pre->ray_space).vz.field_0.m128[3];
  local_508._4_4_ = fVar250 * auVar211._4_4_ + fVar376 * auVar113._4_4_ + fVar246 * auVar197._4_4_;
  local_508._0_4_ = fVar220 * auVar211._0_4_ + fVar269 * auVar113._0_4_ + fVar95 * auVar197._0_4_;
  fStack_500 = fVar204 * auVar211._8_4_ + fVar245 * auVar113._8_4_ + fVar271 * auVar197._8_4_;
  fStack_4fc = fVar244 * auVar211._12_4_ + fVar270 * auVar113._12_4_ + fVar219 * auVar197._12_4_;
  auVar197 = vsubps_avx(_local_398,(undefined1  [16])aVar11);
  auVar211 = vmovsldup_avx(auVar197);
  auVar113 = vmovshdup_avx(auVar197);
  auVar197 = vshufps_avx(auVar197,auVar197,0xaa);
  auVar377._0_8_ =
       CONCAT44(fVar250 * auVar211._4_4_ + fVar376 * auVar113._4_4_ + fVar246 * auVar197._4_4_,
                fVar220 * auVar211._0_4_ + fVar269 * auVar113._0_4_ + fVar95 * auVar197._0_4_);
  auVar377._8_4_ = fVar204 * auVar211._8_4_ + fVar245 * auVar113._8_4_ + fVar271 * auVar197._8_4_;
  auVar377._12_4_ =
       fVar244 * auVar211._12_4_ + fVar270 * auVar113._12_4_ + fVar219 * auVar197._12_4_;
  auVar211 = vsubps_avx(_local_3a8,(undefined1  [16])aVar11);
  auVar197 = vshufps_avx(auVar211,auVar211,0xaa);
  auVar113 = vmovshdup_avx(auVar211);
  auVar211 = vmovsldup_avx(auVar211);
  auVar142._0_8_ =
       CONCAT44(fVar250 * auVar211._4_4_ + auVar113._4_4_ * fVar376 + fVar246 * auVar197._4_4_,
                fVar220 * auVar211._0_4_ + auVar113._0_4_ * fVar269 + fVar95 * auVar197._0_4_);
  auVar142._8_4_ = fVar204 * auVar211._8_4_ + auVar113._8_4_ * fVar245 + fVar271 * auVar197._8_4_;
  auVar142._12_4_ =
       fVar244 * auVar211._12_4_ + auVar113._12_4_ * fVar270 + fVar219 * auVar197._12_4_;
  auVar211 = vsubps_avx(_local_3b8,(undefined1  [16])aVar11);
  auVar197 = vshufps_avx(auVar211,auVar211,0xaa);
  auVar113 = vmovshdup_avx(auVar211);
  auVar211 = vmovsldup_avx(auVar211);
  auVar292._0_8_ =
       CONCAT44(auVar113._4_4_ * fVar376 + auVar197._4_4_ * fVar246 + fVar250 * auVar211._4_4_,
                auVar113._0_4_ * fVar269 + auVar197._0_4_ * fVar95 + fVar220 * auVar211._0_4_);
  auVar292._8_4_ = auVar113._8_4_ * fVar245 + auVar197._8_4_ * fVar271 + fVar204 * auVar211._8_4_;
  auVar292._12_4_ =
       auVar113._12_4_ * fVar270 + auVar197._12_4_ * fVar219 + fVar244 * auVar211._12_4_;
  auVar211 = vsubps_avx(_local_3c8,(undefined1  [16])aVar11);
  auVar197 = vshufps_avx(auVar211,auVar211,0xaa);
  auVar113 = vmovshdup_avx(auVar211);
  auVar211 = vmovsldup_avx(auVar211);
  auVar310._0_8_ =
       CONCAT44(auVar211._4_4_ * fVar250 + auVar113._4_4_ * fVar376 + auVar197._4_4_ * fVar246,
                auVar211._0_4_ * fVar220 + auVar113._0_4_ * fVar269 + auVar197._0_4_ * fVar95);
  auVar310._8_4_ = auVar211._8_4_ * fVar204 + auVar113._8_4_ * fVar245 + auVar197._8_4_ * fVar271;
  auVar310._12_4_ =
       auVar211._12_4_ * fVar244 + auVar113._12_4_ * fVar270 + auVar197._12_4_ * fVar219;
  auVar211 = vsubps_avx(_local_3d8,(undefined1  [16])aVar11);
  auVar197 = vshufps_avx(auVar211,auVar211,0xaa);
  auVar113 = vmovshdup_avx(auVar211);
  auVar211 = vmovsldup_avx(auVar211);
  auVar320._0_4_ = auVar211._0_4_ * fVar220 + auVar113._0_4_ * fVar269 + auVar197._0_4_ * fVar95;
  auVar320._4_4_ = auVar211._4_4_ * fVar250 + auVar113._4_4_ * fVar376 + auVar197._4_4_ * fVar246;
  auVar320._8_4_ = auVar211._8_4_ * fVar204 + auVar113._8_4_ * fVar245 + auVar197._8_4_ * fVar271;
  auVar320._12_4_ =
       auVar211._12_4_ * fVar244 + auVar113._12_4_ * fVar270 + auVar197._12_4_ * fVar219;
  auVar84._4_4_ = fStack_3e4;
  auVar84._0_4_ = local_3e8;
  auVar84._8_4_ = fStack_3e0;
  auVar84._12_4_ = fStack_3dc;
  auVar211 = vsubps_avx(auVar84,(undefined1  [16])aVar11);
  auVar197 = vshufps_avx(auVar211,auVar211,0xaa);
  auVar113 = vmovshdup_avx(auVar211);
  auVar211 = vmovsldup_avx(auVar211);
  auVar331._0_8_ =
       CONCAT44(auVar211._4_4_ * fVar250 + auVar113._4_4_ * fVar376 + auVar197._4_4_ * fVar246,
                auVar211._0_4_ * fVar220 + auVar113._0_4_ * fVar269 + auVar197._0_4_ * fVar95);
  auVar331._8_4_ = auVar211._8_4_ * fVar204 + auVar113._8_4_ * fVar245 + auVar197._8_4_ * fVar271;
  auVar331._12_4_ =
       auVar211._12_4_ * fVar244 + auVar113._12_4_ * fVar270 + auVar197._12_4_ * fVar219;
  auVar81._4_4_ = fStack_414;
  auVar81._0_4_ = local_418;
  auVar81._8_4_ = fStack_410;
  auVar81._12_4_ = fStack_40c;
  auVar211 = vsubps_avx(auVar81,(undefined1  [16])aVar11);
  auVar197 = vshufps_avx(auVar211,auVar211,0xaa);
  auVar113 = vmovshdup_avx(auVar211);
  auVar211 = vmovsldup_avx(auVar211);
  auVar108._0_8_ =
       CONCAT44(fVar250 * auVar211._4_4_ + auVar113._4_4_ * fVar376 + auVar197._4_4_ * fVar246,
                fVar220 * auVar211._0_4_ + auVar113._0_4_ * fVar269 + auVar197._0_4_ * fVar95);
  auVar108._8_4_ = fVar204 * auVar211._8_4_ + auVar113._8_4_ * fVar245 + auVar197._8_4_ * fVar271;
  auVar108._12_4_ =
       fVar244 * auVar211._12_4_ + auVar113._12_4_ * fVar270 + auVar197._12_4_ * fVar219;
  _local_458 = vmovlhps_avx(_local_508,auVar310);
  _local_468 = vmovlhps_avx(auVar377,auVar320);
  _local_478 = vmovlhps_avx(auVar142,auVar331);
  _local_218 = vmovlhps_avx(auVar292,auVar108);
  auVar113 = vminps_avx(_local_458,_local_468);
  auVar211 = vminps_avx(_local_478,_local_218);
  auVar197 = vminps_avx(auVar113,auVar211);
  auVar113 = vmaxps_avx(_local_458,_local_468);
  auVar211 = vmaxps_avx(_local_478,_local_218);
  auVar113 = vmaxps_avx(auVar113,auVar211);
  auVar211 = vshufpd_avx(auVar197,auVar197,3);
  auVar197 = vminps_avx(auVar197,auVar211);
  auVar211 = vshufpd_avx(auVar113,auVar113,3);
  auVar211 = vmaxps_avx(auVar113,auVar211);
  auVar278._8_4_ = 0x7fffffff;
  auVar278._0_8_ = 0x7fffffff7fffffff;
  auVar278._12_4_ = 0x7fffffff;
  auVar113 = vandps_avx(auVar197,auVar278);
  auVar211 = vandps_avx(auVar211,auVar278);
  auVar113 = vmaxps_avx(auVar113,auVar211);
  auVar211 = vmovshdup_avx(auVar113);
  auVar113 = vmaxss_avx(auVar211,auVar113);
  fVar220 = auVar113._0_4_ * 9.536743e-07;
  local_488._8_8_ = local_508;
  local_488._0_8_ = local_508;
  auVar400 = ZEXT1664(local_488);
  local_328._8_8_ = auVar377._0_8_;
  local_328._0_8_ = auVar377._0_8_;
  auVar382 = ZEXT1664(local_328);
  local_338._8_8_ = auVar142._0_8_;
  local_338._0_8_ = auVar142._0_8_;
  local_348._8_8_ = auVar292._0_8_;
  local_348._0_8_ = auVar292._0_8_;
  auVar300 = ZEXT1664(local_338);
  local_358._8_8_ = auVar310._0_8_;
  local_358._0_8_ = auVar310._0_8_;
  auVar319 = ZEXT1664(local_348);
  auVar329 = ZEXT1664(local_358);
  local_368._8_8_ = auVar331._0_8_;
  local_368._0_8_ = auVar331._0_8_;
  auVar341 = ZEXT1664(local_368);
  local_378._8_8_ = auVar108._0_8_;
  local_378._0_8_ = auVar108._0_8_;
  local_228 = ZEXT416((uint)fVar220);
  auVar113 = vshufps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),0);
  local_78._16_16_ = auVar113;
  local_78._0_16_ = auVar113;
  auVar109._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
  auVar109._8_4_ = auVar113._8_4_ ^ 0x80000000;
  auVar109._12_4_ = auVar113._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar109;
  local_98._0_16_ = auVar109;
  bVar94 = false;
  uVar87 = 0;
  _local_1e8 = vsubps_avx(_local_468,_local_458);
  auVar356 = ZEXT1664(local_378);
  _local_1f8 = vsubps_avx(_local_478,_local_468);
  _local_208 = vsubps_avx(_local_218,_local_478);
  _local_248 = vsubps_avx(_local_3c8,_local_388);
  _local_258 = vsubps_avx(_local_3d8,_local_398);
  _local_268 = vsubps_avx(auVar84,_local_3a8);
  auVar82._4_4_ = fStack_414;
  auVar82._0_4_ = local_418;
  auVar82._8_4_ = fStack_410;
  auVar82._12_4_ = fStack_40c;
  _local_278 = vsubps_avx(auVar82,_local_3b8);
  auVar371 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar401 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00abc56f:
  local_238 = auVar401._0_16_;
  auVar366 = auVar371._0_16_;
  auVar113 = vshufps_avx(auVar366,auVar366,0x50);
  auVar389._8_4_ = 0x3f800000;
  auVar389._0_8_ = 0x3f8000003f800000;
  auVar389._12_4_ = 0x3f800000;
  auVar394._16_4_ = 0x3f800000;
  auVar394._0_16_ = auVar389;
  auVar394._20_4_ = 0x3f800000;
  auVar394._24_4_ = 0x3f800000;
  auVar394._28_4_ = 0x3f800000;
  auVar211 = vsubps_avx(auVar389,auVar113);
  fVar220 = auVar113._0_4_;
  fVar250 = auVar113._4_4_;
  fVar204 = auVar113._8_4_;
  fVar244 = auVar113._12_4_;
  fVar269 = auVar211._0_4_;
  fVar376 = auVar211._4_4_;
  fVar245 = auVar211._8_4_;
  fVar270 = auVar211._12_4_;
  auVar213._0_4_ = auVar329._0_4_ * fVar220 + fVar269 * auVar400._0_4_;
  auVar213._4_4_ = auVar329._4_4_ * fVar250 + fVar376 * auVar400._4_4_;
  auVar213._8_4_ = auVar329._8_4_ * fVar204 + fVar245 * auVar400._8_4_;
  auVar213._12_4_ = auVar329._12_4_ * fVar244 + fVar270 * auVar400._12_4_;
  auVar180._0_4_ = auVar320._0_4_ * fVar220 + auVar382._0_4_ * fVar269;
  auVar180._4_4_ = auVar320._4_4_ * fVar250 + auVar382._4_4_ * fVar376;
  auVar180._8_4_ = auVar320._0_4_ * fVar204 + auVar382._8_4_ * fVar245;
  auVar180._12_4_ = auVar320._4_4_ * fVar244 + auVar382._12_4_ * fVar270;
  auVar293._0_4_ = auVar341._0_4_ * fVar220 + fVar269 * auVar300._0_4_;
  auVar293._4_4_ = auVar341._4_4_ * fVar250 + fVar376 * auVar300._4_4_;
  auVar293._8_4_ = auVar341._8_4_ * fVar204 + fVar245 * auVar300._8_4_;
  auVar293._12_4_ = auVar341._12_4_ * fVar244 + fVar270 * auVar300._12_4_;
  auVar230._0_4_ = auVar356._0_4_ * fVar220 + auVar319._0_4_ * fVar269;
  auVar230._4_4_ = auVar356._4_4_ * fVar250 + auVar319._4_4_ * fVar376;
  auVar230._8_4_ = auVar356._8_4_ * fVar204 + auVar319._8_4_ * fVar245;
  auVar230._12_4_ = auVar356._12_4_ * fVar244 + auVar319._12_4_ * fVar270;
  auVar113 = vmovshdup_avx(local_238);
  auVar211 = vshufps_avx(local_238,local_238,0);
  auVar327._16_16_ = auVar211;
  auVar327._0_16_ = auVar211;
  auVar197 = vshufps_avx(local_238,local_238,0x55);
  auVar128._16_16_ = auVar197;
  auVar128._0_16_ = auVar197;
  auVar125 = vsubps_avx(auVar128,auVar327);
  auVar197 = vshufps_avx(auVar213,auVar213,0);
  auVar157 = vshufps_avx(auVar213,auVar213,0x55);
  auVar145 = vshufps_avx(auVar180,auVar180,0);
  auVar183 = vshufps_avx(auVar180,auVar180,0x55);
  auVar146 = vshufps_avx(auVar293,auVar293,0);
  auVar286 = vshufps_avx(auVar293,auVar293,0x55);
  auVar35 = vshufps_avx(auVar230,auVar230,0);
  auVar36 = vshufps_avx(auVar230,auVar230,0x55);
  auVar113 = ZEXT416((uint)((auVar113._0_4_ - auVar401._0_4_) * 0.04761905));
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar340._0_4_ = auVar211._0_4_ + auVar125._0_4_ * 0.0;
  auVar340._4_4_ = auVar211._4_4_ + auVar125._4_4_ * 0.14285715;
  auVar340._8_4_ = auVar211._8_4_ + auVar125._8_4_ * 0.2857143;
  auVar340._12_4_ = auVar211._12_4_ + auVar125._12_4_ * 0.42857146;
  auVar340._16_4_ = auVar211._0_4_ + auVar125._16_4_ * 0.5714286;
  auVar340._20_4_ = auVar211._4_4_ + auVar125._20_4_ * 0.71428573;
  auVar340._24_4_ = auVar211._8_4_ + auVar125._24_4_ * 0.8571429;
  auVar340._28_4_ = auVar211._12_4_ + auVar125._28_4_;
  auVar28 = vsubps_avx(auVar394,auVar340);
  fVar220 = auVar145._0_4_;
  fVar204 = auVar145._4_4_;
  fVar269 = auVar145._8_4_;
  fVar245 = auVar145._12_4_;
  fVar361 = auVar28._0_4_;
  fVar363 = auVar28._4_4_;
  fVar372 = auVar28._8_4_;
  fVar373 = auVar28._12_4_;
  fVar374 = auVar28._16_4_;
  fVar375 = auVar28._20_4_;
  fVar383 = auVar28._24_4_;
  fVar283 = auVar183._0_4_;
  fVar285 = auVar183._4_4_;
  fVar288 = auVar183._8_4_;
  fVar357 = auVar183._12_4_;
  fVar360 = auVar157._12_4_ + 1.0;
  fVar248 = auVar146._0_4_;
  fVar273 = auVar146._4_4_;
  fVar274 = auVar146._8_4_;
  fVar282 = auVar146._12_4_;
  fVar95 = fVar248 * auVar340._0_4_ + fVar361 * fVar220;
  fVar246 = fVar273 * auVar340._4_4_ + fVar363 * fVar204;
  fVar271 = fVar274 * auVar340._8_4_ + fVar372 * fVar269;
  fVar219 = fVar282 * auVar340._12_4_ + fVar373 * fVar245;
  fVar249 = fVar248 * auVar340._16_4_ + fVar374 * fVar220;
  fVar395 = fVar273 * auVar340._20_4_ + fVar375 * fVar204;
  fVar247 = fVar274 * auVar340._24_4_ + fVar383 * fVar269;
  fVar250 = auVar286._0_4_;
  fVar244 = auVar286._4_4_;
  fVar376 = auVar286._8_4_;
  fVar270 = auVar286._12_4_;
  fVar284 = fVar283 * fVar361 + auVar340._0_4_ * fVar250;
  fVar287 = fVar285 * fVar363 + auVar340._4_4_ * fVar244;
  fVar342 = fVar288 * fVar372 + auVar340._8_4_ * fVar376;
  fVar359 = fVar357 * fVar373 + auVar340._12_4_ * fVar270;
  fVar384 = fVar283 * fVar374 + auVar340._16_4_ * fVar250;
  fVar385 = fVar285 * fVar375 + auVar340._20_4_ * fVar244;
  fVar343 = fVar288 * fVar383 + auVar340._24_4_ * fVar376;
  fVar358 = fVar357 + fVar245;
  auVar211 = vshufps_avx(auVar213,auVar213,0xaa);
  auVar145 = vshufps_avx(auVar213,auVar213,0xff);
  fVar272 = fVar282 + 0.0;
  auVar183 = vshufps_avx(auVar180,auVar180,0xaa);
  auVar146 = vshufps_avx(auVar180,auVar180,0xff);
  auVar242._0_4_ =
       fVar361 * (auVar340._0_4_ * fVar220 + fVar361 * auVar197._0_4_) + auVar340._0_4_ * fVar95;
  auVar242._4_4_ =
       fVar363 * (auVar340._4_4_ * fVar204 + fVar363 * auVar197._4_4_) + auVar340._4_4_ * fVar246;
  auVar242._8_4_ =
       fVar372 * (auVar340._8_4_ * fVar269 + fVar372 * auVar197._8_4_) + auVar340._8_4_ * fVar271;
  auVar242._12_4_ =
       fVar373 * (auVar340._12_4_ * fVar245 + fVar373 * auVar197._12_4_) + auVar340._12_4_ * fVar219
  ;
  auVar242._16_4_ =
       fVar374 * (auVar340._16_4_ * fVar220 + fVar374 * auVar197._0_4_) + auVar340._16_4_ * fVar249;
  auVar242._20_4_ =
       fVar375 * (auVar340._20_4_ * fVar204 + fVar375 * auVar197._4_4_) + auVar340._20_4_ * fVar395;
  auVar242._24_4_ =
       fVar383 * (auVar340._24_4_ * fVar269 + fVar383 * auVar197._8_4_) + auVar340._24_4_ * fVar247;
  auVar242._28_4_ = auVar197._12_4_ + 1.0 + fVar270;
  auVar267._0_4_ =
       fVar361 * (fVar283 * auVar340._0_4_ + auVar157._0_4_ * fVar361) + auVar340._0_4_ * fVar284;
  auVar267._4_4_ =
       fVar363 * (fVar285 * auVar340._4_4_ + auVar157._4_4_ * fVar363) + auVar340._4_4_ * fVar287;
  auVar267._8_4_ =
       fVar372 * (fVar288 * auVar340._8_4_ + auVar157._8_4_ * fVar372) + auVar340._8_4_ * fVar342;
  auVar267._12_4_ =
       fVar373 * (fVar357 * auVar340._12_4_ + auVar157._12_4_ * fVar373) + auVar340._12_4_ * fVar359
  ;
  auVar267._16_4_ =
       fVar374 * (fVar283 * auVar340._16_4_ + auVar157._0_4_ * fVar374) + auVar340._16_4_ * fVar384;
  auVar267._20_4_ =
       fVar375 * (fVar285 * auVar340._20_4_ + auVar157._4_4_ * fVar375) + auVar340._20_4_ * fVar385;
  auVar267._24_4_ =
       fVar383 * (fVar288 * auVar340._24_4_ + auVar157._8_4_ * fVar383) + auVar340._24_4_ * fVar343;
  auVar267._28_4_ = auVar36._12_4_ + fVar270;
  auVar129._0_4_ =
       fVar361 * fVar95 + auVar340._0_4_ * (fVar248 * fVar361 + auVar35._0_4_ * auVar340._0_4_);
  auVar129._4_4_ =
       fVar363 * fVar246 + auVar340._4_4_ * (fVar273 * fVar363 + auVar35._4_4_ * auVar340._4_4_);
  auVar129._8_4_ =
       fVar372 * fVar271 + auVar340._8_4_ * (fVar274 * fVar372 + auVar35._8_4_ * auVar340._8_4_);
  auVar129._12_4_ =
       fVar373 * fVar219 + auVar340._12_4_ * (fVar282 * fVar373 + auVar35._12_4_ * auVar340._12_4_);
  auVar129._16_4_ =
       fVar374 * fVar249 + auVar340._16_4_ * (fVar248 * fVar374 + auVar35._0_4_ * auVar340._16_4_);
  auVar129._20_4_ =
       fVar375 * fVar395 + auVar340._20_4_ * (fVar273 * fVar375 + auVar35._4_4_ * auVar340._20_4_);
  auVar129._24_4_ =
       fVar383 * fVar247 + auVar340._24_4_ * (fVar274 * fVar383 + auVar35._8_4_ * auVar340._24_4_);
  auVar129._28_4_ = fVar245 + 1.0 + fVar272;
  auVar355._0_4_ =
       fVar361 * fVar284 + auVar340._0_4_ * (auVar36._0_4_ * auVar340._0_4_ + fVar361 * fVar250);
  auVar355._4_4_ =
       fVar363 * fVar287 + auVar340._4_4_ * (auVar36._4_4_ * auVar340._4_4_ + fVar363 * fVar244);
  auVar355._8_4_ =
       fVar372 * fVar342 + auVar340._8_4_ * (auVar36._8_4_ * auVar340._8_4_ + fVar372 * fVar376);
  auVar355._12_4_ =
       fVar373 * fVar359 + auVar340._12_4_ * (auVar36._12_4_ * auVar340._12_4_ + fVar373 * fVar270);
  auVar355._16_4_ =
       fVar374 * fVar384 + auVar340._16_4_ * (auVar36._0_4_ * auVar340._16_4_ + fVar374 * fVar250);
  auVar355._20_4_ =
       fVar375 * fVar385 + auVar340._20_4_ * (auVar36._4_4_ * auVar340._20_4_ + fVar375 * fVar244);
  auVar355._24_4_ =
       fVar383 * fVar343 + auVar340._24_4_ * (auVar36._8_4_ * auVar340._24_4_ + fVar383 * fVar376);
  auVar355._28_4_ = fVar272 + fVar270 + 0.0;
  local_d8._0_4_ = fVar361 * auVar242._0_4_ + auVar340._0_4_ * auVar129._0_4_;
  local_d8._4_4_ = fVar363 * auVar242._4_4_ + auVar340._4_4_ * auVar129._4_4_;
  local_d8._8_4_ = fVar372 * auVar242._8_4_ + auVar340._8_4_ * auVar129._8_4_;
  local_d8._12_4_ = fVar373 * auVar242._12_4_ + auVar340._12_4_ * auVar129._12_4_;
  local_d8._16_4_ = fVar374 * auVar242._16_4_ + auVar340._16_4_ * auVar129._16_4_;
  local_d8._20_4_ = fVar375 * auVar242._20_4_ + auVar340._20_4_ * auVar129._20_4_;
  local_d8._24_4_ = fVar383 * auVar242._24_4_ + auVar340._24_4_ * auVar129._24_4_;
  local_d8._28_4_ = fVar358 + fVar270 + 0.0;
  auVar218._0_4_ = fVar361 * auVar267._0_4_ + auVar340._0_4_ * auVar355._0_4_;
  auVar218._4_4_ = fVar363 * auVar267._4_4_ + auVar340._4_4_ * auVar355._4_4_;
  auVar218._8_4_ = fVar372 * auVar267._8_4_ + auVar340._8_4_ * auVar355._8_4_;
  auVar218._12_4_ = fVar373 * auVar267._12_4_ + auVar340._12_4_ * auVar355._12_4_;
  auVar218._16_4_ = fVar374 * auVar267._16_4_ + auVar340._16_4_ * auVar355._16_4_;
  auVar218._20_4_ = fVar375 * auVar267._20_4_ + auVar340._20_4_ * auVar355._20_4_;
  auVar218._24_4_ = fVar383 * auVar267._24_4_ + auVar340._24_4_ * auVar355._24_4_;
  auVar218._28_4_ = fVar358 + fVar272;
  auVar29 = vsubps_avx(auVar129,auVar242);
  auVar125 = vsubps_avx(auVar355,auVar267);
  local_408._0_4_ = auVar113._0_4_;
  local_408._4_4_ = auVar113._4_4_;
  fStack_400 = auVar113._8_4_;
  fStack_3fc = auVar113._12_4_;
  local_118 = (float)local_408._0_4_ * auVar29._0_4_ * 3.0;
  fStack_114 = (float)local_408._4_4_ * auVar29._4_4_ * 3.0;
  auVar43._4_4_ = fStack_114;
  auVar43._0_4_ = local_118;
  fStack_110 = fStack_400 * auVar29._8_4_ * 3.0;
  auVar43._8_4_ = fStack_110;
  fStack_10c = fStack_3fc * auVar29._12_4_ * 3.0;
  auVar43._12_4_ = fStack_10c;
  fStack_108 = (float)local_408._0_4_ * auVar29._16_4_ * 3.0;
  auVar43._16_4_ = fStack_108;
  fStack_104 = (float)local_408._4_4_ * auVar29._20_4_ * 3.0;
  auVar43._20_4_ = fStack_104;
  fStack_100 = fStack_400 * auVar29._24_4_ * 3.0;
  auVar43._24_4_ = fStack_100;
  auVar43._28_4_ = auVar29._28_4_;
  local_138 = (float)local_408._0_4_ * auVar125._0_4_ * 3.0;
  fStack_134 = (float)local_408._4_4_ * auVar125._4_4_ * 3.0;
  auVar44._4_4_ = fStack_134;
  auVar44._0_4_ = local_138;
  fStack_130 = fStack_400 * auVar125._8_4_ * 3.0;
  auVar44._8_4_ = fStack_130;
  fStack_12c = fStack_3fc * auVar125._12_4_ * 3.0;
  auVar44._12_4_ = fStack_12c;
  fStack_128 = (float)local_408._0_4_ * auVar125._16_4_ * 3.0;
  auVar44._16_4_ = fStack_128;
  fStack_124 = (float)local_408._4_4_ * auVar125._20_4_ * 3.0;
  auVar44._20_4_ = fStack_124;
  fStack_120 = fStack_400 * auVar125._24_4_ * 3.0;
  auVar44._24_4_ = fStack_120;
  auVar44._28_4_ = fVar358;
  auVar27 = vsubps_avx(local_d8,auVar43);
  auVar125 = vperm2f128_avx(auVar27,auVar27,1);
  auVar125 = vshufps_avx(auVar125,auVar27,0x30);
  auVar125 = vshufps_avx(auVar27,auVar125,0x29);
  auVar30 = vsubps_avx(auVar218,auVar44);
  auVar27 = vperm2f128_avx(auVar30,auVar30,1);
  auVar27 = vshufps_avx(auVar27,auVar30,0x30);
  _local_448 = vshufps_avx(auVar30,auVar27,0x29);
  fVar385 = auVar183._0_4_;
  fVar343 = auVar183._4_4_;
  fVar362 = auVar183._8_4_;
  fVar245 = auVar211._12_4_;
  fVar273 = auVar146._0_4_;
  fVar282 = auVar146._4_4_;
  fVar284 = auVar146._8_4_;
  fVar287 = auVar146._12_4_;
  auVar113 = vshufps_avx(auVar293,auVar293,0xaa);
  fVar220 = auVar113._0_4_;
  fVar204 = auVar113._4_4_;
  fVar269 = auVar113._8_4_;
  fVar270 = auVar113._12_4_;
  fVar271 = auVar340._0_4_ * fVar220 + fVar385 * fVar361;
  fVar219 = auVar340._4_4_ * fVar204 + fVar343 * fVar363;
  fVar249 = auVar340._8_4_ * fVar269 + fVar362 * fVar372;
  fVar395 = auVar340._12_4_ * fVar270 + auVar183._12_4_ * fVar373;
  fVar247 = auVar340._16_4_ * fVar220 + fVar385 * fVar374;
  fVar272 = auVar340._20_4_ * fVar204 + fVar343 * fVar375;
  fVar248 = auVar340._24_4_ * fVar269 + fVar362 * fVar383;
  auVar113 = vshufps_avx(auVar293,auVar293,0xff);
  fVar250 = auVar113._0_4_;
  fVar244 = auVar113._4_4_;
  fVar376 = auVar113._8_4_;
  fVar95 = auVar113._12_4_;
  fVar274 = auVar340._0_4_ * fVar250 + fVar273 * fVar361;
  fVar283 = auVar340._4_4_ * fVar244 + fVar282 * fVar363;
  fVar285 = auVar340._8_4_ * fVar376 + fVar284 * fVar372;
  fVar288 = auVar340._12_4_ * fVar95 + fVar287 * fVar373;
  fVar342 = auVar340._16_4_ * fVar250 + fVar273 * fVar374;
  fVar357 = auVar340._20_4_ * fVar244 + fVar282 * fVar375;
  fVar359 = auVar340._24_4_ * fVar376 + fVar284 * fVar383;
  auVar113 = vshufps_avx(auVar230,auVar230,0xaa);
  fVar384 = auVar113._12_4_ + fVar270;
  auVar197 = vshufps_avx(auVar230,auVar230,0xff);
  fVar246 = auVar197._12_4_;
  auVar130._0_4_ =
       fVar361 * (fVar385 * auVar340._0_4_ + fVar361 * auVar211._0_4_) + auVar340._0_4_ * fVar271;
  auVar130._4_4_ =
       fVar363 * (fVar343 * auVar340._4_4_ + fVar363 * auVar211._4_4_) + auVar340._4_4_ * fVar219;
  auVar130._8_4_ =
       fVar372 * (fVar362 * auVar340._8_4_ + fVar372 * auVar211._8_4_) + auVar340._8_4_ * fVar249;
  auVar130._12_4_ =
       fVar373 * (auVar183._12_4_ * auVar340._12_4_ + fVar373 * fVar245) + auVar340._12_4_ * fVar395
  ;
  auVar130._16_4_ =
       fVar374 * (fVar385 * auVar340._16_4_ + fVar374 * auVar211._0_4_) + auVar340._16_4_ * fVar247;
  auVar130._20_4_ =
       fVar375 * (fVar343 * auVar340._20_4_ + fVar375 * auVar211._4_4_) + auVar340._20_4_ * fVar272;
  auVar130._24_4_ =
       fVar383 * (fVar362 * auVar340._24_4_ + fVar383 * auVar211._8_4_) + auVar340._24_4_ * fVar248;
  auVar130._28_4_ = local_448._28_4_ + fVar245 + fVar246;
  auVar166._0_4_ =
       fVar361 * (fVar273 * auVar340._0_4_ + auVar145._0_4_ * fVar361) + auVar340._0_4_ * fVar274;
  auVar166._4_4_ =
       fVar363 * (fVar282 * auVar340._4_4_ + auVar145._4_4_ * fVar363) + auVar340._4_4_ * fVar283;
  auVar166._8_4_ =
       fVar372 * (fVar284 * auVar340._8_4_ + auVar145._8_4_ * fVar372) + auVar340._8_4_ * fVar285;
  auVar166._12_4_ =
       fVar373 * (fVar287 * auVar340._12_4_ + auVar145._12_4_ * fVar373) + auVar340._12_4_ * fVar288
  ;
  auVar166._16_4_ =
       fVar374 * (fVar273 * auVar340._16_4_ + auVar145._0_4_ * fVar374) + auVar340._16_4_ * fVar342;
  auVar166._20_4_ =
       fVar375 * (fVar282 * auVar340._20_4_ + auVar145._4_4_ * fVar375) + auVar340._20_4_ * fVar357;
  auVar166._24_4_ =
       fVar383 * (fVar284 * auVar340._24_4_ + auVar145._8_4_ * fVar383) + auVar340._24_4_ * fVar359;
  auVar166._28_4_ = fVar245 + auVar27._28_4_ + fVar246;
  auVar27 = vperm2f128_avx(local_d8,local_d8,1);
  auVar27 = vshufps_avx(auVar27,local_d8,0x30);
  _local_318 = vshufps_avx(local_d8,auVar27,0x29);
  auVar268._0_4_ =
       auVar340._0_4_ * (auVar113._0_4_ * auVar340._0_4_ + fVar361 * fVar220) + fVar361 * fVar271;
  auVar268._4_4_ =
       auVar340._4_4_ * (auVar113._4_4_ * auVar340._4_4_ + fVar363 * fVar204) + fVar363 * fVar219;
  auVar268._8_4_ =
       auVar340._8_4_ * (auVar113._8_4_ * auVar340._8_4_ + fVar372 * fVar269) + fVar372 * fVar249;
  auVar268._12_4_ =
       auVar340._12_4_ * (auVar113._12_4_ * auVar340._12_4_ + fVar373 * fVar270) + fVar373 * fVar395
  ;
  auVar268._16_4_ =
       auVar340._16_4_ * (auVar113._0_4_ * auVar340._16_4_ + fVar374 * fVar220) + fVar374 * fVar247;
  auVar268._20_4_ =
       auVar340._20_4_ * (auVar113._4_4_ * auVar340._20_4_ + fVar375 * fVar204) + fVar375 * fVar272;
  auVar268._24_4_ =
       auVar340._24_4_ * (auVar113._8_4_ * auVar340._24_4_ + fVar383 * fVar269) + fVar383 * fVar248;
  auVar268._28_4_ = fVar384 + fVar360 + auVar267._28_4_;
  auVar318._0_4_ =
       fVar361 * fVar274 + auVar340._0_4_ * (auVar340._0_4_ * auVar197._0_4_ + fVar361 * fVar250);
  auVar318._4_4_ =
       fVar363 * fVar283 + auVar340._4_4_ * (auVar340._4_4_ * auVar197._4_4_ + fVar363 * fVar244);
  auVar318._8_4_ =
       fVar372 * fVar285 + auVar340._8_4_ * (auVar340._8_4_ * auVar197._8_4_ + fVar372 * fVar376);
  auVar318._12_4_ =
       fVar373 * fVar288 + auVar340._12_4_ * (auVar340._12_4_ * fVar246 + fVar373 * fVar95);
  auVar318._16_4_ =
       fVar374 * fVar342 + auVar340._16_4_ * (auVar340._16_4_ * auVar197._0_4_ + fVar374 * fVar250);
  auVar318._20_4_ =
       fVar375 * fVar357 + auVar340._20_4_ * (auVar340._20_4_ * auVar197._4_4_ + fVar375 * fVar244);
  auVar318._24_4_ =
       fVar383 * fVar359 + auVar340._24_4_ * (auVar340._24_4_ * auVar197._8_4_ + fVar383 * fVar376);
  auVar318._28_4_ = fVar360 + fVar287 + fVar246 + fVar95;
  auVar299._0_4_ = fVar361 * auVar130._0_4_ + auVar340._0_4_ * auVar268._0_4_;
  auVar299._4_4_ = fVar363 * auVar130._4_4_ + auVar340._4_4_ * auVar268._4_4_;
  auVar299._8_4_ = fVar372 * auVar130._8_4_ + auVar340._8_4_ * auVar268._8_4_;
  auVar299._12_4_ = fVar373 * auVar130._12_4_ + auVar340._12_4_ * auVar268._12_4_;
  auVar299._16_4_ = fVar374 * auVar130._16_4_ + auVar340._16_4_ * auVar268._16_4_;
  auVar299._20_4_ = fVar375 * auVar130._20_4_ + auVar340._20_4_ * auVar268._20_4_;
  auVar299._24_4_ = fVar383 * auVar130._24_4_ + auVar340._24_4_ * auVar268._24_4_;
  auVar299._28_4_ = fVar384 + fVar246 + fVar95;
  auVar328._0_4_ = fVar361 * auVar166._0_4_ + auVar340._0_4_ * auVar318._0_4_;
  auVar328._4_4_ = fVar363 * auVar166._4_4_ + auVar340._4_4_ * auVar318._4_4_;
  auVar328._8_4_ = fVar372 * auVar166._8_4_ + auVar340._8_4_ * auVar318._8_4_;
  auVar328._12_4_ = fVar373 * auVar166._12_4_ + auVar340._12_4_ * auVar318._12_4_;
  auVar328._16_4_ = fVar374 * auVar166._16_4_ + auVar340._16_4_ * auVar318._16_4_;
  auVar328._20_4_ = fVar375 * auVar166._20_4_ + auVar340._20_4_ * auVar318._20_4_;
  auVar328._24_4_ = fVar383 * auVar166._24_4_ + auVar340._24_4_ * auVar318._24_4_;
  auVar328._28_4_ = auVar28._28_4_ + auVar340._28_4_;
  auVar28 = vsubps_avx(auVar268,auVar130);
  auVar27 = vsubps_avx(auVar318,auVar166);
  local_158 = (float)local_408._0_4_ * auVar28._0_4_ * 3.0;
  fStack_154 = (float)local_408._4_4_ * auVar28._4_4_ * 3.0;
  auVar45._4_4_ = fStack_154;
  auVar45._0_4_ = local_158;
  fStack_150 = fStack_400 * auVar28._8_4_ * 3.0;
  auVar45._8_4_ = fStack_150;
  fStack_14c = fStack_3fc * auVar28._12_4_ * 3.0;
  auVar45._12_4_ = fStack_14c;
  fStack_148 = (float)local_408._0_4_ * auVar28._16_4_ * 3.0;
  auVar45._16_4_ = fStack_148;
  fStack_144 = (float)local_408._4_4_ * auVar28._20_4_ * 3.0;
  auVar45._20_4_ = fStack_144;
  fStack_140 = fStack_400 * auVar28._24_4_ * 3.0;
  auVar45._24_4_ = fStack_140;
  auVar45._28_4_ = auVar28._28_4_;
  local_178 = (float)local_408._0_4_ * auVar27._0_4_ * 3.0;
  fStack_174 = (float)local_408._4_4_ * auVar27._4_4_ * 3.0;
  auVar46._4_4_ = fStack_174;
  auVar46._0_4_ = local_178;
  fStack_170 = fStack_400 * auVar27._8_4_ * 3.0;
  auVar46._8_4_ = fStack_170;
  fStack_16c = fStack_3fc * auVar27._12_4_ * 3.0;
  auVar46._12_4_ = fStack_16c;
  fStack_168 = (float)local_408._0_4_ * auVar27._16_4_ * 3.0;
  auVar46._16_4_ = fStack_168;
  fStack_164 = (float)local_408._4_4_ * auVar27._20_4_ * 3.0;
  auVar46._20_4_ = fStack_164;
  fStack_160 = fStack_400 * auVar27._24_4_ * 3.0;
  auVar46._24_4_ = fStack_160;
  auVar46._28_4_ = auVar268._28_4_;
  auVar27 = vperm2f128_avx(auVar299,auVar299,1);
  auVar27 = vshufps_avx(auVar27,auVar299,0x30);
  auVar31 = vshufps_avx(auVar299,auVar27,0x29);
  auVar30 = vsubps_avx(auVar299,auVar45);
  auVar27 = vperm2f128_avx(auVar30,auVar30,1);
  auVar27 = vshufps_avx(auVar27,auVar30,0x30);
  _local_408 = vshufps_avx(auVar30,auVar27,0x29);
  auVar30 = vsubps_avx(auVar328,auVar46);
  auVar27 = vperm2f128_avx(auVar30,auVar30,1);
  auVar27 = vshufps_avx(auVar27,auVar30,0x30);
  local_b8 = vshufps_avx(auVar30,auVar27,0x29);
  auVar30 = vsubps_avx(auVar299,local_d8);
  auVar32 = vsubps_avx(auVar31,_local_318);
  fVar220 = auVar32._0_4_ + auVar30._0_4_;
  fVar250 = auVar32._4_4_ + auVar30._4_4_;
  fVar204 = auVar32._8_4_ + auVar30._8_4_;
  fVar244 = auVar32._12_4_ + auVar30._12_4_;
  fVar269 = auVar32._16_4_ + auVar30._16_4_;
  fVar376 = auVar32._20_4_ + auVar30._20_4_;
  fVar245 = auVar32._24_4_ + auVar30._24_4_;
  auVar27 = vperm2f128_avx(auVar218,auVar218,1);
  auVar27 = vshufps_avx(auVar27,auVar218,0x30);
  local_f8 = vshufps_avx(auVar218,auVar27,0x29);
  auVar27 = vperm2f128_avx(auVar328,auVar328,1);
  auVar27 = vshufps_avx(auVar27,auVar328,0x30);
  _local_4a8 = vshufps_avx(auVar328,auVar27,0x29);
  auVar27 = vsubps_avx(auVar328,auVar218);
  auVar33 = vsubps_avx(_local_4a8,local_f8);
  fVar270 = auVar33._0_4_ + auVar27._0_4_;
  fVar95 = auVar33._4_4_ + auVar27._4_4_;
  fVar246 = auVar33._8_4_ + auVar27._8_4_;
  fVar271 = auVar33._12_4_ + auVar27._12_4_;
  fVar219 = auVar33._16_4_ + auVar27._16_4_;
  fVar249 = auVar33._20_4_ + auVar27._20_4_;
  fVar395 = auVar33._24_4_ + auVar27._24_4_;
  auVar47._4_4_ = fVar250 * auVar218._4_4_;
  auVar47._0_4_ = fVar220 * auVar218._0_4_;
  auVar47._8_4_ = fVar204 * auVar218._8_4_;
  auVar47._12_4_ = fVar244 * auVar218._12_4_;
  auVar47._16_4_ = fVar269 * auVar218._16_4_;
  auVar47._20_4_ = fVar376 * auVar218._20_4_;
  auVar47._24_4_ = fVar245 * auVar218._24_4_;
  auVar47._28_4_ = auVar27._28_4_;
  auVar48._4_4_ = fVar95 * local_d8._4_4_;
  auVar48._0_4_ = fVar270 * local_d8._0_4_;
  auVar48._8_4_ = fVar246 * local_d8._8_4_;
  auVar48._12_4_ = fVar271 * local_d8._12_4_;
  auVar48._16_4_ = fVar219 * local_d8._16_4_;
  auVar48._20_4_ = fVar249 * local_d8._20_4_;
  auVar48._24_4_ = fVar395 * local_d8._24_4_;
  auVar48._28_4_ = fVar384;
  auVar34 = vsubps_avx(auVar47,auVar48);
  local_118 = local_d8._0_4_ + local_118;
  fStack_114 = local_d8._4_4_ + fStack_114;
  fStack_110 = local_d8._8_4_ + fStack_110;
  fStack_10c = local_d8._12_4_ + fStack_10c;
  fStack_108 = local_d8._16_4_ + fStack_108;
  fStack_104 = local_d8._20_4_ + fStack_104;
  fStack_100 = local_d8._24_4_ + fStack_100;
  fStack_fc = local_d8._28_4_ + auVar29._28_4_;
  local_138 = local_138 + auVar218._0_4_;
  fStack_134 = fStack_134 + auVar218._4_4_;
  fStack_130 = fStack_130 + auVar218._8_4_;
  fStack_12c = fStack_12c + auVar218._12_4_;
  fStack_128 = fStack_128 + auVar218._16_4_;
  fStack_124 = fStack_124 + auVar218._20_4_;
  fStack_120 = fStack_120 + auVar218._24_4_;
  fStack_11c = fVar358 + auVar218._28_4_;
  auVar49._4_4_ = fVar250 * fStack_134;
  auVar49._0_4_ = fVar220 * local_138;
  auVar49._8_4_ = fVar204 * fStack_130;
  auVar49._12_4_ = fVar244 * fStack_12c;
  auVar49._16_4_ = fVar269 * fStack_128;
  auVar49._20_4_ = fVar376 * fStack_124;
  auVar49._24_4_ = fVar245 * fStack_120;
  auVar49._28_4_ = fVar358;
  auVar50._4_4_ = fVar95 * fStack_114;
  auVar50._0_4_ = fVar270 * local_118;
  auVar50._8_4_ = fVar246 * fStack_110;
  auVar50._12_4_ = fVar271 * fStack_10c;
  auVar50._16_4_ = fVar219 * fStack_108;
  auVar50._20_4_ = fVar249 * fStack_104;
  auVar50._24_4_ = fVar395 * fStack_100;
  auVar50._28_4_ = fVar358 + auVar218._28_4_;
  auVar29 = vsubps_avx(auVar49,auVar50);
  auVar51._4_4_ = fVar250 * (float)local_448._4_4_;
  auVar51._0_4_ = fVar220 * (float)local_448._0_4_;
  auVar51._8_4_ = fVar204 * fStack_440;
  auVar51._12_4_ = fVar244 * fStack_43c;
  auVar51._16_4_ = fVar269 * fStack_438;
  auVar51._20_4_ = fVar376 * fStack_434;
  auVar51._24_4_ = fVar245 * fStack_430;
  auVar51._28_4_ = fVar358;
  local_4e8._0_4_ = auVar125._0_4_;
  local_4e8._4_4_ = auVar125._4_4_;
  fStack_4e0 = auVar125._8_4_;
  fStack_4dc = auVar125._12_4_;
  fStack_4d8 = auVar125._16_4_;
  fStack_4d4 = auVar125._20_4_;
  fStack_4d0 = auVar125._24_4_;
  auVar52._4_4_ = fVar95 * (float)local_4e8._4_4_;
  auVar52._0_4_ = fVar270 * (float)local_4e8._0_4_;
  auVar52._8_4_ = fVar246 * fStack_4e0;
  auVar52._12_4_ = fVar271 * fStack_4dc;
  auVar52._16_4_ = fVar219 * fStack_4d8;
  auVar52._20_4_ = fVar249 * fStack_4d4;
  auVar52._24_4_ = fVar395 * fStack_4d0;
  auVar52._28_4_ = local_d8._28_4_;
  auVar41 = vsubps_avx(auVar51,auVar52);
  auVar53._4_4_ = local_f8._4_4_ * fVar250;
  auVar53._0_4_ = local_f8._0_4_ * fVar220;
  auVar53._8_4_ = local_f8._8_4_ * fVar204;
  auVar53._12_4_ = local_f8._12_4_ * fVar244;
  auVar53._16_4_ = local_f8._16_4_ * fVar269;
  auVar53._20_4_ = local_f8._20_4_ * fVar376;
  auVar53._24_4_ = local_f8._24_4_ * fVar245;
  auVar53._28_4_ = fVar358;
  auVar54._4_4_ = local_318._4_4_ * fVar95;
  auVar54._0_4_ = local_318._0_4_ * fVar270;
  auVar54._8_4_ = local_318._8_4_ * fVar246;
  auVar54._12_4_ = local_318._12_4_ * fVar271;
  auVar54._16_4_ = local_318._16_4_ * fVar219;
  auVar54._20_4_ = local_318._20_4_ * fVar249;
  auVar54._24_4_ = local_318._24_4_ * fVar395;
  auVar54._28_4_ = local_f8._28_4_;
  auVar42 = vsubps_avx(auVar53,auVar54);
  auVar55._4_4_ = auVar328._4_4_ * fVar250;
  auVar55._0_4_ = auVar328._0_4_ * fVar220;
  auVar55._8_4_ = auVar328._8_4_ * fVar204;
  auVar55._12_4_ = auVar328._12_4_ * fVar244;
  auVar55._16_4_ = auVar328._16_4_ * fVar269;
  auVar55._20_4_ = auVar328._20_4_ * fVar376;
  auVar55._24_4_ = auVar328._24_4_ * fVar245;
  auVar55._28_4_ = fVar358;
  auVar56._4_4_ = fVar95 * auVar299._4_4_;
  auVar56._0_4_ = fVar270 * auVar299._0_4_;
  auVar56._8_4_ = fVar246 * auVar299._8_4_;
  auVar56._12_4_ = fVar271 * auVar299._12_4_;
  auVar56._16_4_ = fVar219 * auVar299._16_4_;
  auVar56._20_4_ = fVar249 * auVar299._20_4_;
  auVar56._24_4_ = fVar395 * auVar299._24_4_;
  auVar56._28_4_ = fStack_fc;
  auVar124 = vsubps_avx(auVar55,auVar56);
  local_158 = auVar299._0_4_ + local_158;
  fStack_154 = auVar299._4_4_ + fStack_154;
  fStack_150 = auVar299._8_4_ + fStack_150;
  fStack_14c = auVar299._12_4_ + fStack_14c;
  fStack_148 = auVar299._16_4_ + fStack_148;
  fStack_144 = auVar299._20_4_ + fStack_144;
  fStack_140 = auVar299._24_4_ + fStack_140;
  fStack_13c = auVar299._28_4_ + auVar28._28_4_;
  local_178 = auVar328._0_4_ + local_178;
  fStack_174 = auVar328._4_4_ + fStack_174;
  fStack_170 = auVar328._8_4_ + fStack_170;
  fStack_16c = auVar328._12_4_ + fStack_16c;
  fStack_168 = auVar328._16_4_ + fStack_168;
  fStack_164 = auVar328._20_4_ + fStack_164;
  fStack_160 = auVar328._24_4_ + fStack_160;
  fStack_15c = auVar328._28_4_ + auVar268._28_4_;
  auVar57._4_4_ = fVar250 * fStack_174;
  auVar57._0_4_ = fVar220 * local_178;
  auVar57._8_4_ = fVar204 * fStack_170;
  auVar57._12_4_ = fVar244 * fStack_16c;
  auVar57._16_4_ = fVar269 * fStack_168;
  auVar57._20_4_ = fVar376 * fStack_164;
  auVar57._24_4_ = fVar245 * fStack_160;
  auVar57._28_4_ = auVar328._28_4_ + auVar268._28_4_;
  auVar58._4_4_ = fStack_154 * fVar95;
  auVar58._0_4_ = local_158 * fVar270;
  auVar58._8_4_ = fStack_150 * fVar246;
  auVar58._12_4_ = fStack_14c * fVar271;
  auVar58._16_4_ = fStack_148 * fVar219;
  auVar58._20_4_ = fStack_144 * fVar249;
  auVar58._24_4_ = fStack_140 * fVar395;
  auVar58._28_4_ = fStack_13c;
  auVar126 = vsubps_avx(auVar57,auVar58);
  auVar59._4_4_ = fVar250 * local_b8._4_4_;
  auVar59._0_4_ = fVar220 * local_b8._0_4_;
  auVar59._8_4_ = fVar204 * local_b8._8_4_;
  auVar59._12_4_ = fVar244 * local_b8._12_4_;
  auVar59._16_4_ = fVar269 * local_b8._16_4_;
  auVar59._20_4_ = fVar376 * local_b8._20_4_;
  auVar59._24_4_ = fVar245 * local_b8._24_4_;
  auVar59._28_4_ = fStack_13c;
  auVar60._4_4_ = fVar95 * (float)local_408._4_4_;
  auVar60._0_4_ = fVar270 * (float)local_408._0_4_;
  auVar60._8_4_ = fVar246 * fStack_400;
  auVar60._12_4_ = fVar271 * fStack_3fc;
  auVar60._16_4_ = fVar219 * fStack_3f8;
  auVar60._20_4_ = fVar249 * fStack_3f4;
  auVar60._24_4_ = fVar395 * fStack_3f0;
  auVar60._28_4_ = local_b8._28_4_;
  auVar127 = vsubps_avx(auVar59,auVar60);
  auVar61._4_4_ = fVar250 * local_4a8._4_4_;
  auVar61._0_4_ = fVar220 * local_4a8._0_4_;
  auVar61._8_4_ = fVar204 * local_4a8._8_4_;
  auVar61._12_4_ = fVar244 * local_4a8._12_4_;
  auVar61._16_4_ = fVar269 * local_4a8._16_4_;
  auVar61._20_4_ = fVar376 * local_4a8._20_4_;
  auVar61._24_4_ = fVar245 * local_4a8._24_4_;
  auVar61._28_4_ = auVar32._28_4_ + auVar30._28_4_;
  auVar62._4_4_ = auVar31._4_4_ * fVar95;
  auVar62._0_4_ = auVar31._0_4_ * fVar270;
  auVar62._8_4_ = auVar31._8_4_ * fVar246;
  auVar62._12_4_ = auVar31._12_4_ * fVar271;
  auVar62._16_4_ = auVar31._16_4_ * fVar219;
  auVar62._20_4_ = auVar31._20_4_ * fVar249;
  auVar62._24_4_ = auVar31._24_4_ * fVar395;
  auVar62._28_4_ = auVar33._28_4_ + auVar27._28_4_;
  auVar32 = vsubps_avx(auVar61,auVar62);
  auVar27 = vminps_avx(auVar34,auVar29);
  auVar125 = vmaxps_avx(auVar34,auVar29);
  auVar28 = vminps_avx(auVar41,auVar42);
  auVar28 = vminps_avx(auVar27,auVar28);
  auVar27 = vmaxps_avx(auVar41,auVar42);
  auVar125 = vmaxps_avx(auVar125,auVar27);
  auVar29 = vminps_avx(auVar124,auVar126);
  auVar27 = vmaxps_avx(auVar124,auVar126);
  auVar30 = vminps_avx(auVar127,auVar32);
  auVar30 = vminps_avx(auVar29,auVar30);
  auVar30 = vminps_avx(auVar28,auVar30);
  auVar28 = vmaxps_avx(auVar127,auVar32);
  auVar27 = vmaxps_avx(auVar27,auVar28);
  auVar27 = vmaxps_avx(auVar125,auVar27);
  auVar125 = vcmpps_avx(auVar30,local_78,2);
  auVar27 = vcmpps_avx(auVar27,local_98,5);
  auVar125 = vandps_avx(auVar27,auVar125);
  auVar27 = local_198 & auVar125;
  if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar27 >> 0x7f,0) != '\0') ||
        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar27 >> 0xbf,0) != '\0') ||
      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar27[0x1f] < '\0') {
    auVar27 = vsubps_avx(_local_318,local_d8);
    auVar28 = vsubps_avx(auVar31,auVar299);
    fVar250 = auVar27._0_4_ + auVar28._0_4_;
    fVar204 = auVar27._4_4_ + auVar28._4_4_;
    fVar244 = auVar27._8_4_ + auVar28._8_4_;
    fVar269 = auVar27._12_4_ + auVar28._12_4_;
    fVar376 = auVar27._16_4_ + auVar28._16_4_;
    fVar245 = auVar27._20_4_ + auVar28._20_4_;
    fVar270 = auVar27._24_4_ + auVar28._24_4_;
    auVar30 = vsubps_avx(local_f8,auVar218);
    auVar32 = vsubps_avx(_local_4a8,auVar328);
    fVar95 = auVar30._0_4_ + auVar32._0_4_;
    fVar246 = auVar30._4_4_ + auVar32._4_4_;
    fVar271 = auVar30._8_4_ + auVar32._8_4_;
    fVar219 = auVar30._12_4_ + auVar32._12_4_;
    fVar249 = auVar30._16_4_ + auVar32._16_4_;
    fVar395 = auVar30._20_4_ + auVar32._20_4_;
    fVar247 = auVar30._24_4_ + auVar32._24_4_;
    fVar220 = auVar32._28_4_;
    auVar63._4_4_ = auVar218._4_4_ * fVar204;
    auVar63._0_4_ = auVar218._0_4_ * fVar250;
    auVar63._8_4_ = auVar218._8_4_ * fVar244;
    auVar63._12_4_ = auVar218._12_4_ * fVar269;
    auVar63._16_4_ = auVar218._16_4_ * fVar376;
    auVar63._20_4_ = auVar218._20_4_ * fVar245;
    auVar63._24_4_ = auVar218._24_4_ * fVar270;
    auVar63._28_4_ = auVar218._28_4_;
    auVar64._4_4_ = local_d8._4_4_ * fVar246;
    auVar64._0_4_ = local_d8._0_4_ * fVar95;
    auVar64._8_4_ = local_d8._8_4_ * fVar271;
    auVar64._12_4_ = local_d8._12_4_ * fVar219;
    auVar64._16_4_ = local_d8._16_4_ * fVar249;
    auVar64._20_4_ = local_d8._20_4_ * fVar395;
    auVar64._24_4_ = local_d8._24_4_ * fVar247;
    auVar64._28_4_ = local_d8._28_4_;
    auVar32 = vsubps_avx(auVar63,auVar64);
    auVar65._4_4_ = fVar204 * fStack_134;
    auVar65._0_4_ = fVar250 * local_138;
    auVar65._8_4_ = fVar244 * fStack_130;
    auVar65._12_4_ = fVar269 * fStack_12c;
    auVar65._16_4_ = fVar376 * fStack_128;
    auVar65._20_4_ = fVar245 * fStack_124;
    auVar65._24_4_ = fVar270 * fStack_120;
    auVar65._28_4_ = auVar218._28_4_;
    auVar66._4_4_ = fVar246 * fStack_114;
    auVar66._0_4_ = fVar95 * local_118;
    auVar66._8_4_ = fVar271 * fStack_110;
    auVar66._12_4_ = fVar219 * fStack_10c;
    auVar66._16_4_ = fVar249 * fStack_108;
    auVar66._20_4_ = fVar395 * fStack_104;
    auVar66._24_4_ = fVar247 * fStack_100;
    auVar66._28_4_ = fVar220;
    auVar33 = vsubps_avx(auVar65,auVar66);
    auVar67._4_4_ = fVar204 * (float)local_448._4_4_;
    auVar67._0_4_ = fVar250 * (float)local_448._0_4_;
    auVar67._8_4_ = fVar244 * fStack_440;
    auVar67._12_4_ = fVar269 * fStack_43c;
    auVar67._16_4_ = fVar376 * fStack_438;
    auVar67._20_4_ = fVar245 * fStack_434;
    auVar67._24_4_ = fVar270 * fStack_430;
    auVar67._28_4_ = fVar220;
    auVar68._4_4_ = fVar246 * (float)local_4e8._4_4_;
    auVar68._0_4_ = fVar95 * (float)local_4e8._0_4_;
    auVar68._8_4_ = fVar271 * fStack_4e0;
    auVar68._12_4_ = fVar219 * fStack_4dc;
    auVar68._16_4_ = fVar249 * fStack_4d8;
    auVar68._20_4_ = fVar395 * fStack_4d4;
    auVar68._24_4_ = fVar247 * fStack_4d0;
    auVar68._28_4_ = auVar29._28_4_;
    auVar34 = vsubps_avx(auVar67,auVar68);
    auVar69._4_4_ = local_f8._4_4_ * fVar204;
    auVar69._0_4_ = local_f8._0_4_ * fVar250;
    auVar69._8_4_ = local_f8._8_4_ * fVar244;
    auVar69._12_4_ = local_f8._12_4_ * fVar269;
    auVar69._16_4_ = local_f8._16_4_ * fVar376;
    auVar69._20_4_ = local_f8._20_4_ * fVar245;
    auVar69._24_4_ = local_f8._24_4_ * fVar270;
    auVar69._28_4_ = auVar29._28_4_;
    auVar70._4_4_ = local_318._4_4_ * fVar246;
    auVar70._0_4_ = local_318._0_4_ * fVar95;
    auVar70._8_4_ = local_318._8_4_ * fVar271;
    auVar70._12_4_ = local_318._12_4_ * fVar219;
    auVar70._16_4_ = local_318._16_4_ * fVar249;
    auVar70._20_4_ = local_318._20_4_ * fVar395;
    uVar8 = local_318._28_4_;
    auVar70._24_4_ = local_318._24_4_ * fVar247;
    auVar70._28_4_ = uVar8;
    auVar41 = vsubps_avx(auVar69,auVar70);
    auVar71._4_4_ = auVar328._4_4_ * fVar204;
    auVar71._0_4_ = auVar328._0_4_ * fVar250;
    auVar71._8_4_ = auVar328._8_4_ * fVar244;
    auVar71._12_4_ = auVar328._12_4_ * fVar269;
    auVar71._16_4_ = auVar328._16_4_ * fVar376;
    auVar71._20_4_ = auVar328._20_4_ * fVar245;
    auVar71._24_4_ = auVar328._24_4_ * fVar270;
    auVar71._28_4_ = uVar8;
    auVar72._4_4_ = auVar299._4_4_ * fVar246;
    auVar72._0_4_ = auVar299._0_4_ * fVar95;
    auVar72._8_4_ = auVar299._8_4_ * fVar271;
    auVar72._12_4_ = auVar299._12_4_ * fVar219;
    auVar72._16_4_ = auVar299._16_4_ * fVar249;
    auVar72._20_4_ = auVar299._20_4_ * fVar395;
    auVar72._24_4_ = auVar299._24_4_ * fVar247;
    auVar72._28_4_ = auVar299._28_4_;
    auVar42 = vsubps_avx(auVar71,auVar72);
    auVar73._4_4_ = fVar204 * fStack_174;
    auVar73._0_4_ = fVar250 * local_178;
    auVar73._8_4_ = fVar244 * fStack_170;
    auVar73._12_4_ = fVar269 * fStack_16c;
    auVar73._16_4_ = fVar376 * fStack_168;
    auVar73._20_4_ = fVar245 * fStack_164;
    auVar73._24_4_ = fVar270 * fStack_160;
    auVar73._28_4_ = uVar8;
    auVar74._4_4_ = fVar246 * fStack_154;
    auVar74._0_4_ = fVar95 * local_158;
    auVar74._8_4_ = fVar271 * fStack_150;
    auVar74._12_4_ = fVar219 * fStack_14c;
    auVar74._16_4_ = fVar249 * fStack_148;
    auVar74._20_4_ = fVar395 * fStack_144;
    auVar74._24_4_ = fVar247 * fStack_140;
    auVar74._28_4_ = auVar328._28_4_;
    auVar124 = vsubps_avx(auVar73,auVar74);
    auVar75._4_4_ = fVar204 * local_b8._4_4_;
    auVar75._0_4_ = fVar250 * local_b8._0_4_;
    auVar75._8_4_ = fVar244 * local_b8._8_4_;
    auVar75._12_4_ = fVar269 * local_b8._12_4_;
    auVar75._16_4_ = fVar376 * local_b8._16_4_;
    auVar75._20_4_ = fVar245 * local_b8._20_4_;
    auVar75._24_4_ = fVar270 * local_b8._24_4_;
    auVar75._28_4_ = auVar328._28_4_;
    auVar76._4_4_ = (float)local_408._4_4_ * fVar246;
    auVar76._0_4_ = (float)local_408._0_4_ * fVar95;
    auVar76._8_4_ = fStack_400 * fVar271;
    auVar76._12_4_ = fStack_3fc * fVar219;
    auVar76._16_4_ = fStack_3f8 * fVar249;
    auVar76._20_4_ = fStack_3f4 * fVar395;
    auVar76._24_4_ = fStack_3f0 * fVar247;
    auVar76._28_4_ = local_f8._28_4_;
    auVar126 = vsubps_avx(auVar75,auVar76);
    auVar77._4_4_ = fVar204 * local_4a8._4_4_;
    auVar77._0_4_ = fVar250 * local_4a8._0_4_;
    auVar77._8_4_ = fVar244 * local_4a8._8_4_;
    auVar77._12_4_ = fVar269 * local_4a8._12_4_;
    auVar77._16_4_ = fVar376 * local_4a8._16_4_;
    auVar77._20_4_ = fVar245 * local_4a8._20_4_;
    auVar77._24_4_ = fVar270 * local_4a8._24_4_;
    auVar77._28_4_ = auVar27._28_4_ + auVar28._28_4_;
    auVar78._4_4_ = auVar31._4_4_ * fVar246;
    auVar78._0_4_ = auVar31._0_4_ * fVar95;
    auVar78._8_4_ = auVar31._8_4_ * fVar271;
    auVar78._12_4_ = auVar31._12_4_ * fVar219;
    auVar78._16_4_ = auVar31._16_4_ * fVar249;
    auVar78._20_4_ = auVar31._20_4_ * fVar395;
    auVar78._24_4_ = auVar31._24_4_ * fVar247;
    auVar78._28_4_ = auVar30._28_4_ + fVar220;
    auVar127 = vsubps_avx(auVar77,auVar78);
    auVar28 = vminps_avx(auVar32,auVar33);
    auVar27 = vmaxps_avx(auVar32,auVar33);
    auVar29 = vminps_avx(auVar34,auVar41);
    auVar29 = vminps_avx(auVar28,auVar29);
    auVar28 = vmaxps_avx(auVar34,auVar41);
    auVar27 = vmaxps_avx(auVar27,auVar28);
    auVar30 = vminps_avx(auVar42,auVar124);
    auVar28 = vmaxps_avx(auVar42,auVar124);
    auVar31 = vminps_avx(auVar126,auVar127);
    auVar30 = vminps_avx(auVar30,auVar31);
    auVar30 = vminps_avx(auVar29,auVar30);
    auVar29 = vmaxps_avx(auVar126,auVar127);
    auVar28 = vmaxps_avx(auVar28,auVar29);
    auVar28 = vmaxps_avx(auVar27,auVar28);
    auVar27 = vcmpps_avx(auVar30,local_78,2);
    auVar28 = vcmpps_avx(auVar28,local_98,5);
    auVar27 = vandps_avx(auVar28,auVar27);
    auVar125 = vandps_avx(local_198,auVar125);
    auVar28 = auVar125 & auVar27;
    if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar28 >> 0x7f,0) != '\0') ||
          (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar28 >> 0xbf,0) != '\0') ||
        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar28[0x1f] < '\0')
    {
      auVar125 = vandps_avx(auVar27,auVar125);
      uVar86 = vmovmskps_avx(auVar125);
      if (uVar86 != 0) {
        auStack_2b8[uVar87] = uVar86 & 0xff;
        uVar9 = vmovlps_avx(local_238);
        *(undefined8 *)(afStack_1d8 + uVar87 * 2) = uVar9;
        uVar10 = vmovlps_avx(auVar366);
        auStack_58[uVar87] = uVar10;
        uVar87 = (ulong)((int)uVar87 + 1);
      }
    }
  }
LAB_00abcbc9:
  do {
    do {
      do {
        do {
          if ((int)uVar87 == 0) {
            auVar113 = ZEXT816(0) << 0x40;
            if (bVar94) goto LAB_00abdb3b;
            fVar220 = ray->tfar;
            auVar133._4_4_ = fVar220;
            auVar133._0_4_ = fVar220;
            auVar133._8_4_ = fVar220;
            auVar133._12_4_ = fVar220;
            auVar133._16_4_ = fVar220;
            auVar133._20_4_ = fVar220;
            auVar133._24_4_ = fVar220;
            auVar133._28_4_ = fVar220;
            auVar125 = vcmpps_avx(local_1b8,auVar133,2);
            uVar86 = vmovmskps_avx(auVar125);
            uVar93 = uVar93 & uVar93 + 0xff & uVar86;
            goto LAB_00abb9f8;
          }
          uVar88 = (int)uVar87 - 1;
          uVar89 = (ulong)uVar88;
          uVar86 = auStack_2b8[uVar89];
          fVar220 = afStack_1d8[uVar89 * 2];
          fVar250 = afStack_1d8[uVar89 * 2 + 1];
          auVar367._8_8_ = 0;
          auVar367._0_8_ = auStack_58[uVar89];
          auVar371 = ZEXT1664(auVar367);
          uVar10 = 0;
          if (uVar86 != 0) {
            for (; (uVar86 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar86 = uVar86 - 1 & uVar86;
          auStack_2b8[uVar89] = uVar86;
          if (uVar86 == 0) {
            uVar87 = (ulong)uVar88;
          }
          auVar400 = ZEXT1664(local_488);
          auVar382 = ZEXT1664(local_328);
          auVar300 = ZEXT1664(local_338);
          auVar319 = ZEXT1664(local_348);
          auVar329 = ZEXT1664(local_358);
          auVar341 = ZEXT1664(local_368);
          auVar356 = ZEXT1664(local_378);
          fVar244 = (float)(uVar10 + 1) * 0.14285715;
          fVar204 = (1.0 - (float)uVar10 * 0.14285715) * fVar220 +
                    fVar250 * (float)uVar10 * 0.14285715;
          fVar220 = (1.0 - fVar244) * fVar220 + fVar250 * fVar244;
          fVar250 = fVar220 - fVar204;
          if (0.16666667 <= fVar250) {
            auVar113 = vinsertps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar220),0x10);
            auVar401 = ZEXT1664(auVar113);
            goto LAB_00abc56f;
          }
          auVar113 = vshufps_avx(auVar367,auVar367,0x50);
          auVar143._8_4_ = 0x3f800000;
          auVar143._0_8_ = 0x3f8000003f800000;
          auVar143._12_4_ = 0x3f800000;
          auVar211 = vsubps_avx(auVar143,auVar113);
          fVar244 = auVar113._0_4_;
          fVar269 = auVar113._4_4_;
          fVar376 = auVar113._8_4_;
          fVar245 = auVar113._12_4_;
          fVar270 = auVar211._0_4_;
          fVar95 = auVar211._4_4_;
          fVar246 = auVar211._8_4_;
          fVar271 = auVar211._12_4_;
          auVar181._0_4_ = local_358._0_4_ * fVar244 + fVar270 * local_488._0_4_;
          auVar181._4_4_ = local_358._4_4_ * fVar269 + fVar95 * local_488._4_4_;
          auVar181._8_4_ = local_358._8_4_ * fVar376 + fVar246 * local_488._8_4_;
          auVar181._12_4_ = local_358._12_4_ * fVar245 + fVar271 * local_488._12_4_;
          auVar231._0_4_ = fVar244 * auVar320._0_4_ + local_328._0_4_ * fVar270;
          auVar231._4_4_ = fVar269 * auVar320._4_4_ + local_328._4_4_ * fVar95;
          auVar231._8_4_ = fVar376 * auVar320._0_4_ + local_328._8_4_ * fVar246;
          auVar231._12_4_ = fVar245 * auVar320._4_4_ + local_328._12_4_ * fVar271;
          auVar259._0_4_ = local_368._0_4_ * fVar244 + fVar270 * local_338._0_4_;
          auVar259._4_4_ = local_368._4_4_ * fVar269 + fVar95 * local_338._4_4_;
          auVar259._8_4_ = local_368._8_4_ * fVar376 + fVar246 * local_338._8_4_;
          auVar259._12_4_ = local_368._12_4_ * fVar245 + fVar271 * local_338._12_4_;
          auVar110._0_4_ = local_378._0_4_ * fVar244 + local_348._0_4_ * fVar270;
          auVar110._4_4_ = local_378._4_4_ * fVar269 + local_348._4_4_ * fVar95;
          auVar110._8_4_ = local_378._8_4_ * fVar376 + local_348._8_4_ * fVar246;
          auVar110._12_4_ = local_378._12_4_ * fVar245 + local_348._12_4_ * fVar271;
          auVar167._16_16_ = auVar181;
          auVar167._0_16_ = auVar181;
          auVar202._16_16_ = auVar231;
          auVar202._0_16_ = auVar231;
          auVar243._16_16_ = auVar259;
          auVar243._0_16_ = auVar259;
          _local_448 = ZEXT416((uint)fVar220);
          auVar125 = ZEXT2032(CONCAT416(fVar220,ZEXT416((uint)fVar204)));
          auVar125 = vshufps_avx(auVar125,auVar125,0);
          auVar27 = vsubps_avx(auVar202,auVar167);
          fVar244 = auVar125._0_4_;
          fVar269 = auVar125._4_4_;
          fVar376 = auVar125._8_4_;
          fVar245 = auVar125._12_4_;
          fVar270 = auVar125._16_4_;
          fVar95 = auVar125._20_4_;
          fVar246 = auVar125._24_4_;
          auVar168._0_4_ = auVar181._0_4_ + auVar27._0_4_ * fVar244;
          auVar168._4_4_ = auVar181._4_4_ + auVar27._4_4_ * fVar269;
          auVar168._8_4_ = auVar181._8_4_ + auVar27._8_4_ * fVar376;
          auVar168._12_4_ = auVar181._12_4_ + auVar27._12_4_ * fVar245;
          auVar168._16_4_ = auVar181._0_4_ + auVar27._16_4_ * fVar270;
          auVar168._20_4_ = auVar181._4_4_ + auVar27._20_4_ * fVar95;
          auVar168._24_4_ = auVar181._8_4_ + auVar27._24_4_ * fVar246;
          auVar168._28_4_ = auVar181._12_4_ + auVar27._28_4_;
          auVar125 = vsubps_avx(auVar243,auVar202);
          auVar203._0_4_ = auVar231._0_4_ + auVar125._0_4_ * fVar244;
          auVar203._4_4_ = auVar231._4_4_ + auVar125._4_4_ * fVar269;
          auVar203._8_4_ = auVar231._8_4_ + auVar125._8_4_ * fVar376;
          auVar203._12_4_ = auVar231._12_4_ + auVar125._12_4_ * fVar245;
          auVar203._16_4_ = auVar231._0_4_ + auVar125._16_4_ * fVar270;
          auVar203._20_4_ = auVar231._4_4_ + auVar125._20_4_ * fVar95;
          auVar203._24_4_ = auVar231._8_4_ + auVar125._24_4_ * fVar246;
          auVar203._28_4_ = auVar231._12_4_ + auVar125._28_4_;
          auVar113 = vsubps_avx(auVar110,auVar259);
          auVar131._0_4_ = auVar259._0_4_ + auVar113._0_4_ * fVar244;
          auVar131._4_4_ = auVar259._4_4_ + auVar113._4_4_ * fVar269;
          auVar131._8_4_ = auVar259._8_4_ + auVar113._8_4_ * fVar376;
          auVar131._12_4_ = auVar259._12_4_ + auVar113._12_4_ * fVar245;
          auVar131._16_4_ = auVar259._0_4_ + auVar113._0_4_ * fVar270;
          auVar131._20_4_ = auVar259._4_4_ + auVar113._4_4_ * fVar95;
          auVar131._24_4_ = auVar259._8_4_ + auVar113._8_4_ * fVar246;
          auVar131._28_4_ = auVar259._12_4_ + auVar113._12_4_;
          auVar125 = vsubps_avx(auVar203,auVar168);
          auVar169._0_4_ = auVar168._0_4_ + fVar244 * auVar125._0_4_;
          auVar169._4_4_ = auVar168._4_4_ + fVar269 * auVar125._4_4_;
          auVar169._8_4_ = auVar168._8_4_ + fVar376 * auVar125._8_4_;
          auVar169._12_4_ = auVar168._12_4_ + fVar245 * auVar125._12_4_;
          auVar169._16_4_ = auVar168._16_4_ + fVar270 * auVar125._16_4_;
          auVar169._20_4_ = auVar168._20_4_ + fVar95 * auVar125._20_4_;
          auVar169._24_4_ = auVar168._24_4_ + fVar246 * auVar125._24_4_;
          auVar169._28_4_ = auVar168._28_4_ + auVar125._28_4_;
          auVar125 = vsubps_avx(auVar131,auVar203);
          auVar132._0_4_ = auVar203._0_4_ + fVar244 * auVar125._0_4_;
          auVar132._4_4_ = auVar203._4_4_ + fVar269 * auVar125._4_4_;
          auVar132._8_4_ = auVar203._8_4_ + fVar376 * auVar125._8_4_;
          auVar132._12_4_ = auVar203._12_4_ + fVar245 * auVar125._12_4_;
          auVar132._16_4_ = auVar203._16_4_ + fVar270 * auVar125._16_4_;
          auVar132._20_4_ = auVar203._20_4_ + fVar95 * auVar125._20_4_;
          auVar132._24_4_ = auVar203._24_4_ + fVar246 * auVar125._24_4_;
          auVar132._28_4_ = auVar203._28_4_ + auVar125._28_4_;
          auVar125 = vsubps_avx(auVar132,auVar169);
          auVar279._0_4_ = auVar169._0_4_ + fVar244 * auVar125._0_4_;
          auVar279._4_4_ = auVar169._4_4_ + fVar269 * auVar125._4_4_;
          auVar279._8_4_ = auVar169._8_4_ + fVar376 * auVar125._8_4_;
          auVar279._12_4_ = auVar169._12_4_ + fVar245 * auVar125._12_4_;
          auVar281._16_4_ = auVar169._16_4_ + fVar270 * auVar125._16_4_;
          auVar281._0_16_ = auVar279;
          auVar281._20_4_ = auVar169._20_4_ + fVar95 * auVar125._20_4_;
          auVar281._24_4_ = auVar169._24_4_ + fVar246 * auVar125._24_4_;
          auVar281._28_4_ = auVar169._28_4_ + auVar203._28_4_;
          auVar286 = auVar281._16_16_;
          auVar145 = vshufps_avx(ZEXT416((uint)(fVar250 * 0.33333334)),
                                 ZEXT416((uint)(fVar250 * 0.33333334)),0);
          auVar232._0_4_ = auVar279._0_4_ + auVar145._0_4_ * auVar125._0_4_ * 3.0;
          auVar232._4_4_ = auVar279._4_4_ + auVar145._4_4_ * auVar125._4_4_ * 3.0;
          auVar232._8_4_ = auVar279._8_4_ + auVar145._8_4_ * auVar125._8_4_ * 3.0;
          auVar232._12_4_ = auVar279._12_4_ + auVar145._12_4_ * auVar125._12_4_ * 3.0;
          auVar197 = vshufpd_avx(auVar279,auVar279,3);
          auVar157 = vshufpd_avx(auVar286,auVar286,3);
          _local_318 = auVar197;
          auVar113 = vsubps_avx(auVar197,auVar279);
          _local_4a8 = auVar157;
          auVar211 = vsubps_avx(auVar157,auVar286);
          auVar111._0_4_ = auVar113._0_4_ + auVar211._0_4_;
          auVar111._4_4_ = auVar113._4_4_ + auVar211._4_4_;
          auVar111._8_4_ = auVar113._8_4_ + auVar211._8_4_;
          auVar111._12_4_ = auVar113._12_4_ + auVar211._12_4_;
          auVar113 = vmovshdup_avx(auVar279);
          auVar211 = vmovshdup_avx(auVar232);
          auVar183 = vshufps_avx(auVar111,auVar111,0);
          auVar146 = vshufps_avx(auVar111,auVar111,0x55);
          fVar244 = auVar146._0_4_;
          fVar269 = auVar146._4_4_;
          fVar376 = auVar146._8_4_;
          fVar245 = auVar146._12_4_;
          fVar270 = auVar183._0_4_;
          fVar95 = auVar183._4_4_;
          fVar246 = auVar183._8_4_;
          fVar271 = auVar183._12_4_;
          auVar112._0_4_ = fVar270 * auVar279._0_4_ + auVar113._0_4_ * fVar244;
          auVar112._4_4_ = fVar95 * auVar279._4_4_ + auVar113._4_4_ * fVar269;
          auVar112._8_4_ = fVar246 * auVar279._8_4_ + auVar113._8_4_ * fVar376;
          auVar112._12_4_ = fVar271 * auVar279._12_4_ + auVar113._12_4_ * fVar245;
          _local_408 = auVar232;
          auVar344._0_4_ = fVar270 * auVar232._0_4_ + auVar211._0_4_ * fVar244;
          auVar344._4_4_ = fVar95 * auVar232._4_4_ + auVar211._4_4_ * fVar269;
          auVar344._8_4_ = fVar246 * auVar232._8_4_ + auVar211._8_4_ * fVar376;
          auVar344._12_4_ = fVar271 * auVar232._12_4_ + auVar211._12_4_ * fVar245;
          auVar211 = vshufps_avx(auVar112,auVar112,0xe8);
          auVar183 = vshufps_avx(auVar344,auVar344,0xe8);
          auVar113 = vcmpps_avx(auVar211,auVar183,1);
          uVar86 = vextractps_avx(auVar113,0);
          auVar146 = auVar344;
          if ((uVar86 & 1) == 0) {
            auVar146 = auVar112;
          }
          auVar144._0_4_ = auVar145._0_4_ * auVar125._16_4_ * 3.0;
          auVar144._4_4_ = auVar145._4_4_ * auVar125._20_4_ * 3.0;
          auVar144._8_4_ = auVar145._8_4_ * auVar125._24_4_ * 3.0;
          auVar144._12_4_ = auVar145._12_4_ * 0.0;
          auVar36 = vsubps_avx(auVar286,auVar144);
          auVar145 = vmovshdup_avx(auVar36);
          auVar286 = vmovshdup_avx(auVar286);
          fVar219 = auVar36._0_4_;
          fVar249 = auVar36._4_4_;
          auVar260._0_4_ = fVar219 * fVar270 + auVar145._0_4_ * fVar244;
          auVar260._4_4_ = fVar249 * fVar95 + auVar145._4_4_ * fVar269;
          auVar260._8_4_ = auVar36._8_4_ * fVar246 + auVar145._8_4_ * fVar376;
          auVar260._12_4_ = auVar36._12_4_ * fVar271 + auVar145._12_4_ * fVar245;
          auVar398._0_4_ = fVar270 * auVar281._16_4_ + auVar286._0_4_ * fVar244;
          auVar398._4_4_ = fVar95 * auVar281._20_4_ + auVar286._4_4_ * fVar269;
          auVar398._8_4_ = fVar246 * auVar281._24_4_ + auVar286._8_4_ * fVar376;
          auVar398._12_4_ = fVar271 * auVar281._28_4_ + auVar286._12_4_ * fVar245;
          auVar286 = vshufps_avx(auVar260,auVar260,0xe8);
          auVar35 = vshufps_avx(auVar398,auVar398,0xe8);
          auVar145 = vcmpps_avx(auVar286,auVar35,1);
          uVar86 = vextractps_avx(auVar145,0);
          auVar366 = auVar398;
          if ((uVar86 & 1) == 0) {
            auVar366 = auVar260;
          }
          auVar146 = vmaxss_avx(auVar366,auVar146);
          auVar211 = vminps_avx(auVar211,auVar183);
          auVar183 = vminps_avx(auVar286,auVar35);
          auVar183 = vminps_avx(auVar211,auVar183);
          auVar113 = vshufps_avx(auVar113,auVar113,0x55);
          auVar113 = vblendps_avx(auVar113,auVar145,2);
          auVar145 = vpslld_avx(auVar113,0x1f);
          auVar113 = vshufpd_avx(auVar344,auVar344,1);
          auVar113 = vinsertps_avx(auVar113,auVar398,0x9c);
          auVar211 = vshufpd_avx(auVar112,auVar112,1);
          auVar211 = vinsertps_avx(auVar211,auVar260,0x9c);
          auVar113 = vblendvps_avx(auVar211,auVar113,auVar145);
          auVar211 = vmovshdup_avx(auVar113);
          auVar113 = vmaxss_avx(auVar211,auVar113);
          fVar376 = auVar183._0_4_;
          auVar211 = vmovshdup_avx(auVar183);
          fVar269 = auVar113._0_4_;
          fVar245 = auVar211._0_4_;
          fVar244 = auVar146._0_4_;
          if ((fVar376 < 0.0001) && (-0.0001 < fVar269)) break;
          if ((fVar245 < 0.0001 && -0.0001 < fVar244) || (fVar376 < 0.0001 && -0.0001 < fVar244))
          break;
          auVar145 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar113,1);
          auVar211 = vcmpps_avx(auVar211,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar211 = vandps_avx(auVar211,auVar145);
        } while ((auVar211 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar145 = vcmpps_avx(auVar183,_DAT_01f45a50,1);
        auVar211 = vcmpss_avx(auVar146,ZEXT416(0) << 0x20,1);
        auVar182._8_4_ = 0x3f800000;
        auVar182._0_8_ = 0x3f8000003f800000;
        auVar182._12_4_ = 0x3f800000;
        auVar233._8_4_ = 0xbf800000;
        auVar233._0_8_ = 0xbf800000bf800000;
        auVar233._12_4_ = 0xbf800000;
        auVar211 = vblendvps_avx(auVar182,auVar233,auVar211);
        auVar145 = vblendvps_avx(auVar182,auVar233,auVar145);
        auVar183 = vcmpss_avx(auVar145,auVar211,4);
        auVar183 = vpshufd_avx(ZEXT416(auVar183._0_4_ & 1),0x50);
        auVar183 = vpslld_avx(auVar183,0x1f);
        auVar183 = vpsrad_avx(auVar183,0x1f);
        auVar183 = vpandn_avx(auVar183,_DAT_01f7afb0);
        auVar146 = vmovshdup_avx(auVar145);
        fVar270 = auVar146._0_4_;
        if ((auVar145._0_4_ != fVar270) || (NAN(auVar145._0_4_) || NAN(fVar270))) {
          if ((fVar245 != fVar376) || (NAN(fVar245) || NAN(fVar376))) {
            fVar376 = -fVar376 / (fVar245 - fVar376);
            auVar145 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar376) * 0.0 + fVar376)));
          }
          else {
            auVar145 = ZEXT816(0x3f80000000000000);
            if ((fVar376 != 0.0) || (NAN(fVar376))) {
              auVar145 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar286 = vcmpps_avx(auVar183,auVar145,1);
          auVar146 = vblendps_avx(auVar183,auVar145,2);
          auVar145 = vblendps_avx(auVar145,auVar183,2);
          auVar183 = vblendvps_avx(auVar145,auVar146,auVar286);
        }
        auVar113 = vcmpss_avx(auVar113,ZEXT416(0) << 0x20,1);
        auVar184._8_4_ = 0x3f800000;
        auVar184._0_8_ = 0x3f8000003f800000;
        auVar184._12_4_ = 0x3f800000;
        auVar234._8_4_ = 0xbf800000;
        auVar234._0_8_ = 0xbf800000bf800000;
        auVar234._12_4_ = 0xbf800000;
        auVar113 = vblendvps_avx(auVar184,auVar234,auVar113);
        fVar376 = auVar113._0_4_;
        if ((auVar211._0_4_ != fVar376) || (NAN(auVar211._0_4_) || NAN(fVar376))) {
          if ((fVar269 != fVar244) || (NAN(fVar269) || NAN(fVar244))) {
            fVar244 = -fVar244 / (fVar269 - fVar244);
            auVar113 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar244) * 0.0 + fVar244)));
          }
          else {
            auVar113 = ZEXT816(0x3f80000000000000);
            if ((fVar244 != 0.0) || (NAN(fVar244))) {
              auVar113 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar145 = vcmpps_avx(auVar183,auVar113,1);
          auVar211 = vblendps_avx(auVar183,auVar113,2);
          auVar113 = vblendps_avx(auVar113,auVar183,2);
          auVar183 = vblendvps_avx(auVar113,auVar211,auVar145);
        }
        if ((fVar270 != fVar376) || (NAN(fVar270) || NAN(fVar376))) {
          auVar114._8_4_ = 0x3f800000;
          auVar114._0_8_ = 0x3f8000003f800000;
          auVar114._12_4_ = 0x3f800000;
          auVar113 = vcmpps_avx(auVar183,auVar114,1);
          auVar211 = vinsertps_avx(auVar183,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar185._4_12_ = auVar183._4_12_;
          auVar185._0_4_ = 0x3f800000;
          auVar183 = vblendvps_avx(auVar185,auVar211,auVar113);
        }
        auVar113 = vcmpps_avx(auVar183,_DAT_01f46740,1);
        auVar80._12_4_ = 0;
        auVar80._0_12_ = auVar183._4_12_;
        auVar211 = vinsertps_avx(auVar183,ZEXT416(0x3f800000),0x10);
        auVar113 = vblendvps_avx(auVar211,auVar80 << 0x20,auVar113);
        auVar211 = vmovshdup_avx(auVar113);
      } while (auVar211._0_4_ < auVar113._0_4_);
      auVar115._0_4_ = auVar113._0_4_ + -0.1;
      auVar115._4_4_ = auVar113._4_4_ + 0.1;
      auVar115._8_4_ = auVar113._8_4_ + 0.0;
      auVar115._12_4_ = auVar113._12_4_ + 0.0;
      auVar145 = vshufpd_avx(auVar232,auVar232,3);
      register0x00001388 = 0x3f80000000000000;
      local_408 = 0x3f80000000000000;
      auVar113 = vcmpps_avx(auVar115,_local_408,1);
      auVar79._12_4_ = 0;
      auVar79._0_12_ = auVar115._4_12_;
      auVar211 = vinsertps_avx(auVar115,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar113 = vblendvps_avx(auVar211,auVar79 << 0x20,auVar113);
      auVar211 = vshufpd_avx(auVar36,auVar36,3);
      auVar183 = vshufps_avx(auVar113,auVar113,0x50);
      auVar390._8_4_ = 0x3f800000;
      auVar390._0_8_ = 0x3f8000003f800000;
      auVar390._12_4_ = 0x3f800000;
      auVar146 = vsubps_avx(auVar390,auVar183);
      local_318._0_4_ = auVar197._0_4_;
      local_318._4_4_ = auVar197._4_4_;
      fStack_310 = auVar197._8_4_;
      fStack_30c = auVar197._12_4_;
      fVar244 = auVar183._0_4_;
      fVar269 = auVar183._4_4_;
      fVar376 = auVar183._8_4_;
      fVar245 = auVar183._12_4_;
      local_4a8._0_4_ = auVar157._0_4_;
      local_4a8._4_4_ = auVar157._4_4_;
      fStack_4a0 = auVar157._8_4_;
      fStack_49c = auVar157._12_4_;
      fVar270 = auVar146._0_4_;
      fVar95 = auVar146._4_4_;
      fVar246 = auVar146._8_4_;
      fVar271 = auVar146._12_4_;
      auVar116._0_4_ = fVar244 * (float)local_318._0_4_ + fVar270 * auVar279._0_4_;
      auVar116._4_4_ = fVar269 * (float)local_318._4_4_ + fVar95 * auVar279._4_4_;
      auVar116._8_4_ = fVar376 * fStack_310 + fVar246 * auVar279._0_4_;
      auVar116._12_4_ = fVar245 * fStack_30c + fVar271 * auVar279._4_4_;
      auVar261._0_4_ = auVar145._0_4_ * fVar244 + fVar270 * auVar232._0_4_;
      auVar261._4_4_ = auVar145._4_4_ * fVar269 + fVar95 * auVar232._4_4_;
      auVar261._8_4_ = auVar145._8_4_ * fVar376 + fVar246 * auVar232._0_4_;
      auVar261._12_4_ = auVar145._12_4_ * fVar245 + fVar271 * auVar232._4_4_;
      auVar294._0_4_ = auVar211._0_4_ * fVar244 + fVar270 * fVar219;
      auVar294._4_4_ = auVar211._4_4_ * fVar269 + fVar95 * fVar249;
      auVar294._8_4_ = auVar211._8_4_ * fVar376 + fVar246 * fVar219;
      auVar294._12_4_ = auVar211._12_4_ * fVar245 + fVar271 * fVar249;
      auVar332._0_4_ = fVar244 * (float)local_4a8._0_4_ + fVar270 * auVar281._16_4_;
      auVar332._4_4_ = fVar269 * (float)local_4a8._4_4_ + fVar95 * auVar281._20_4_;
      auVar332._8_4_ = fVar376 * fStack_4a0 + fVar246 * auVar281._16_4_;
      auVar332._12_4_ = fVar245 * fStack_49c + fVar271 * auVar281._20_4_;
      auVar157 = vsubps_avx(auVar390,auVar113);
      auVar211 = vmovshdup_avx(auVar367);
      auVar197 = vmovsldup_avx(auVar367);
      auVar399._0_4_ = auVar157._0_4_ * auVar197._0_4_ + auVar113._0_4_ * auVar211._0_4_;
      auVar399._4_4_ = auVar157._4_4_ * auVar197._4_4_ + auVar113._4_4_ * auVar211._4_4_;
      auVar399._8_4_ = auVar157._8_4_ * auVar197._8_4_ + auVar113._8_4_ * auVar211._8_4_;
      auVar399._12_4_ = auVar157._12_4_ * auVar197._12_4_ + auVar113._12_4_ * auVar211._12_4_;
      _local_4a8 = vmovshdup_avx(auVar399);
      auVar113 = vsubps_avx(auVar261,auVar116);
      auVar186._0_4_ = auVar113._0_4_ * 3.0;
      auVar186._4_4_ = auVar113._4_4_ * 3.0;
      auVar186._8_4_ = auVar113._8_4_ * 3.0;
      auVar186._12_4_ = auVar113._12_4_ * 3.0;
      auVar113 = vsubps_avx(auVar294,auVar261);
      auVar214._0_4_ = auVar113._0_4_ * 3.0;
      auVar214._4_4_ = auVar113._4_4_ * 3.0;
      auVar214._8_4_ = auVar113._8_4_ * 3.0;
      auVar214._12_4_ = auVar113._12_4_ * 3.0;
      auVar113 = vsubps_avx(auVar332,auVar294);
      auVar311._0_4_ = auVar113._0_4_ * 3.0;
      auVar311._4_4_ = auVar113._4_4_ * 3.0;
      auVar311._8_4_ = auVar113._8_4_ * 3.0;
      auVar311._12_4_ = auVar113._12_4_ * 3.0;
      auVar211 = vminps_avx(auVar214,auVar311);
      auVar113 = vmaxps_avx(auVar214,auVar311);
      auVar211 = vminps_avx(auVar186,auVar211);
      auVar113 = vmaxps_avx(auVar186,auVar113);
      auVar197 = vshufpd_avx(auVar211,auVar211,3);
      auVar157 = vshufpd_avx(auVar113,auVar113,3);
      auVar211 = vminps_avx(auVar211,auVar197);
      auVar113 = vmaxps_avx(auVar113,auVar157);
      auVar197 = vshufps_avx(ZEXT416((uint)(1.0 / fVar250)),ZEXT416((uint)(1.0 / fVar250)),0);
      auVar312._0_4_ = auVar197._0_4_ * auVar211._0_4_;
      auVar312._4_4_ = auVar197._4_4_ * auVar211._4_4_;
      auVar312._8_4_ = auVar197._8_4_ * auVar211._8_4_;
      auVar312._12_4_ = auVar197._12_4_ * auVar211._12_4_;
      auVar321._0_4_ = auVar197._0_4_ * auVar113._0_4_;
      auVar321._4_4_ = auVar197._4_4_ * auVar113._4_4_;
      auVar321._8_4_ = auVar197._8_4_ * auVar113._8_4_;
      auVar321._12_4_ = auVar197._12_4_ * auVar113._12_4_;
      auVar146 = ZEXT416((uint)(1.0 / (local_4a8._0_4_ - auVar399._0_4_)));
      auVar113 = vshufpd_avx(auVar116,auVar116,3);
      auVar211 = vshufpd_avx(auVar261,auVar261,3);
      auVar197 = vshufpd_avx(auVar294,auVar294,3);
      auVar157 = vshufpd_avx(auVar332,auVar332,3);
      auVar113 = vsubps_avx(auVar113,auVar116);
      auVar145 = vsubps_avx(auVar211,auVar261);
      auVar183 = vsubps_avx(auVar197,auVar294);
      auVar157 = vsubps_avx(auVar157,auVar332);
      auVar211 = vminps_avx(auVar113,auVar145);
      auVar113 = vmaxps_avx(auVar113,auVar145);
      auVar197 = vminps_avx(auVar183,auVar157);
      auVar197 = vminps_avx(auVar211,auVar197);
      auVar211 = vmaxps_avx(auVar183,auVar157);
      auVar113 = vmaxps_avx(auVar113,auVar211);
      auVar211 = vshufps_avx(auVar146,auVar146,0);
      auVar378._0_4_ = auVar211._0_4_ * auVar197._0_4_;
      auVar378._4_4_ = auVar211._4_4_ * auVar197._4_4_;
      auVar378._8_4_ = auVar211._8_4_ * auVar197._8_4_;
      auVar378._12_4_ = auVar211._12_4_ * auVar197._12_4_;
      auVar391._0_4_ = auVar211._0_4_ * auVar113._0_4_;
      auVar391._4_4_ = auVar211._4_4_ * auVar113._4_4_;
      auVar391._8_4_ = auVar211._8_4_ * auVar113._8_4_;
      auVar391._12_4_ = auVar211._12_4_ * auVar113._12_4_;
      auVar113 = vmovsldup_avx(auVar399);
      auVar333._4_12_ = auVar113._4_12_;
      auVar333._0_4_ = fVar204;
      auVar345._4_12_ = auVar399._4_12_;
      auVar345._0_4_ = fVar220;
      auVar215._0_4_ = (fVar204 + fVar220) * 0.5;
      auVar215._4_4_ = (auVar113._4_4_ + auVar399._4_4_) * 0.5;
      auVar215._8_4_ = (auVar113._8_4_ + auVar399._8_4_) * 0.5;
      auVar215._12_4_ = (auVar113._12_4_ + auVar399._12_4_) * 0.5;
      auVar113 = vshufps_avx(auVar215,auVar215,0);
      fVar244 = auVar113._0_4_;
      fVar269 = auVar113._4_4_;
      fVar376 = auVar113._8_4_;
      fVar245 = auVar113._12_4_;
      auVar147._0_4_ = fVar244 * (float)local_1e8._0_4_ + (float)local_458._0_4_;
      auVar147._4_4_ = fVar269 * (float)local_1e8._4_4_ + (float)local_458._4_4_;
      auVar147._8_4_ = fVar376 * fStack_1e0 + fStack_450;
      auVar147._12_4_ = fVar245 * fStack_1dc + fStack_44c;
      auVar187._0_4_ = fVar244 * (float)local_1f8._0_4_ + (float)local_468._0_4_;
      auVar187._4_4_ = fVar269 * (float)local_1f8._4_4_ + (float)local_468._4_4_;
      auVar187._8_4_ = fVar376 * fStack_1f0 + fStack_460;
      auVar187._12_4_ = fVar245 * fStack_1ec + fStack_45c;
      auVar262._0_4_ = fVar244 * (float)local_208._0_4_ + (float)local_478._0_4_;
      auVar262._4_4_ = fVar269 * (float)local_208._4_4_ + (float)local_478._4_4_;
      auVar262._8_4_ = fVar376 * fStack_200 + fStack_470;
      auVar262._12_4_ = fVar245 * fStack_1fc + fStack_46c;
      auVar113 = vsubps_avx(auVar187,auVar147);
      auVar148._0_4_ = auVar147._0_4_ + fVar244 * auVar113._0_4_;
      auVar148._4_4_ = auVar147._4_4_ + fVar269 * auVar113._4_4_;
      auVar148._8_4_ = auVar147._8_4_ + fVar376 * auVar113._8_4_;
      auVar148._12_4_ = auVar147._12_4_ + fVar245 * auVar113._12_4_;
      auVar113 = vsubps_avx(auVar262,auVar187);
      auVar188._0_4_ = auVar187._0_4_ + fVar244 * auVar113._0_4_;
      auVar188._4_4_ = auVar187._4_4_ + fVar269 * auVar113._4_4_;
      auVar188._8_4_ = auVar187._8_4_ + fVar376 * auVar113._8_4_;
      auVar188._12_4_ = auVar187._12_4_ + fVar245 * auVar113._12_4_;
      auVar113 = vsubps_avx(auVar188,auVar148);
      fVar244 = auVar148._0_4_ + fVar244 * auVar113._0_4_;
      fVar269 = auVar148._4_4_ + fVar269 * auVar113._4_4_;
      auVar117._0_8_ = CONCAT44(fVar269,fVar244);
      auVar117._8_4_ = auVar148._8_4_ + fVar376 * auVar113._8_4_;
      auVar117._12_4_ = auVar148._12_4_ + fVar245 * auVar113._12_4_;
      fVar376 = auVar113._0_4_ * 3.0;
      fVar245 = auVar113._4_4_ * 3.0;
      auVar149._0_8_ = CONCAT44(fVar245,fVar376);
      auVar149._8_4_ = auVar113._8_4_ * 3.0;
      auVar149._12_4_ = auVar113._12_4_ * 3.0;
      auVar189._8_8_ = auVar117._0_8_;
      auVar189._0_8_ = auVar117._0_8_;
      auVar113 = vshufpd_avx(auVar117,auVar117,3);
      auVar211 = vshufps_avx(auVar215,auVar215,0x55);
      auVar183 = vsubps_avx(auVar113,auVar189);
      auVar368._0_4_ = auVar183._0_4_ * auVar211._0_4_ + fVar244;
      auVar368._4_4_ = auVar183._4_4_ * auVar211._4_4_ + fVar269;
      auVar368._8_4_ = auVar183._8_4_ * auVar211._8_4_ + fVar244;
      auVar368._12_4_ = auVar183._12_4_ * auVar211._12_4_ + fVar269;
      auVar190._8_8_ = auVar149._0_8_;
      auVar190._0_8_ = auVar149._0_8_;
      auVar113 = vshufpd_avx(auVar149,auVar149,1);
      auVar113 = vsubps_avx(auVar113,auVar190);
      auVar150._0_4_ = auVar113._0_4_ * auVar211._0_4_ + fVar376;
      auVar150._4_4_ = auVar113._4_4_ * auVar211._4_4_ + fVar245;
      auVar150._8_4_ = auVar113._8_4_ * auVar211._8_4_ + fVar376;
      auVar150._12_4_ = auVar113._12_4_ * auVar211._12_4_ + fVar245;
      auVar211 = vmovshdup_avx(auVar150);
      auVar263._0_8_ = auVar211._0_8_ ^ 0x8000000080000000;
      auVar263._8_4_ = auVar211._8_4_ ^ 0x80000000;
      auVar263._12_4_ = auVar211._12_4_ ^ 0x80000000;
      auVar197 = vmovshdup_avx(auVar183);
      auVar113 = vunpcklps_avx(auVar197,auVar263);
      auVar157 = vshufps_avx(auVar113,auVar263,4);
      auVar118._0_8_ = auVar183._0_8_ ^ 0x8000000080000000;
      auVar118._8_4_ = -auVar183._8_4_;
      auVar118._12_4_ = -auVar183._12_4_;
      auVar113 = vmovlhps_avx(auVar118,auVar150);
      auVar145 = vshufps_avx(auVar113,auVar150,8);
      auVar113 = ZEXT416((uint)(auVar150._0_4_ * auVar197._0_4_ - auVar183._0_4_ * auVar211._0_4_));
      auVar211 = vshufps_avx(auVar113,auVar113,0);
      auVar113 = vdivps_avx(auVar157,auVar211);
      auVar211 = vdivps_avx(auVar145,auVar211);
      auVar145 = vinsertps_avx(auVar312,auVar378,0x1c);
      auVar183 = vinsertps_avx(auVar321,auVar391,0x1c);
      auVar146 = vinsertps_avx(auVar378,auVar312,0x4c);
      auVar286 = vinsertps_avx(auVar391,auVar321,0x4c);
      auVar197 = vmovsldup_avx(auVar113);
      auVar191._0_4_ = auVar197._0_4_ * auVar145._0_4_;
      auVar191._4_4_ = auVar197._4_4_ * auVar145._4_4_;
      auVar191._8_4_ = auVar197._8_4_ * auVar145._8_4_;
      auVar191._12_4_ = auVar197._12_4_ * auVar145._12_4_;
      auVar151._0_4_ = auVar183._0_4_ * auVar197._0_4_;
      auVar151._4_4_ = auVar183._4_4_ * auVar197._4_4_;
      auVar151._8_4_ = auVar183._8_4_ * auVar197._8_4_;
      auVar151._12_4_ = auVar183._12_4_ * auVar197._12_4_;
      auVar157 = vminps_avx(auVar191,auVar151);
      auVar197 = vmaxps_avx(auVar151,auVar191);
      auVar35 = vmovsldup_avx(auVar211);
      auVar392._0_4_ = auVar146._0_4_ * auVar35._0_4_;
      auVar392._4_4_ = auVar146._4_4_ * auVar35._4_4_;
      auVar392._8_4_ = auVar146._8_4_ * auVar35._8_4_;
      auVar392._12_4_ = auVar146._12_4_ * auVar35._12_4_;
      auVar192._0_4_ = auVar286._0_4_ * auVar35._0_4_;
      auVar192._4_4_ = auVar286._4_4_ * auVar35._4_4_;
      auVar192._8_4_ = auVar286._8_4_ * auVar35._8_4_;
      auVar192._12_4_ = auVar286._12_4_ * auVar35._12_4_;
      auVar35 = vminps_avx(auVar392,auVar192);
      auVar235._0_4_ = auVar157._0_4_ + auVar35._0_4_;
      auVar235._4_4_ = auVar157._4_4_ + auVar35._4_4_;
      auVar235._8_4_ = auVar157._8_4_ + auVar35._8_4_;
      auVar235._12_4_ = auVar157._12_4_ + auVar35._12_4_;
      auVar157 = vmaxps_avx(auVar192,auVar392);
      auVar35 = vsubps_avx(auVar333,auVar215);
      auVar36 = vsubps_avx(auVar345,auVar215);
      auVar152._0_4_ = auVar197._0_4_ + auVar157._0_4_;
      auVar152._4_4_ = auVar197._4_4_ + auVar157._4_4_;
      auVar152._8_4_ = auVar197._8_4_ + auVar157._8_4_;
      auVar152._12_4_ = auVar197._12_4_ + auVar157._12_4_;
      auVar193._8_8_ = 0x3f800000;
      auVar193._0_8_ = 0x3f800000;
      auVar197 = vsubps_avx(auVar193,auVar152);
      auVar157 = vsubps_avx(auVar193,auVar235);
      fVar246 = auVar35._0_4_;
      auVar236._0_4_ = fVar246 * auVar197._0_4_;
      fVar271 = auVar35._4_4_;
      auVar236._4_4_ = fVar271 * auVar197._4_4_;
      fVar219 = auVar35._8_4_;
      auVar236._8_4_ = fVar219 * auVar197._8_4_;
      fVar249 = auVar35._12_4_;
      auVar236._12_4_ = fVar249 * auVar197._12_4_;
      fVar376 = auVar36._0_4_;
      auVar153._0_4_ = fVar376 * auVar197._0_4_;
      fVar245 = auVar36._4_4_;
      auVar153._4_4_ = fVar245 * auVar197._4_4_;
      fVar270 = auVar36._8_4_;
      auVar153._8_4_ = fVar270 * auVar197._8_4_;
      fVar95 = auVar36._12_4_;
      auVar153._12_4_ = fVar95 * auVar197._12_4_;
      auVar334._0_4_ = fVar246 * auVar157._0_4_;
      auVar334._4_4_ = fVar271 * auVar157._4_4_;
      auVar334._8_4_ = fVar219 * auVar157._8_4_;
      auVar334._12_4_ = fVar249 * auVar157._12_4_;
      auVar194._0_4_ = fVar376 * auVar157._0_4_;
      auVar194._4_4_ = fVar245 * auVar157._4_4_;
      auVar194._8_4_ = fVar270 * auVar157._8_4_;
      auVar194._12_4_ = fVar95 * auVar157._12_4_;
      auVar197 = vminps_avx(auVar236,auVar334);
      auVar157 = vminps_avx(auVar153,auVar194);
      auVar35 = vminps_avx(auVar197,auVar157);
      auVar197 = vmaxps_avx(auVar334,auVar236);
      auVar157 = vmaxps_avx(auVar194,auVar153);
      auVar36 = vshufps_avx(auVar215,auVar215,0x54);
      auVar157 = vmaxps_avx(auVar157,auVar197);
      auVar366 = vshufps_avx(auVar368,auVar368,0);
      auVar37 = vshufps_avx(auVar368,auVar368,0x55);
      auVar197 = vhaddps_avx(auVar35,auVar35);
      auVar157 = vhaddps_avx(auVar157,auVar157);
      auVar216._0_4_ = auVar366._0_4_ * auVar113._0_4_ + auVar37._0_4_ * auVar211._0_4_;
      auVar216._4_4_ = auVar366._4_4_ * auVar113._4_4_ + auVar37._4_4_ * auVar211._4_4_;
      auVar216._8_4_ = auVar366._8_4_ * auVar113._8_4_ + auVar37._8_4_ * auVar211._8_4_;
      auVar216._12_4_ = auVar366._12_4_ * auVar113._12_4_ + auVar37._12_4_ * auVar211._12_4_;
      auVar35 = vsubps_avx(auVar36,auVar216);
      fVar244 = auVar35._0_4_ + auVar197._0_4_;
      fVar269 = auVar35._0_4_ + auVar157._0_4_;
      auVar197 = vmaxss_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar244));
      auVar157 = vminss_avx(ZEXT416((uint)fVar269),ZEXT416((uint)fVar220));
    } while (auVar157._0_4_ < auVar197._0_4_);
    auVar197 = vmovshdup_avx(auVar113);
    auVar119._0_4_ = auVar197._0_4_ * auVar145._0_4_;
    auVar119._4_4_ = auVar197._4_4_ * auVar145._4_4_;
    auVar119._8_4_ = auVar197._8_4_ * auVar145._8_4_;
    auVar119._12_4_ = auVar197._12_4_ * auVar145._12_4_;
    auVar154._0_4_ = auVar183._0_4_ * auVar197._0_4_;
    auVar154._4_4_ = auVar183._4_4_ * auVar197._4_4_;
    auVar154._8_4_ = auVar183._8_4_ * auVar197._8_4_;
    auVar154._12_4_ = auVar183._12_4_ * auVar197._12_4_;
    auVar157 = vminps_avx(auVar119,auVar154);
    auVar197 = vmaxps_avx(auVar154,auVar119);
    auVar145 = vmovshdup_avx(auVar211);
    auVar237._0_4_ = auVar146._0_4_ * auVar145._0_4_;
    auVar237._4_4_ = auVar146._4_4_ * auVar145._4_4_;
    auVar237._8_4_ = auVar146._8_4_ * auVar145._8_4_;
    auVar237._12_4_ = auVar146._12_4_ * auVar145._12_4_;
    auVar155._0_4_ = auVar286._0_4_ * auVar145._0_4_;
    auVar155._4_4_ = auVar286._4_4_ * auVar145._4_4_;
    auVar155._8_4_ = auVar286._8_4_ * auVar145._8_4_;
    auVar155._12_4_ = auVar286._12_4_ * auVar145._12_4_;
    auVar145 = vminps_avx(auVar237,auVar155);
    auVar195._0_4_ = auVar157._0_4_ + auVar145._0_4_;
    auVar195._4_4_ = auVar157._4_4_ + auVar145._4_4_;
    auVar195._8_4_ = auVar157._8_4_ + auVar145._8_4_;
    auVar195._12_4_ = auVar157._12_4_ + auVar145._12_4_;
    auVar157 = vmaxps_avx(auVar155,auVar237);
    auVar120._0_4_ = auVar197._0_4_ + auVar157._0_4_;
    auVar120._4_4_ = auVar197._4_4_ + auVar157._4_4_;
    auVar120._8_4_ = auVar197._8_4_ + auVar157._8_4_;
    auVar120._12_4_ = auVar197._12_4_ + auVar157._12_4_;
    auVar197 = vsubps_avx(_local_408,auVar120);
    auVar157 = vsubps_avx(_local_408,auVar195);
    auVar196._0_4_ = fVar246 * auVar197._0_4_;
    auVar196._4_4_ = fVar271 * auVar197._4_4_;
    auVar196._8_4_ = fVar219 * auVar197._8_4_;
    auVar196._12_4_ = fVar249 * auVar197._12_4_;
    auVar238._0_4_ = fVar246 * auVar157._0_4_;
    auVar238._4_4_ = fVar271 * auVar157._4_4_;
    auVar238._8_4_ = fVar219 * auVar157._8_4_;
    auVar238._12_4_ = fVar249 * auVar157._12_4_;
    auVar121._0_4_ = fVar376 * auVar197._0_4_;
    auVar121._4_4_ = fVar245 * auVar197._4_4_;
    auVar121._8_4_ = fVar270 * auVar197._8_4_;
    auVar121._12_4_ = fVar95 * auVar197._12_4_;
    auVar156._0_4_ = fVar376 * auVar157._0_4_;
    auVar156._4_4_ = fVar245 * auVar157._4_4_;
    auVar156._8_4_ = fVar270 * auVar157._8_4_;
    auVar156._12_4_ = fVar95 * auVar157._12_4_;
    auVar197 = vminps_avx(auVar196,auVar238);
    auVar157 = vminps_avx(auVar121,auVar156);
    auVar197 = vminps_avx(auVar197,auVar157);
    auVar157 = vmaxps_avx(auVar238,auVar196);
    auVar145 = vmaxps_avx(auVar156,auVar121);
    auVar197 = vhaddps_avx(auVar197,auVar197);
    auVar157 = vmaxps_avx(auVar145,auVar157);
    auVar157 = vhaddps_avx(auVar157,auVar157);
    auVar145 = vmovshdup_avx(auVar35);
    auVar183 = ZEXT416((uint)(auVar145._0_4_ + auVar197._0_4_));
    auVar197 = vmaxss_avx(auVar399,auVar183);
    auVar145 = ZEXT416((uint)(auVar145._0_4_ + auVar157._0_4_));
    auVar157 = vminss_avx(auVar145,_local_4a8);
  } while (auVar157._0_4_ < auVar197._0_4_);
  bVar90 = 0;
  if ((fVar204 < fVar244) && (fVar269 < fVar220)) {
    auVar197 = vcmpps_avx(auVar145,_local_4a8,1);
    auVar157 = vcmpps_avx(auVar399,auVar183,1);
    auVar197 = vandps_avx(auVar157,auVar197);
    bVar90 = auVar197[0];
  }
  auVar322._8_4_ = 0x7fffffff;
  auVar322._0_8_ = 0x7fffffff7fffffff;
  auVar322._12_4_ = 0x7fffffff;
  if (((uint)uVar87 < 4 && 0.001 <= fVar250) && (bVar90 & 1) == 0) goto LAB_00abdaaf;
  lVar92 = 0xc9;
  do {
    lVar92 = lVar92 + -1;
    if (lVar92 == 0) goto LAB_00abcbc9;
    fVar250 = auVar35._0_4_;
    fVar220 = 1.0 - fVar250;
    auVar197 = ZEXT416((uint)(fVar220 * fVar220 * fVar220));
    auVar197 = vshufps_avx(auVar197,auVar197,0);
    auVar157 = ZEXT416((uint)(fVar250 * 3.0 * fVar220 * fVar220));
    auVar157 = vshufps_avx(auVar157,auVar157,0);
    auVar145 = ZEXT416((uint)(fVar220 * fVar250 * fVar250 * 3.0));
    auVar145 = vshufps_avx(auVar145,auVar145,0);
    auVar183 = ZEXT416((uint)(fVar250 * fVar250 * fVar250));
    auVar183 = vshufps_avx(auVar183,auVar183,0);
    fVar220 = (float)local_458._0_4_ * auVar197._0_4_ +
              (float)local_468._0_4_ * auVar157._0_4_ +
              (float)local_218._0_4_ * auVar183._0_4_ + (float)local_478._0_4_ * auVar145._0_4_;
    fVar250 = (float)local_458._4_4_ * auVar197._4_4_ +
              (float)local_468._4_4_ * auVar157._4_4_ +
              (float)local_218._4_4_ * auVar183._4_4_ + (float)local_478._4_4_ * auVar145._4_4_;
    auVar122._0_8_ = CONCAT44(fVar250,fVar220);
    auVar122._8_4_ =
         fStack_450 * auVar197._8_4_ +
         fStack_460 * auVar157._8_4_ + fStack_210 * auVar183._8_4_ + fStack_470 * auVar145._8_4_;
    auVar122._12_4_ =
         fStack_44c * auVar197._12_4_ +
         fStack_45c * auVar157._12_4_ + fStack_20c * auVar183._12_4_ + fStack_46c * auVar145._12_4_;
    auVar158._8_8_ = auVar122._0_8_;
    auVar158._0_8_ = auVar122._0_8_;
    auVar157 = vshufpd_avx(auVar122,auVar122,1);
    auVar197 = vmovshdup_avx(auVar35);
    auVar157 = vsubps_avx(auVar157,auVar158);
    auVar123._0_4_ = auVar197._0_4_ * auVar157._0_4_ + fVar220;
    auVar123._4_4_ = auVar197._4_4_ * auVar157._4_4_ + fVar250;
    auVar123._8_4_ = auVar197._8_4_ * auVar157._8_4_ + fVar220;
    auVar123._12_4_ = auVar197._12_4_ * auVar157._12_4_ + fVar250;
    auVar197 = vshufps_avx(auVar123,auVar123,0);
    auVar157 = vshufps_avx(auVar123,auVar123,0x55);
    auVar159._0_4_ = auVar113._0_4_ * auVar197._0_4_ + auVar211._0_4_ * auVar157._0_4_;
    auVar159._4_4_ = auVar113._4_4_ * auVar197._4_4_ + auVar211._4_4_ * auVar157._4_4_;
    auVar159._8_4_ = auVar113._8_4_ * auVar197._8_4_ + auVar211._8_4_ * auVar157._8_4_;
    auVar159._12_4_ = auVar113._12_4_ * auVar197._12_4_ + auVar211._12_4_ * auVar157._12_4_;
    auVar35 = vsubps_avx(auVar35,auVar159);
    auVar197 = vandps_avx(auVar322,auVar123);
    auVar157 = vshufps_avx(auVar197,auVar197,0xf5);
    auVar197 = vmaxss_avx(auVar157,auVar197);
  } while ((float)local_228._0_4_ <= auVar197._0_4_);
  fVar220 = auVar35._0_4_;
  if ((fVar220 < 0.0) || (1.0 < fVar220)) goto LAB_00abcbc9;
  auVar113 = vmovshdup_avx(auVar35);
  fVar250 = auVar113._0_4_;
  if ((fVar250 < 0.0) || (1.0 < fVar250)) goto LAB_00abcbc9;
  auVar113 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                           ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar286 = vinsertps_avx(auVar113,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar11 = (ray->org).field_0;
  auVar113 = vsubps_avx(_local_388,(undefined1  [16])aVar11);
  auVar113 = vdpps_avx(auVar113,auVar286,0x7f);
  auVar211 = vsubps_avx(_local_398,(undefined1  [16])aVar11);
  auVar211 = vdpps_avx(auVar211,auVar286,0x7f);
  auVar197 = vsubps_avx(_local_3a8,(undefined1  [16])aVar11);
  auVar197 = vdpps_avx(auVar197,auVar286,0x7f);
  auVar157 = vsubps_avx(_local_3b8,(undefined1  [16])aVar11);
  auVar157 = vdpps_avx(auVar157,auVar286,0x7f);
  auVar145 = vsubps_avx(_local_3c8,(undefined1  [16])aVar11);
  auVar145 = vdpps_avx(auVar145,auVar286,0x7f);
  auVar183 = vsubps_avx(_local_3d8,(undefined1  [16])aVar11);
  auVar183 = vdpps_avx(auVar183,auVar286,0x7f);
  auVar85._4_4_ = fStack_3e4;
  auVar85._0_4_ = local_3e8;
  auVar85._8_4_ = fStack_3e0;
  auVar85._12_4_ = fStack_3dc;
  auVar146 = vsubps_avx(auVar85,(undefined1  [16])aVar11);
  auVar146 = vdpps_avx(auVar146,auVar286,0x7f);
  auVar83._4_4_ = fStack_414;
  auVar83._0_4_ = local_418;
  auVar83._8_4_ = fStack_410;
  auVar83._12_4_ = fStack_40c;
  auVar36 = vsubps_avx(auVar83,(undefined1  [16])aVar11);
  auVar286 = vdpps_avx(auVar36,auVar286,0x7f);
  fVar245 = 1.0 - fVar250;
  fVar270 = 1.0 - fVar220;
  fVar204 = auVar35._4_4_;
  fVar244 = auVar35._8_4_;
  fVar269 = auVar35._12_4_;
  fVar376 = fVar270 * fVar220 * fVar220 * 3.0;
  auVar264._0_4_ = fVar220 * fVar220 * fVar220;
  auVar264._4_4_ = fVar204 * fVar204 * fVar204;
  auVar264._8_4_ = fVar244 * fVar244 * fVar244;
  auVar264._12_4_ = fVar269 * fVar269 * fVar269;
  fVar204 = fVar220 * 3.0 * fVar270 * fVar270;
  fVar244 = fVar270 * fVar270 * fVar270;
  fVar220 = (fVar245 * auVar113._0_4_ + auVar145._0_4_ * fVar250) * fVar244 +
            fVar204 * (auVar183._0_4_ * fVar250 + fVar245 * auVar211._0_4_) +
            fVar376 * (auVar146._0_4_ * fVar250 + fVar245 * auVar197._0_4_) +
            auVar264._0_4_ * (fVar245 * auVar157._0_4_ + fVar250 * auVar286._0_4_);
  if ((fVar220 < (ray->org).field_0.m128[3]) || (fVar250 = ray->tfar, fVar250 < fVar220))
  goto LAB_00abcbc9;
  pGVar21 = (context->scene->geometries).items[local_420].ptr;
  if ((pGVar21->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar90 = 1, pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00abda96;
    auVar113 = vshufps_avx(auVar35,auVar35,0x55);
    auVar313._8_4_ = 0x3f800000;
    auVar313._0_8_ = 0x3f8000003f800000;
    auVar313._12_4_ = 0x3f800000;
    auVar211 = vsubps_avx(auVar313,auVar113);
    fVar269 = auVar113._0_4_;
    fVar245 = auVar113._4_4_;
    fVar95 = auVar113._8_4_;
    fVar246 = auVar113._12_4_;
    fVar271 = auVar211._0_4_;
    fVar219 = auVar211._4_4_;
    fVar249 = auVar211._8_4_;
    fVar395 = auVar211._12_4_;
    auVar323._0_4_ = fVar269 * (float)local_3c8._0_4_ + fVar271 * (float)local_388._0_4_;
    auVar323._4_4_ = fVar245 * (float)local_3c8._4_4_ + fVar219 * (float)local_388._4_4_;
    auVar323._8_4_ = fVar95 * fStack_3c0 + fVar249 * fStack_380;
    auVar323._12_4_ = fVar246 * fStack_3bc + fVar395 * fStack_37c;
    auVar335._0_4_ = fVar269 * (float)local_3d8._0_4_ + fVar271 * (float)local_398._0_4_;
    auVar335._4_4_ = fVar245 * (float)local_3d8._4_4_ + fVar219 * (float)local_398._4_4_;
    auVar335._8_4_ = fVar95 * fStack_3d0 + fVar249 * fStack_390;
    auVar335._12_4_ = fVar246 * fStack_3cc + fVar395 * fStack_38c;
    auVar346._0_4_ = fVar269 * local_3e8 + fVar271 * (float)local_3a8._0_4_;
    auVar346._4_4_ = fVar245 * fStack_3e4 + fVar219 * (float)local_3a8._4_4_;
    auVar346._8_4_ = fVar95 * fStack_3e0 + fVar249 * fStack_3a0;
    auVar346._12_4_ = fVar246 * fStack_3dc + fVar395 * fStack_39c;
    auVar295._0_4_ = fVar271 * (float)local_3b8._0_4_ + fVar269 * local_418;
    auVar295._4_4_ = fVar219 * (float)local_3b8._4_4_ + fVar245 * fStack_414;
    auVar295._8_4_ = fVar249 * fStack_3b0 + fVar95 * fStack_410;
    auVar295._12_4_ = fVar395 * fStack_3ac + fVar246 * fStack_40c;
    auVar157 = vsubps_avx(auVar335,auVar323);
    auVar145 = vsubps_avx(auVar346,auVar335);
    auVar183 = vsubps_avx(auVar295,auVar346);
    auVar113 = vshufps_avx(auVar35,auVar35,0);
    fVar246 = auVar113._0_4_;
    fVar271 = auVar113._4_4_;
    fVar219 = auVar113._8_4_;
    fVar249 = auVar113._12_4_;
    auVar113 = vshufps_avx(ZEXT416((uint)fVar270),ZEXT416((uint)fVar270),0);
    fVar269 = auVar113._0_4_;
    fVar245 = auVar113._4_4_;
    fVar270 = auVar113._8_4_;
    fVar95 = auVar113._12_4_;
    auVar113 = vshufps_avx(auVar264,auVar264,0);
    auVar211 = vshufps_avx(ZEXT416((uint)fVar376),ZEXT416((uint)fVar376),0);
    auVar197 = vshufps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),0);
    auVar239._0_4_ =
         ((auVar157._0_4_ * fVar269 + fVar246 * auVar145._0_4_) * fVar269 +
         fVar246 * (auVar145._0_4_ * fVar269 + fVar246 * auVar183._0_4_)) * 3.0;
    auVar239._4_4_ =
         ((auVar157._4_4_ * fVar245 + fVar271 * auVar145._4_4_) * fVar245 +
         fVar271 * (auVar145._4_4_ * fVar245 + fVar271 * auVar183._4_4_)) * 3.0;
    auVar239._8_4_ =
         ((auVar157._8_4_ * fVar270 + fVar219 * auVar145._8_4_) * fVar270 +
         fVar219 * (auVar145._8_4_ * fVar270 + fVar219 * auVar183._8_4_)) * 3.0;
    auVar239._12_4_ =
         ((auVar157._12_4_ * fVar95 + fVar249 * auVar145._12_4_) * fVar95 +
         fVar249 * (auVar145._12_4_ * fVar95 + fVar249 * auVar183._12_4_)) * 3.0;
    auVar157 = vshufps_avx(ZEXT416((uint)fVar244),ZEXT416((uint)fVar244),0);
    auVar160._0_4_ =
         auVar157._0_4_ * (float)local_248._0_4_ +
         auVar197._0_4_ * (float)local_258._0_4_ +
         auVar113._0_4_ * (float)local_278._0_4_ + auVar211._0_4_ * (float)local_268._0_4_;
    auVar160._4_4_ =
         auVar157._4_4_ * (float)local_248._4_4_ +
         auVar197._4_4_ * (float)local_258._4_4_ +
         auVar113._4_4_ * (float)local_278._4_4_ + auVar211._4_4_ * (float)local_268._4_4_;
    auVar160._8_4_ =
         auVar157._8_4_ * fStack_240 +
         auVar197._8_4_ * fStack_250 + auVar113._8_4_ * fStack_270 + auVar211._8_4_ * fStack_260;
    auVar160._12_4_ =
         auVar157._12_4_ * fStack_23c +
         auVar197._12_4_ * fStack_24c + auVar113._12_4_ * fStack_26c + auVar211._12_4_ * fStack_25c;
    auVar113 = vshufps_avx(auVar239,auVar239,0xc9);
    auVar198._0_4_ = auVar160._0_4_ * auVar113._0_4_;
    auVar198._4_4_ = auVar160._4_4_ * auVar113._4_4_;
    auVar198._8_4_ = auVar160._8_4_ * auVar113._8_4_;
    auVar198._12_4_ = auVar160._12_4_ * auVar113._12_4_;
    auVar113 = vshufps_avx(auVar160,auVar160,0xc9);
    auVar161._0_4_ = auVar239._0_4_ * auVar113._0_4_;
    auVar161._4_4_ = auVar239._4_4_ * auVar113._4_4_;
    auVar161._8_4_ = auVar239._8_4_ * auVar113._8_4_;
    auVar161._12_4_ = auVar239._12_4_ * auVar113._12_4_;
    auVar211 = vsubps_avx(auVar161,auVar198);
    auVar113 = vshufps_avx(auVar211,auVar211,0xe9);
    local_2a8 = vmovlps_avx(auVar113);
    local_2a0 = auVar211._0_4_;
    local_29c = vmovlps_avx(auVar35);
    local_294 = (int)local_2f8;
    local_290 = (int)local_420;
    local_28c = context->user->instID[0];
    local_288 = context->user->instPrimID[0];
    ray->tfar = fVar220;
    local_4ac = -1;
    local_2e8.valid = &local_4ac;
    local_2e8.geometryUserPtr = pGVar21->userPtr;
    local_2e8.context = context->user;
    local_2e8.hit = (RTCHitN *)&local_2a8;
    local_2e8.N = 1;
    local_2e8.ray = (RTCRayN *)ray;
    if ((pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
       ((*pGVar21->occlusionFilterN)(&local_2e8), *local_2e8.valid != 0)) {
      p_Var26 = context->args->filter;
      if ((p_Var26 == (RTCFilterFunctionN)0x0) ||
         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
            RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar21->field_8).field_0x2 & 0x40) == 0)) ||
          ((*p_Var26)(&local_2e8), *local_2e8.valid != 0)))) {
        bVar90 = 1;
        goto LAB_00abda96;
      }
    }
    ray->tfar = fVar250;
  }
  bVar90 = 0;
LAB_00abda96:
  bVar94 = (bool)(bVar94 | bVar90);
  goto LAB_00abcbc9;
LAB_00abdaaf:
  auVar113 = vinsertps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar220),0x10);
  auVar401 = ZEXT1664(auVar113);
  auVar400 = ZEXT1664(local_488);
  auVar382 = ZEXT1664(local_328);
  auVar300 = ZEXT1664(local_338);
  auVar319 = ZEXT1664(local_348);
  auVar329 = ZEXT1664(local_358);
  auVar341 = ZEXT1664(local_368);
  auVar356 = ZEXT1664(local_378);
  auVar371 = ZEXT1664(auVar399);
  goto LAB_00abc56f;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }